

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersectorK<4,8>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  Primitive PVar10;
  Geometry *pGVar11;
  __int_type_conflict _Var12;
  long lVar13;
  long lVar14;
  RTCRayQueryContext *pRVar15;
  RTCFilterFunctionN p_Var16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  float fVar51;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  bool bVar75;
  undefined1 auVar76 [12];
  bool bVar77;
  bool bVar78;
  bool bVar79;
  bool bVar80;
  bool bVar81;
  bool bVar82;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  uint uVar97;
  uint uVar98;
  ulong uVar99;
  long lVar100;
  long lVar101;
  uint uVar102;
  ulong uVar103;
  ulong uVar104;
  bool bVar105;
  vint4 bi_1;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar133;
  float fVar134;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar135;
  float fVar172;
  float fVar174;
  vint4 bi;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar136;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar176;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  float fVar173;
  float fVar175;
  float fVar177;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar181;
  float fVar205;
  float fVar208;
  vint4 bi_2;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar182;
  float fVar183;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar206;
  float fVar207;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar226;
  float fVar239;
  float fVar240;
  vint4 ai_1;
  undefined1 auVar227 [16];
  float fVar241;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  float fVar242;
  float fVar257;
  float fVar258;
  vint4 ai_2;
  undefined1 auVar243 [16];
  float fVar259;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar260;
  float fVar261;
  undefined1 auVar253 [28];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar256 [32];
  float fVar262;
  float fVar276;
  float fVar277;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  float fVar278;
  undefined1 auVar275 [64];
  float fVar279;
  float fVar280;
  float fVar291;
  float fVar293;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  float fVar295;
  float fVar297;
  float fVar299;
  float fVar301;
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  float fVar292;
  float fVar294;
  float fVar296;
  float fVar298;
  float fVar300;
  float fVar302;
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  float fVar303;
  float fVar304;
  float fVar315;
  float fVar317;
  vint4 ai;
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  float fVar316;
  float fVar318;
  float fVar320;
  float fVar321;
  float fVar324;
  float fVar327;
  float fVar330;
  float fVar332;
  undefined1 auVar310 [32];
  float fVar319;
  float fVar322;
  float fVar325;
  float fVar328;
  float fVar331;
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  float fVar323;
  float fVar326;
  float fVar329;
  undefined1 auVar314 [64];
  float fVar333;
  float fVar344;
  float fVar346;
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  float fVar334;
  float fVar345;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar351;
  float fVar353;
  float fVar355;
  float fVar356;
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  float fVar350;
  float fVar352;
  float fVar354;
  undefined1 auVar343 [64];
  float fVar357;
  float fVar362;
  float fVar363;
  undefined1 auVar358 [16];
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  float s;
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  float fVar372;
  float t;
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar385;
  float fVar387;
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  float fVar386;
  float fVar388;
  float fVar389;
  float fVar390;
  float fVar391;
  float fVar392;
  float fVar393;
  float fVar394;
  float fVar395;
  float fVar396;
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  float fVar397;
  float fVar398;
  float fVar399;
  float fVar400;
  float fVar409;
  float fVar413;
  undefined1 auVar401 [16];
  float fVar412;
  float fVar415;
  float fVar418;
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  float fVar416;
  undefined1 auVar404 [32];
  float fVar410;
  float fVar414;
  float fVar417;
  float fVar420;
  float fVar423;
  float fVar425;
  undefined1 auVar405 [32];
  float fVar411;
  undefined1 auVar406 [32];
  float fVar421;
  float fVar426;
  undefined1 auVar407 [32];
  float fVar419;
  float fVar422;
  float fVar424;
  undefined1 auVar408 [64];
  float fVar427;
  float fVar432;
  float fVar433;
  float fVar434;
  float fVar435;
  float fVar436;
  float fVar437;
  float fVar438;
  undefined1 auVar428 [32];
  undefined1 auVar429 [32];
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  float fVar439;
  float fVar441;
  float fVar442;
  float fVar443;
  float fVar444;
  float fVar445;
  float fVar446;
  undefined1 auVar440 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vboolx_conflict valid;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  float local_c80;
  undefined1 local_c00 [8];
  float fStack_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float fStack_be8;
  float fStack_be4;
  float local_be0;
  float fStack_bdc;
  float fStack_bd8;
  float fStack_bd4;
  undefined1 local_ba0 [8];
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined1 local_a90 [8];
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined1 local_a70 [8];
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  RTCFilterFunctionNArguments local_a50;
  undefined1 local_a20 [32];
  undefined1 local_9f0 [16];
  undefined8 *local_9e0;
  undefined8 *local_9d8;
  undefined1 (*local_9d0) [32];
  ulong local_9c8;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [16];
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [32];
  undefined1 local_940 [16];
  Primitive *local_930;
  ulong local_928;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  ulong local_7c0;
  undefined1 auStack_7b8 [24];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [16];
  undefined1 auStack_750 [16];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  float local_6a0 [4];
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  float local_680 [4];
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_650 [16];
  RTCHitN local_640 [16];
  undefined1 auStack_630 [16];
  undefined1 local_620 [16];
  undefined1 auStack_610 [16];
  undefined1 local_600 [16];
  undefined1 auStack_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 auStack_5d0 [16];
  undefined1 local_5c0 [32];
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  uint local_560;
  uint uStack_55c;
  uint uStack_558;
  uint uStack_554;
  uint uStack_550;
  uint uStack_54c;
  uint uStack_548;
  uint uStack_544;
  uint local_540;
  uint uStack_53c;
  uint uStack_538;
  uint uStack_534;
  uint uStack_530;
  uint uStack_52c;
  uint uStack_528;
  uint uStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar371 [64];
  undefined1 auVar375 [64];
  undefined1 auVar384 [64];
  
  PVar10 = prim[1];
  uVar103 = (ulong)(byte)PVar10;
  lVar101 = uVar103 * 0x25;
  fVar135 = *(float *)(prim + lVar101 + 0x12);
  auVar142 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar142 = vinsertps_avx(auVar142,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar142 = vsubps_avx(auVar142,*(undefined1 (*) [16])(prim + lVar101 + 6));
  auVar137._0_4_ = fVar135 * auVar142._0_4_;
  auVar137._4_4_ = fVar135 * auVar142._4_4_;
  auVar137._8_4_ = fVar135 * auVar142._8_4_;
  auVar137._12_4_ = fVar135 * auVar142._12_4_;
  auVar305._0_4_ = fVar135 * auVar17._0_4_;
  auVar305._4_4_ = fVar135 * auVar17._4_4_;
  auVar305._8_4_ = fVar135 * auVar17._8_4_;
  auVar305._12_4_ = fVar135 * auVar17._12_4_;
  auVar142 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 4 + 6)));
  auVar142 = vcvtdq2ps_avx(auVar142);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 5 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 6 + 6)));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar230 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0xf + 6)));
  auVar152 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar10 * 0x10 + 6)));
  auVar230 = vcvtdq2ps_avx(auVar230);
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar103 + 6)));
  auVar152 = vcvtdq2ps_avx(auVar152);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x1a + 6)));
  auVar189 = vcvtdq2ps_avx(auVar189);
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x1b + 6)));
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x1c + 6)));
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar18 = vshufps_avx(auVar305,auVar305,0);
  auVar19 = vshufps_avx(auVar305,auVar305,0x55);
  auVar20 = vshufps_avx(auVar305,auVar305,0xaa);
  fVar135 = auVar20._0_4_;
  fVar136 = auVar20._4_4_;
  fVar172 = auVar20._8_4_;
  fVar174 = auVar20._12_4_;
  fVar242 = auVar19._0_4_;
  fVar257 = auVar19._4_4_;
  fVar258 = auVar19._8_4_;
  fVar259 = auVar19._12_4_;
  fVar226 = auVar18._0_4_;
  fVar239 = auVar18._4_4_;
  fVar240 = auVar18._8_4_;
  fVar241 = auVar18._12_4_;
  auVar380._0_4_ = fVar226 * auVar142._0_4_ + fVar242 * auVar17._0_4_ + fVar135 * auVar147._0_4_;
  auVar380._4_4_ = fVar239 * auVar142._4_4_ + fVar257 * auVar17._4_4_ + fVar136 * auVar147._4_4_;
  auVar380._8_4_ = fVar240 * auVar142._8_4_ + fVar258 * auVar17._8_4_ + fVar172 * auVar147._8_4_;
  auVar380._12_4_ = fVar241 * auVar142._12_4_ + fVar259 * auVar17._12_4_ + fVar174 * auVar147._12_4_
  ;
  auVar401._0_4_ = fVar226 * auVar230._0_4_ + fVar242 * auVar152._0_4_ + auVar111._0_4_ * fVar135;
  auVar401._4_4_ = fVar239 * auVar230._4_4_ + fVar257 * auVar152._4_4_ + auVar111._4_4_ * fVar136;
  auVar401._8_4_ = fVar240 * auVar230._8_4_ + fVar258 * auVar152._8_4_ + auVar111._8_4_ * fVar172;
  auVar401._12_4_ =
       fVar241 * auVar230._12_4_ + fVar259 * auVar152._12_4_ + auVar111._12_4_ * fVar174;
  auVar306._0_4_ = fVar226 * auVar189._0_4_ + fVar242 * auVar143._0_4_ + auVar146._0_4_ * fVar135;
  auVar306._4_4_ = fVar239 * auVar189._4_4_ + fVar257 * auVar143._4_4_ + auVar146._4_4_ * fVar136;
  auVar306._8_4_ = fVar240 * auVar189._8_4_ + fVar258 * auVar143._8_4_ + auVar146._8_4_ * fVar172;
  auVar306._12_4_ =
       fVar241 * auVar189._12_4_ + fVar259 * auVar143._12_4_ + auVar146._12_4_ * fVar174;
  auVar18 = vshufps_avx(auVar137,auVar137,0);
  auVar19 = vshufps_avx(auVar137,auVar137,0x55);
  auVar20 = vshufps_avx(auVar137,auVar137,0xaa);
  fVar135 = auVar20._0_4_;
  fVar136 = auVar20._4_4_;
  fVar172 = auVar20._8_4_;
  fVar174 = auVar20._12_4_;
  fVar242 = auVar19._0_4_;
  fVar257 = auVar19._4_4_;
  fVar258 = auVar19._8_4_;
  fVar259 = auVar19._12_4_;
  fVar226 = auVar18._0_4_;
  fVar239 = auVar18._4_4_;
  fVar240 = auVar18._8_4_;
  fVar241 = auVar18._12_4_;
  auVar138._0_4_ = fVar226 * auVar142._0_4_ + fVar242 * auVar17._0_4_ + fVar135 * auVar147._0_4_;
  auVar138._4_4_ = fVar239 * auVar142._4_4_ + fVar257 * auVar17._4_4_ + fVar136 * auVar147._4_4_;
  auVar138._8_4_ = fVar240 * auVar142._8_4_ + fVar258 * auVar17._8_4_ + fVar172 * auVar147._8_4_;
  auVar138._12_4_ = fVar241 * auVar142._12_4_ + fVar259 * auVar17._12_4_ + fVar174 * auVar147._12_4_
  ;
  auVar106._0_4_ = fVar226 * auVar230._0_4_ + auVar111._0_4_ * fVar135 + fVar242 * auVar152._0_4_;
  auVar106._4_4_ = fVar239 * auVar230._4_4_ + auVar111._4_4_ * fVar136 + fVar257 * auVar152._4_4_;
  auVar106._8_4_ = fVar240 * auVar230._8_4_ + auVar111._8_4_ * fVar172 + fVar258 * auVar152._8_4_;
  auVar106._12_4_ =
       fVar241 * auVar230._12_4_ + auVar111._12_4_ * fVar174 + fVar259 * auVar152._12_4_;
  auVar335._8_4_ = 0x7fffffff;
  auVar335._0_8_ = 0x7fffffff7fffffff;
  auVar335._12_4_ = 0x7fffffff;
  auVar142 = vandps_avx(auVar380,auVar335);
  auVar243._8_4_ = 0x219392ef;
  auVar243._0_8_ = 0x219392ef219392ef;
  auVar243._12_4_ = 0x219392ef;
  auVar142 = vcmpps_avx(auVar142,auVar243,1);
  auVar17 = vblendvps_avx(auVar380,auVar243,auVar142);
  auVar142 = vandps_avx(auVar401,auVar335);
  auVar142 = vcmpps_avx(auVar142,auVar243,1);
  auVar147 = vblendvps_avx(auVar401,auVar243,auVar142);
  auVar142 = vandps_avx(auVar335,auVar306);
  auVar142 = vcmpps_avx(auVar142,auVar243,1);
  auVar142 = vblendvps_avx(auVar306,auVar243,auVar142);
  auVar184._0_4_ = fVar226 * auVar189._0_4_ + fVar242 * auVar143._0_4_ + auVar146._0_4_ * fVar135;
  auVar184._4_4_ = fVar239 * auVar189._4_4_ + fVar257 * auVar143._4_4_ + auVar146._4_4_ * fVar136;
  auVar184._8_4_ = fVar240 * auVar189._8_4_ + fVar258 * auVar143._8_4_ + auVar146._8_4_ * fVar172;
  auVar184._12_4_ =
       fVar241 * auVar189._12_4_ + fVar259 * auVar143._12_4_ + auVar146._12_4_ * fVar174;
  auVar230 = vrcpps_avx(auVar17);
  fVar226 = auVar230._0_4_;
  auVar227._0_4_ = fVar226 * auVar17._0_4_;
  fVar239 = auVar230._4_4_;
  auVar227._4_4_ = fVar239 * auVar17._4_4_;
  fVar240 = auVar230._8_4_;
  auVar227._8_4_ = fVar240 * auVar17._8_4_;
  fVar241 = auVar230._12_4_;
  auVar227._12_4_ = fVar241 * auVar17._12_4_;
  auVar281._8_4_ = 0x3f800000;
  auVar281._0_8_ = &DAT_3f8000003f800000;
  auVar281._12_4_ = 0x3f800000;
  auVar17 = vsubps_avx(auVar281,auVar227);
  fVar226 = fVar226 + fVar226 * auVar17._0_4_;
  fVar239 = fVar239 + fVar239 * auVar17._4_4_;
  fVar240 = fVar240 + fVar240 * auVar17._8_4_;
  fVar241 = fVar241 + fVar241 * auVar17._12_4_;
  auVar17 = vrcpps_avx(auVar147);
  fVar242 = auVar17._0_4_;
  auVar263._0_4_ = fVar242 * auVar147._0_4_;
  fVar257 = auVar17._4_4_;
  auVar263._4_4_ = fVar257 * auVar147._4_4_;
  fVar258 = auVar17._8_4_;
  auVar263._8_4_ = fVar258 * auVar147._8_4_;
  fVar259 = auVar17._12_4_;
  auVar263._12_4_ = fVar259 * auVar147._12_4_;
  auVar17 = vsubps_avx(auVar281,auVar263);
  fVar242 = fVar242 + fVar242 * auVar17._0_4_;
  fVar257 = fVar257 + fVar257 * auVar17._4_4_;
  fVar258 = fVar258 + fVar258 * auVar17._8_4_;
  fVar259 = fVar259 + fVar259 * auVar17._12_4_;
  auVar17 = vrcpps_avx(auVar142);
  fVar262 = auVar17._0_4_;
  auVar307._0_4_ = fVar262 * auVar142._0_4_;
  fVar276 = auVar17._4_4_;
  auVar307._4_4_ = fVar276 * auVar142._4_4_;
  fVar277 = auVar17._8_4_;
  auVar307._8_4_ = fVar277 * auVar142._8_4_;
  fVar278 = auVar17._12_4_;
  auVar307._12_4_ = fVar278 * auVar142._12_4_;
  auVar142 = vsubps_avx(auVar281,auVar307);
  fVar262 = fVar262 + fVar262 * auVar142._0_4_;
  fVar276 = fVar276 + fVar276 * auVar142._4_4_;
  fVar277 = fVar277 + fVar277 * auVar142._8_4_;
  fVar278 = fVar278 + fVar278 * auVar142._12_4_;
  auVar142 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar101 + 0x16)) *
                           *(float *)(prim + lVar101 + 0x1a)));
  auVar147 = vshufps_avx(auVar142,auVar142,0);
  auVar142._8_8_ = 0;
  auVar142._0_8_ = *(ulong *)(prim + uVar103 * 7 + 6);
  auVar142 = vpmovsxwd_avx(auVar142);
  auVar142 = vcvtdq2ps_avx(auVar142);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar103 * 0xb + 6);
  auVar17 = vpmovsxwd_avx(auVar17);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar230 = vsubps_avx(auVar17,auVar142);
  fVar135 = auVar147._0_4_;
  fVar136 = auVar147._4_4_;
  fVar172 = auVar147._8_4_;
  fVar174 = auVar147._12_4_;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = *(ulong *)(prim + uVar103 * 9 + 6);
  auVar17 = vpmovsxwd_avx(auVar147);
  auVar308._0_4_ = auVar230._0_4_ * fVar135 + auVar142._0_4_;
  auVar308._4_4_ = auVar230._4_4_ * fVar136 + auVar142._4_4_;
  auVar308._8_4_ = auVar230._8_4_ * fVar172 + auVar142._8_4_;
  auVar308._12_4_ = auVar230._12_4_ * fVar174 + auVar142._12_4_;
  auVar230._8_8_ = 0;
  auVar230._0_8_ = *(ulong *)(prim + uVar103 * 0xd + 6);
  auVar147 = vpmovsxwd_avx(auVar230);
  auVar142 = vcvtdq2ps_avx(auVar17);
  auVar17 = vcvtdq2ps_avx(auVar147);
  auVar17 = vsubps_avx(auVar17,auVar142);
  auVar336._0_4_ = auVar17._0_4_ * fVar135 + auVar142._0_4_;
  auVar336._4_4_ = auVar17._4_4_ * fVar136 + auVar142._4_4_;
  auVar336._8_4_ = auVar17._8_4_ * fVar172 + auVar142._8_4_;
  auVar336._12_4_ = auVar17._12_4_ * fVar174 + auVar142._12_4_;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = *(ulong *)(prim + uVar103 * 0x12 + 6);
  auVar142 = vpmovsxwd_avx(auVar152);
  uVar99 = (ulong)(uint)((int)(uVar103 * 5) << 2);
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *(ulong *)(prim + uVar103 * 2 + uVar99 + 6);
  auVar17 = vpmovsxwd_avx(auVar111);
  auVar142 = vcvtdq2ps_avx(auVar142);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar142);
  auVar358._0_4_ = auVar17._0_4_ * fVar135 + auVar142._0_4_;
  auVar358._4_4_ = auVar17._4_4_ * fVar136 + auVar142._4_4_;
  auVar358._8_4_ = auVar17._8_4_ * fVar172 + auVar142._8_4_;
  auVar358._12_4_ = auVar17._12_4_ * fVar174 + auVar142._12_4_;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = *(ulong *)(prim + uVar99 + 6);
  auVar142 = vpmovsxwd_avx(auVar189);
  auVar142 = vcvtdq2ps_avx(auVar142);
  auVar143._8_8_ = 0;
  auVar143._0_8_ = *(ulong *)(prim + uVar103 * 0x18 + 6);
  auVar17 = vpmovsxwd_avx(auVar143);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar147 = vsubps_avx(auVar17,auVar142);
  auVar146._8_8_ = 0;
  auVar146._0_8_ = *(ulong *)(prim + uVar103 * 0x1d + 6);
  auVar17 = vpmovsxwd_avx(auVar146);
  auVar369._0_4_ = auVar147._0_4_ * fVar135 + auVar142._0_4_;
  auVar369._4_4_ = auVar147._4_4_ * fVar136 + auVar142._4_4_;
  auVar369._8_4_ = auVar147._8_4_ * fVar172 + auVar142._8_4_;
  auVar369._12_4_ = auVar147._12_4_ * fVar174 + auVar142._12_4_;
  auVar142 = vcvtdq2ps_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar103 + (ulong)(byte)PVar10 * 0x20 + 6);
  auVar17 = vpmovsxwd_avx(auVar18);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar142);
  auVar373._0_4_ = auVar17._0_4_ * fVar135 + auVar142._0_4_;
  auVar373._4_4_ = auVar17._4_4_ * fVar136 + auVar142._4_4_;
  auVar373._8_4_ = auVar17._8_4_ * fVar172 + auVar142._8_4_;
  auVar373._12_4_ = auVar17._12_4_ * fVar174 + auVar142._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar10 * 0x20 - uVar103) + 6);
  auVar142 = vpmovsxwd_avx(auVar19);
  auVar142 = vcvtdq2ps_avx(auVar142);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar103 * 0x23 + 6);
  auVar17 = vpmovsxwd_avx(auVar20);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar142);
  auVar282._0_4_ = auVar142._0_4_ + auVar17._0_4_ * fVar135;
  auVar282._4_4_ = auVar142._4_4_ + auVar17._4_4_ * fVar136;
  auVar282._8_4_ = auVar142._8_4_ + auVar17._8_4_ * fVar172;
  auVar282._12_4_ = auVar142._12_4_ + auVar17._12_4_ * fVar174;
  auVar142 = vsubps_avx(auVar308,auVar138);
  auVar309._0_4_ = fVar226 * auVar142._0_4_;
  auVar309._4_4_ = fVar239 * auVar142._4_4_;
  auVar309._8_4_ = fVar240 * auVar142._8_4_;
  auVar309._12_4_ = fVar241 * auVar142._12_4_;
  auVar142 = vsubps_avx(auVar336,auVar138);
  auVar139._0_4_ = fVar226 * auVar142._0_4_;
  auVar139._4_4_ = fVar239 * auVar142._4_4_;
  auVar139._8_4_ = fVar240 * auVar142._8_4_;
  auVar139._12_4_ = fVar241 * auVar142._12_4_;
  auVar142 = vsubps_avx(auVar358,auVar106);
  auVar228._0_4_ = fVar242 * auVar142._0_4_;
  auVar228._4_4_ = fVar257 * auVar142._4_4_;
  auVar228._8_4_ = fVar258 * auVar142._8_4_;
  auVar228._12_4_ = fVar259 * auVar142._12_4_;
  auVar142 = vsubps_avx(auVar369,auVar106);
  auVar107._0_4_ = fVar242 * auVar142._0_4_;
  auVar107._4_4_ = fVar257 * auVar142._4_4_;
  auVar107._8_4_ = fVar258 * auVar142._8_4_;
  auVar107._12_4_ = fVar259 * auVar142._12_4_;
  auVar142 = vsubps_avx(auVar373,auVar184);
  auVar244._0_4_ = fVar262 * auVar142._0_4_;
  auVar244._4_4_ = fVar276 * auVar142._4_4_;
  auVar244._8_4_ = fVar277 * auVar142._8_4_;
  auVar244._12_4_ = fVar278 * auVar142._12_4_;
  auVar142 = vsubps_avx(auVar282,auVar184);
  auVar185._0_4_ = fVar262 * auVar142._0_4_;
  auVar185._4_4_ = fVar276 * auVar142._4_4_;
  auVar185._8_4_ = fVar277 * auVar142._8_4_;
  auVar185._12_4_ = fVar278 * auVar142._12_4_;
  auVar142 = vpminsd_avx(auVar309,auVar139);
  auVar17 = vpminsd_avx(auVar228,auVar107);
  auVar142 = vmaxps_avx(auVar142,auVar17);
  auVar17 = vpminsd_avx(auVar244,auVar185);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar337._4_4_ = uVar8;
  auVar337._0_4_ = uVar8;
  auVar337._8_4_ = uVar8;
  auVar337._12_4_ = uVar8;
  auVar17 = vmaxps_avx(auVar17,auVar337);
  auVar142 = vmaxps_avx(auVar142,auVar17);
  local_650._0_4_ = auVar142._0_4_ * 0.99999964;
  local_650._4_4_ = auVar142._4_4_ * 0.99999964;
  local_650._8_4_ = auVar142._8_4_ * 0.99999964;
  local_650._12_4_ = auVar142._12_4_ * 0.99999964;
  auVar142 = vpmaxsd_avx(auVar309,auVar139);
  auVar17 = vpmaxsd_avx(auVar228,auVar107);
  auVar142 = vminps_avx(auVar142,auVar17);
  auVar17 = vpmaxsd_avx(auVar244,auVar185);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar186._4_4_ = uVar8;
  auVar186._0_4_ = uVar8;
  auVar186._8_4_ = uVar8;
  auVar186._12_4_ = uVar8;
  auVar17 = vminps_avx(auVar17,auVar186);
  auVar142 = vminps_avx(auVar142,auVar17);
  auVar108._0_4_ = auVar142._0_4_ * 1.0000004;
  auVar108._4_4_ = auVar142._4_4_ * 1.0000004;
  auVar108._8_4_ = auVar142._8_4_ * 1.0000004;
  auVar108._12_4_ = auVar142._12_4_ * 1.0000004;
  auVar142 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar17 = vpcmpgtd_avx(auVar142,_DAT_01ff0cf0);
  auVar142 = vcmpps_avx(local_650,auVar108,2);
  auVar142 = vandps_avx(auVar142,auVar17);
  uVar97 = vmovmskps_avx(auVar142);
  if (uVar97 == 0) {
    return;
  }
  auVar120._16_16_ = mm_lookupmask_ps._240_16_;
  auVar120._0_16_ = mm_lookupmask_ps._240_16_;
  uVar97 = uVar97 & 0xff;
  local_260 = vblendps_avx(auVar120,ZEXT832(0) << 0x20,0x80);
  uVar98 = 1 << ((byte)k & 0x1f);
  local_9d0 = (undefined1 (*) [32])&local_560;
  local_9d8 = (undefined8 *)(mm_lookupmask_ps + ((uVar98 & 0xf) << 4));
  local_9e0 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar98 >> 4) * 0x10);
  auVar314 = ZEXT464(0) << 0x20;
  local_930 = prim;
LAB_0107346f:
  local_928 = (ulong)uVar97;
  lVar101 = 0;
  if (local_928 != 0) {
    for (; (uVar97 >> lVar101 & 1) == 0; lVar101 = lVar101 + 1) {
    }
  }
  uVar97 = *(uint *)(local_930 + 2);
  local_9c8 = (ulong)*(uint *)(local_930 + lVar101 * 4 + 6);
  pGVar11 = (context->scene->geometries).items[uVar97].ptr;
  uVar103 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                            local_9c8 *
                            pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar135 = (pGVar11->time_range).lower;
  fVar135 = pGVar11->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar135) / ((pGVar11->time_range).upper - fVar135));
  auVar142 = vroundss_avx(ZEXT416((uint)fVar135),ZEXT416((uint)fVar135),9);
  auVar142 = vminss_avx(auVar142,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
  auVar142 = vmaxss_avx(auVar314._0_16_,auVar142);
  fVar135 = fVar135 - auVar142._0_4_;
  _Var12 = pGVar11[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar100 = (long)(int)auVar142._0_4_ * 0x38;
  lVar13 = *(long *)(_Var12 + lVar100);
  lVar14 = *(long *)(_Var12 + 0x10 + lVar100);
  auVar142 = vshufps_avx(ZEXT416((uint)(1.0 - fVar135)),ZEXT416((uint)(1.0 - fVar135)),0);
  pfVar1 = (float *)(lVar13 + lVar14 * uVar103);
  fVar226 = auVar142._0_4_;
  fVar239 = auVar142._4_4_;
  fVar240 = auVar142._8_4_;
  fVar241 = auVar142._12_4_;
  pfVar2 = (float *)(lVar13 + lVar14 * (uVar103 + 1));
  pfVar3 = (float *)(lVar13 + lVar14 * (uVar103 + 2));
  pfVar4 = (float *)(lVar13 + lVar14 * (uVar103 + 3));
  lVar13 = *(long *)(_Var12 + 0x38 + lVar100);
  lVar14 = *(long *)(_Var12 + 0x48 + lVar100);
  auVar142 = vshufps_avx(ZEXT416((uint)fVar135),ZEXT416((uint)fVar135),0);
  pfVar5 = (float *)(lVar13 + uVar103 * lVar14);
  fVar242 = auVar142._0_4_;
  fVar257 = auVar142._4_4_;
  fVar258 = auVar142._8_4_;
  fVar259 = auVar142._12_4_;
  pfVar6 = (float *)(lVar13 + (uVar103 + 1) * lVar14);
  pfVar7 = (float *)(lVar13 + (uVar103 + 2) * lVar14);
  auVar140._0_4_ = fVar242 * *pfVar5 + fVar226 * *pfVar1;
  auVar140._4_4_ = fVar257 * pfVar5[1] + fVar239 * pfVar1[1];
  auVar140._8_4_ = fVar258 * pfVar5[2] + fVar240 * pfVar1[2];
  auVar140._12_4_ = fVar259 * pfVar5[3] + fVar241 * pfVar1[3];
  auVar229._0_4_ = fVar226 * *pfVar2 + fVar242 * *pfVar6;
  auVar229._4_4_ = fVar239 * pfVar2[1] + fVar257 * pfVar6[1];
  auVar229._8_4_ = fVar240 * pfVar2[2] + fVar258 * pfVar6[2];
  auVar229._12_4_ = fVar241 * pfVar2[3] + fVar259 * pfVar6[3];
  auVar142 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar17 = vinsertps_avx(auVar142,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar135 = *(float *)(ray + k * 4 + 0x80);
  auVar370._4_4_ = fVar135;
  auVar370._0_4_ = fVar135;
  auVar370._8_4_ = fVar135;
  auVar370._12_4_ = fVar135;
  fStack_830 = fVar135;
  _local_840 = auVar370;
  fStack_82c = fVar135;
  fStack_828 = fVar135;
  fStack_824 = fVar135;
  auVar371 = ZEXT3264(_local_840);
  fVar136 = *(float *)(ray + k * 4 + 0xa0);
  auVar374._4_4_ = fVar136;
  auVar374._0_4_ = fVar136;
  auVar374._8_4_ = fVar136;
  auVar374._12_4_ = fVar136;
  fStack_850 = fVar136;
  _local_860 = auVar374;
  fStack_84c = fVar136;
  fStack_848 = fVar136;
  fStack_844 = fVar136;
  auVar375 = ZEXT3264(_local_860);
  auVar187._0_4_ = fVar226 * *pfVar3 + fVar242 * *pfVar7;
  auVar187._4_4_ = fVar239 * pfVar3[1] + fVar257 * pfVar7[1];
  auVar187._8_4_ = fVar240 * pfVar3[2] + fVar258 * pfVar7[2];
  auVar187._12_4_ = fVar241 * pfVar3[3] + fVar259 * pfVar7[3];
  auVar142 = vunpcklps_avx(auVar370,auVar374);
  fVar172 = *(float *)(ray + k * 4 + 0xc0);
  auVar381._4_4_ = fVar172;
  auVar381._0_4_ = fVar172;
  auVar381._8_4_ = fVar172;
  auVar381._12_4_ = fVar172;
  fStack_870 = fVar172;
  _local_880 = auVar381;
  fStack_86c = fVar172;
  fStack_868 = fVar172;
  fStack_864 = fVar172;
  auVar384 = ZEXT3264(_local_880);
  _local_970 = vinsertps_avx(auVar142,auVar381,0x28);
  auVar408 = ZEXT1664(_local_970);
  auVar109._0_4_ = (auVar140._0_4_ + auVar229._0_4_) * 0.5;
  auVar109._4_4_ = (auVar140._4_4_ + auVar229._4_4_) * 0.5;
  auVar109._8_4_ = (auVar140._8_4_ + auVar229._8_4_) * 0.5;
  auVar109._12_4_ = (auVar140._12_4_ + auVar229._12_4_) * 0.5;
  auVar142 = vsubps_avx(auVar109,auVar17);
  auVar142 = vdpps_avx(auVar142,_local_970,0x7f);
  local_980 = vdpps_avx(_local_970,_local_970,0x7f);
  auVar147 = vrcpss_avx(local_980,local_980);
  fVar174 = auVar142._0_4_ * (2.0 - local_980._0_4_ * auVar147._0_4_) * auVar147._0_4_;
  auVar343 = ZEXT464((uint)fVar174);
  auVar147 = vshufps_avx(ZEXT416((uint)fVar174),ZEXT416((uint)fVar174),0);
  auVar283._0_4_ = auVar17._0_4_ + local_970._0_4_ * auVar147._0_4_;
  auVar283._4_4_ = auVar17._4_4_ + local_970._4_4_ * auVar147._4_4_;
  auVar283._8_4_ = auVar17._8_4_ + local_970._8_4_ * auVar147._8_4_;
  auVar283._12_4_ = auVar17._12_4_ + local_970._12_4_ * auVar147._12_4_;
  auVar142 = vblendps_avx(auVar283,_DAT_01feba10,8);
  _local_a60 = vsubps_avx(auVar140,auVar142);
  pfVar1 = (float *)(lVar13 + lVar14 * (uVar103 + 3));
  _local_a70 = vsubps_avx(auVar187,auVar142);
  auVar141._0_4_ = fVar226 * *pfVar4 + fVar242 * *pfVar1;
  auVar141._4_4_ = fVar239 * pfVar4[1] + fVar257 * pfVar1[1];
  auVar141._8_4_ = fVar240 * pfVar4[2] + fVar258 * pfVar1[2];
  auVar141._12_4_ = fVar241 * pfVar4[3] + fVar259 * pfVar1[3];
  _local_a80 = vsubps_avx(auVar229,auVar142);
  _local_a90 = vsubps_avx(auVar141,auVar142);
  auVar142 = vshufps_avx(_local_a60,_local_a60,0);
  register0x00001250 = auVar142;
  _local_360 = auVar142;
  auVar142 = vshufps_avx(_local_a60,_local_a60,0x55);
  register0x00001250 = auVar142;
  _local_1a0 = auVar142;
  auVar142 = vshufps_avx(_local_a60,_local_a60,0xaa);
  register0x00001250 = auVar142;
  _local_1c0 = auVar142;
  auVar142 = vshufps_avx(_local_a60,_local_a60,0xff);
  register0x00001290 = auVar142;
  _local_1e0 = auVar142;
  auVar142 = vshufps_avx(_local_a80,_local_a80,0);
  register0x00001290 = auVar142;
  _local_380 = auVar142;
  auVar142 = vshufps_avx(_local_a80,_local_a80,0x55);
  register0x00001290 = auVar142;
  _local_3a0 = auVar142;
  auVar142 = vshufps_avx(_local_a80,_local_a80,0xaa);
  register0x00001290 = auVar142;
  _local_3c0 = auVar142;
  auVar142 = vshufps_avx(_local_a80,_local_a80,0xff);
  register0x00001290 = auVar142;
  _local_200 = auVar142;
  auVar142 = vshufps_avx(_local_a70,_local_a70,0);
  register0x00001290 = auVar142;
  _local_3e0 = auVar142;
  auVar142 = vshufps_avx(_local_a70,_local_a70,0x55);
  register0x00001290 = auVar142;
  _local_400 = auVar142;
  auVar142 = vshufps_avx(_local_a70,_local_a70,0xaa);
  register0x00001290 = auVar142;
  _local_420 = auVar142;
  auVar142 = vshufps_avx(_local_a70,_local_a70,0xff);
  register0x00001290 = auVar142;
  _local_440 = auVar142;
  auVar142 = vshufps_avx(_local_a90,_local_a90,0);
  register0x00001290 = auVar142;
  _local_460 = auVar142;
  auVar142 = vshufps_avx(_local_a90,_local_a90,0x55);
  register0x00001290 = auVar142;
  _local_480 = auVar142;
  auVar142 = vshufps_avx(_local_a90,_local_a90,0xaa);
  register0x00001290 = auVar142;
  _local_4a0 = auVar142;
  auVar142 = vshufps_avx(_local_a90,_local_a90,0xff);
  register0x00001290 = auVar142;
  _local_220 = auVar142;
  auVar142 = ZEXT416((uint)(fVar135 * fVar135 + fVar136 * fVar136 + fVar172 * fVar172));
  auVar142 = vshufps_avx(auVar142,auVar142,0);
  local_240._16_16_ = auVar142;
  local_240._0_16_ = auVar142;
  fVar135 = *(float *)(ray + k * 4 + 0x60);
  local_940 = ZEXT416((uint)fVar174);
  auVar142 = vshufps_avx(ZEXT416((uint)(fVar135 - fVar174)),ZEXT416((uint)(fVar135 - fVar174)),0);
  local_280._16_16_ = auVar142;
  local_280._0_16_ = auVar142;
  auVar142 = vpshufd_avx(ZEXT416(uVar97),0);
  local_500._16_16_ = auVar142;
  local_500._0_16_ = auVar142;
  auVar142 = vpshufd_avx(ZEXT416(*(uint *)(local_930 + lVar101 * 4 + 6)),0);
  local_520._16_16_ = auVar142;
  local_520._0_16_ = auVar142;
  register0x00001390 = auVar147;
  _local_8c0 = auVar147;
  uVar99 = 0;
  uVar103 = 1;
  auVar121._8_4_ = 0x7fffffff;
  auVar121._0_8_ = 0x7fffffff7fffffff;
  auVar121._12_4_ = 0x7fffffff;
  auVar121._16_4_ = 0x7fffffff;
  auVar121._20_4_ = 0x7fffffff;
  auVar121._24_4_ = 0x7fffffff;
  auVar121._28_4_ = 0x7fffffff;
  local_4c0 = vandps_avx(local_240,auVar121);
  auVar142 = vsqrtss_avx(local_980,local_980);
  auVar17 = vsqrtss_avx(local_980,local_980);
  auVar275 = ZEXT1664(ZEXT816(0x3f80000000000000));
  do {
    local_9f0 = auVar275._0_16_;
    auVar147 = vmovshdup_avx(local_9f0);
    fVar257 = auVar147._0_4_ - auVar275._0_4_;
    auVar147 = vshufps_avx(local_9f0,local_9f0,0);
    local_9a0._16_16_ = auVar147;
    local_9a0._0_16_ = auVar147;
    auVar230 = vshufps_avx(ZEXT416((uint)fVar257),ZEXT416((uint)fVar257),0);
    local_820._16_16_ = auVar230;
    local_820._0_16_ = auVar230;
    fVar418 = auVar230._0_4_;
    fVar421 = auVar230._4_4_;
    fVar426 = auVar230._8_4_;
    fVar176 = auVar230._12_4_;
    fVar400 = auVar147._0_4_;
    auVar235._0_4_ = fVar400 + fVar418 * 0.0;
    fVar412 = auVar147._4_4_;
    auVar235._4_4_ = fVar412 + fVar421 * 0.14285715;
    fVar415 = auVar147._8_4_;
    auVar235._8_4_ = fVar415 + fVar426 * 0.2857143;
    fStack_be4 = auVar147._12_4_;
    auVar235._12_4_ = fStack_be4 + fVar176 * 0.42857146;
    auVar235._16_4_ = fVar400 + fVar418 * 0.5714286;
    auVar235._20_4_ = fVar412 + fVar421 * 0.71428573;
    auVar235._24_4_ = fVar415 + fVar426 * 0.8571429;
    auVar235._28_4_ = fStack_be4 + fVar176;
    auVar155._8_4_ = 0x3f800000;
    auVar155._0_8_ = &DAT_3f8000003f800000;
    auVar155._12_4_ = 0x3f800000;
    auVar155._16_4_ = 0x3f800000;
    auVar155._20_4_ = 0x3f800000;
    auVar155._24_4_ = 0x3f800000;
    auVar155._28_4_ = 0x3f800000;
    auVar120 = vsubps_avx(auVar155,auVar235);
    local_c00._4_4_ = auVar235._4_4_ * auVar235._4_4_;
    local_c00._0_4_ = auVar235._0_4_ * auVar235._0_4_;
    fStack_bf8 = auVar235._8_4_ * auVar235._8_4_;
    fStack_bf4 = auVar235._12_4_ * auVar235._12_4_;
    fStack_bf0 = auVar235._16_4_ * auVar235._16_4_;
    fStack_bec = auVar235._20_4_ * auVar235._20_4_;
    fStack_be8 = auVar235._24_4_ * auVar235._24_4_;
    fVar258 = auVar235._0_4_ * 3.0;
    fVar262 = auVar235._4_4_ * 3.0;
    fVar276 = auVar235._8_4_ * 3.0;
    fVar277 = auVar235._12_4_ * 3.0;
    fVar278 = auVar235._16_4_ * 3.0;
    fVar260 = auVar235._20_4_ * 3.0;
    fVar261 = auVar235._24_4_ * 3.0;
    fVar172 = auVar120._0_4_;
    auVar314._0_4_ = fVar172 * fVar172;
    fVar174 = auVar120._4_4_;
    auVar314._4_4_ = fVar174 * fVar174;
    fVar226 = auVar120._8_4_;
    auVar314._8_4_ = fVar226 * fVar226;
    fVar239 = auVar120._12_4_;
    auVar314._12_4_ = fVar239 * fVar239;
    fVar240 = auVar120._16_4_;
    auVar314._16_4_ = fVar240 * fVar240;
    fVar241 = auVar120._20_4_;
    auVar314._20_4_ = fVar241 * fVar241;
    fVar242 = auVar120._24_4_;
    auVar314._28_36_ = auVar343._28_36_;
    auVar314._24_4_ = fVar242 * fVar242;
    fVar259 = auVar120._28_4_;
    fVar279 = (auVar314._0_4_ * (fVar172 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar291 = (auVar314._4_4_ * (fVar174 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar293 = (auVar314._8_4_ * (fVar226 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar295 = (auVar314._12_4_ * (fVar239 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar297 = (auVar314._16_4_ * (fVar240 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar299 = (auVar314._20_4_ * (fVar241 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar301 = (auVar314._24_4_ * (fVar242 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar357 = -fVar172 * auVar235._0_4_ * auVar235._0_4_ * 0.5;
    fVar362 = -fVar174 * auVar235._4_4_ * auVar235._4_4_ * 0.5;
    fVar363 = -fVar226 * auVar235._8_4_ * auVar235._8_4_ * 0.5;
    fVar364 = -fVar239 * auVar235._12_4_ * auVar235._12_4_ * 0.5;
    fVar365 = -fVar240 * auVar235._16_4_ * auVar235._16_4_ * 0.5;
    fVar366 = -fVar241 * auVar235._20_4_ * auVar235._20_4_ * 0.5;
    fVar367 = -fVar242 * auVar235._24_4_ * auVar235._24_4_ * 0.5;
    fVar136 = auVar408._28_4_;
    fVar372 = auVar371._28_4_ + fVar136;
    fVar377 = auVar375._28_4_ + fVar136;
    fVar397 = (auVar235._0_4_ * auVar235._0_4_ * (fVar258 + -5.0) + 2.0) * 0.5;
    fVar409 = (auVar235._4_4_ * auVar235._4_4_ * (fVar262 + -5.0) + 2.0) * 0.5;
    fVar413 = (auVar235._8_4_ * auVar235._8_4_ * (fVar276 + -5.0) + 2.0) * 0.5;
    fVar416 = (auVar235._12_4_ * auVar235._12_4_ * (fVar277 + -5.0) + 2.0) * 0.5;
    fVar419 = (auVar235._16_4_ * auVar235._16_4_ * (fVar278 + -5.0) + 2.0) * 0.5;
    fVar422 = (auVar235._20_4_ * auVar235._20_4_ * (fVar260 + -5.0) + 2.0) * 0.5;
    fVar424 = (auVar235._24_4_ * auVar235._24_4_ * (fVar261 + -5.0) + 2.0) * 0.5;
    fVar368 = -fVar259 + fVar372;
    fVar378 = -auVar235._0_4_ * fVar172 * fVar172 * 0.5;
    fVar385 = -auVar235._4_4_ * fVar174 * fVar174 * 0.5;
    fVar387 = -auVar235._8_4_ * fVar226 * fVar226 * 0.5;
    fVar389 = -auVar235._12_4_ * fVar239 * fVar239 * 0.5;
    fVar391 = -auVar235._16_4_ * fVar240 * fVar240 * 0.5;
    fVar393 = -auVar235._20_4_ * fVar241 * fVar241 * 0.5;
    fVar395 = -auVar235._24_4_ * fVar242 * fVar242 * 0.5;
    fVar181 = fVar378 * (float)local_360._0_4_ +
              fVar397 * (float)local_380._0_4_ +
              fVar357 * (float)local_460._0_4_ + fVar279 * (float)local_3e0._0_4_;
    fVar205 = fVar385 * (float)local_360._4_4_ +
              fVar409 * (float)local_380._4_4_ +
              fVar362 * (float)local_460._4_4_ + fVar291 * (float)local_3e0._4_4_;
    fVar208 = fVar387 * fStack_358 +
              fVar413 * fStack_378 + fVar363 * fStack_458 + fVar293 * fStack_3d8;
    fVar211 = fVar389 * fStack_354 +
              fVar416 * fStack_374 + fVar364 * fStack_454 + fVar295 * fStack_3d4;
    fVar214 = fVar391 * fStack_350 +
              fVar419 * fStack_370 + fVar365 * fStack_450 + fVar297 * fStack_3d0;
    fVar217 = fVar393 * fStack_34c +
              fVar422 * fStack_36c + fVar366 * fStack_44c + fVar299 * fStack_3cc;
    fVar220 = fVar395 * fStack_348 +
              fVar424 * fStack_368 + fVar367 * fStack_448 + fVar301 * fStack_3c8;
    fVar223 = fVar136 + 2.0 + fVar368;
    fVar182 = (float)local_1a0._0_4_ * fVar378 +
              fVar397 * (float)local_3a0._0_4_ +
              fVar357 * (float)local_480._0_4_ + fVar279 * (float)local_400._0_4_;
    fVar206 = (float)local_1a0._4_4_ * fVar385 +
              fVar409 * (float)local_3a0._4_4_ +
              fVar362 * (float)local_480._4_4_ + fVar291 * (float)local_400._4_4_;
    fVar209 = fStack_198 * fVar387 +
              fVar413 * fStack_398 + fVar363 * fStack_478 + fVar293 * fStack_3f8;
    fVar212 = fStack_194 * fVar389 +
              fVar416 * fStack_394 + fVar364 * fStack_474 + fVar295 * fStack_3f4;
    fVar215 = fStack_190 * fVar391 +
              fVar419 * fStack_390 + fVar365 * fStack_470 + fVar297 * fStack_3f0;
    fVar218 = fStack_18c * fVar393 +
              fVar422 * fStack_38c + fVar366 * fStack_46c + fVar299 * fStack_3ec;
    fVar221 = fStack_188 * fVar395 +
              fVar424 * fStack_388 + fVar367 * fStack_468 + fVar301 * fStack_3e8;
    fVar224 = fVar368 + fVar372 + fVar377;
    fVar183 = (float)local_1c0._0_4_ * fVar378 +
              fVar397 * (float)local_3c0._0_4_ +
              fVar357 * (float)local_4a0._0_4_ + fVar279 * (float)local_420._0_4_;
    fVar207 = (float)local_1c0._4_4_ * fVar385 +
              fVar409 * (float)local_3c0._4_4_ +
              fVar362 * (float)local_4a0._4_4_ + fVar291 * (float)local_420._4_4_;
    fVar210 = fStack_1b8 * fVar387 +
              fVar413 * fStack_3b8 + fVar363 * fStack_498 + fVar293 * fStack_418;
    fVar213 = fStack_1b4 * fVar389 +
              fVar416 * fStack_3b4 + fVar364 * fStack_494 + fVar295 * fStack_414;
    fVar216 = fStack_1b0 * fVar391 +
              fVar419 * fStack_3b0 + fVar365 * fStack_490 + fVar297 * fStack_410;
    fVar219 = fStack_1ac * fVar393 +
              fVar422 * fStack_3ac + fVar366 * fStack_48c + fVar299 * fStack_40c;
    fVar222 = fStack_1a8 * fVar395 +
              fVar424 * fStack_3a8 + fVar367 * fStack_488 + fVar301 * fStack_408;
    fVar225 = fVar368 + fVar377 + auVar384._28_4_ + fVar136;
    auVar286._0_4_ =
         (float)local_1e0._0_4_ * fVar378 +
         (float)local_200._0_4_ * fVar397 +
         fVar357 * (float)local_220._0_4_ + fVar279 * (float)local_440._0_4_;
    auVar286._4_4_ =
         (float)local_1e0._4_4_ * fVar385 +
         (float)local_200._4_4_ * fVar409 +
         fVar362 * (float)local_220._4_4_ + fVar291 * (float)local_440._4_4_;
    auVar286._8_4_ =
         fStack_1d8 * fVar387 + fStack_1f8 * fVar413 + fVar363 * fStack_218 + fVar293 * fStack_438;
    auVar286._12_4_ =
         fStack_1d4 * fVar389 + fStack_1f4 * fVar416 + fVar364 * fStack_214 + fVar295 * fStack_434;
    auVar286._16_4_ =
         fStack_1d0 * fVar391 + fStack_1f0 * fVar419 + fVar365 * fStack_210 + fVar297 * fStack_430;
    auVar286._20_4_ =
         fStack_1cc * fVar393 + fStack_1ec * fVar422 + fVar366 * fStack_20c + fVar299 * fStack_42c;
    auVar286._24_4_ =
         fStack_1c8 * fVar395 + fStack_1e8 * fVar424 + fVar367 * fStack_208 + fVar301 * fStack_428;
    auVar286._28_4_ = fVar368 + fVar136 + 2.0 + -fVar259 + 0.0;
    auVar26._4_4_ = (fVar174 + fVar174) * auVar235._4_4_;
    auVar26._0_4_ = (fVar172 + fVar172) * auVar235._0_4_;
    auVar26._8_4_ = (fVar226 + fVar226) * auVar235._8_4_;
    auVar26._12_4_ = (fVar239 + fVar239) * auVar235._12_4_;
    auVar26._16_4_ = (fVar240 + fVar240) * auVar235._16_4_;
    auVar26._20_4_ = (fVar241 + fVar241) * auVar235._20_4_;
    auVar26._24_4_ = (fVar242 + fVar242) * auVar235._24_4_;
    auVar26._28_4_ = auVar235._28_4_ + auVar235._28_4_;
    auVar120 = vsubps_avx(auVar26,auVar314._0_32_);
    auVar21._4_4_ = (fVar174 + fVar174) * (fVar262 + 2.0);
    auVar21._0_4_ = (fVar172 + fVar172) * (fVar258 + 2.0);
    auVar21._8_4_ = (fVar226 + fVar226) * (fVar276 + 2.0);
    auVar21._12_4_ = (fVar239 + fVar239) * (fVar277 + 2.0);
    auVar21._16_4_ = (fVar240 + fVar240) * (fVar278 + 2.0);
    auVar21._20_4_ = (fVar241 + fVar241) * (fVar260 + 2.0);
    auVar21._24_4_ = (fVar242 + fVar242) * (fVar261 + 2.0);
    auVar21._28_4_ = 0x40400000;
    auVar22._4_4_ = fVar174 * fVar174 * 3.0;
    auVar22._0_4_ = fVar172 * fVar172 * 3.0;
    auVar22._8_4_ = fVar226 * fVar226 * 3.0;
    auVar22._12_4_ = fVar239 * fVar239 * 3.0;
    auVar22._16_4_ = fVar240 * fVar240 * 3.0;
    auVar22._20_4_ = fVar241 * fVar241 * 3.0;
    auVar22._24_4_ = fVar242 * fVar242 * 3.0;
    auVar22._28_4_ = fVar259;
    auVar121 = vsubps_avx(auVar21,auVar22);
    auVar26 = vsubps_avx(_local_c00,auVar26);
    fVar364 = auVar120._0_4_ * 0.5;
    fVar365 = auVar120._4_4_ * 0.5;
    fVar366 = auVar120._8_4_ * 0.5;
    fVar367 = auVar120._12_4_ * 0.5;
    fVar368 = auVar120._16_4_ * 0.5;
    fVar372 = auVar120._20_4_ * 0.5;
    fVar377 = auVar120._24_4_ * 0.5;
    fVar295 = (auVar235._0_4_ * fVar258 + (auVar235._0_4_ + auVar235._0_4_) * (fVar258 + -5.0)) *
              0.5;
    fVar297 = (auVar235._4_4_ * fVar262 + (auVar235._4_4_ + auVar235._4_4_) * (fVar262 + -5.0)) *
              0.5;
    fVar299 = (auVar235._8_4_ * fVar276 + (auVar235._8_4_ + auVar235._8_4_) * (fVar276 + -5.0)) *
              0.5;
    fVar301 = (auVar235._12_4_ * fVar277 + (auVar235._12_4_ + auVar235._12_4_) * (fVar277 + -5.0)) *
              0.5;
    fVar357 = (auVar235._16_4_ * fVar278 + (auVar235._16_4_ + auVar235._16_4_) * (fVar278 + -5.0)) *
              0.5;
    fVar362 = (auVar235._20_4_ * fVar260 + (auVar235._20_4_ + auVar235._20_4_) * (fVar260 + -5.0)) *
              0.5;
    fVar363 = (auVar235._24_4_ * fVar261 + (auVar235._24_4_ + auVar235._24_4_) * (fVar261 + -5.0)) *
              0.5;
    fVar136 = auVar121._0_4_ * 0.5;
    fVar172 = auVar121._4_4_ * 0.5;
    fVar174 = auVar121._8_4_ * 0.5;
    fVar226 = auVar121._12_4_ * 0.5;
    fVar242 = auVar121._16_4_ * 0.5;
    fVar258 = auVar121._20_4_ * 0.5;
    fVar277 = auVar121._24_4_ * 0.5;
    fVar239 = auVar26._0_4_ * 0.5;
    fVar240 = auVar26._4_4_ * 0.5;
    fVar241 = auVar26._8_4_ * 0.5;
    fVar278 = auVar26._12_4_ * 0.5;
    fVar260 = auVar26._16_4_ * 0.5;
    fVar291 = auVar26._20_4_ * 0.5;
    fVar293 = auVar26._24_4_ * 0.5;
    fVar356 = fVar259 + fVar259 + auVar120._28_4_;
    fVar332 = fVar356 + fVar259 + fVar259 + -4.0;
    fVar279 = auVar235._28_4_ + -4.0 + auVar121._28_4_ + auVar26._28_4_ + 3.0;
    auVar147 = vpermilps_avx(ZEXT416((uint)(fVar257 * 0.04761905)),0);
    fVar262 = auVar147._0_4_;
    fVar303 = fVar262 * (fVar364 * (float)local_360._0_4_ +
                        fVar295 * (float)local_380._0_4_ +
                        fVar136 * (float)local_3e0._0_4_ + fVar239 * (float)local_460._0_4_);
    fVar276 = auVar147._4_4_;
    fVar315 = fVar276 * (fVar365 * (float)local_360._4_4_ +
                        fVar297 * (float)local_380._4_4_ +
                        fVar172 * (float)local_3e0._4_4_ + fVar240 * (float)local_460._4_4_);
    local_960._4_4_ = fVar315;
    local_960._0_4_ = fVar303;
    fVar261 = auVar147._8_4_;
    fVar317 = fVar261 * (fVar366 * fStack_358 +
                        fVar299 * fStack_378 + fVar174 * fStack_3d8 + fVar241 * fStack_458);
    local_960._8_4_ = fVar317;
    fVar259 = auVar147._12_4_;
    fVar320 = fVar259 * (fVar367 * fStack_354 +
                        fVar301 * fStack_374 + fVar226 * fStack_3d4 + fVar278 * fStack_454);
    local_960._12_4_ = fVar320;
    fVar323 = fVar262 * (fVar368 * fStack_350 +
                        fVar357 * fStack_370 + fVar242 * fStack_3d0 + fVar260 * fStack_450);
    local_960._16_4_ = fVar323;
    fVar326 = fVar276 * (fVar372 * fStack_34c +
                        fVar362 * fStack_36c + fVar258 * fStack_3cc + fVar291 * fStack_44c);
    local_960._20_4_ = fVar326;
    fVar329 = fVar261 * (fVar377 * fStack_348 +
                        fVar363 * fStack_368 + fVar277 * fStack_3c8 + fVar293 * fStack_448);
    local_960._24_4_ = fVar329;
    local_960._28_4_ = fVar332;
    fVar333 = fVar262 * ((float)local_1a0._0_4_ * fVar364 +
                        fVar295 * (float)local_3a0._0_4_ +
                        fVar136 * (float)local_400._0_4_ + fVar239 * (float)local_480._0_4_);
    fVar344 = fVar276 * ((float)local_1a0._4_4_ * fVar365 +
                        fVar297 * (float)local_3a0._4_4_ +
                        fVar172 * (float)local_400._4_4_ + fVar240 * (float)local_480._4_4_);
    auVar24._4_4_ = fVar344;
    auVar24._0_4_ = fVar333;
    fVar346 = fVar261 * (fStack_198 * fVar366 +
                        fVar299 * fStack_398 + fVar174 * fStack_3f8 + fVar241 * fStack_478);
    auVar24._8_4_ = fVar346;
    fVar348 = fVar259 * (fStack_194 * fVar367 +
                        fVar301 * fStack_394 + fVar226 * fStack_3f4 + fVar278 * fStack_474);
    auVar24._12_4_ = fVar348;
    fVar350 = fVar262 * (fStack_190 * fVar368 +
                        fVar357 * fStack_390 + fVar242 * fStack_3f0 + fVar260 * fStack_470);
    auVar24._16_4_ = fVar350;
    fVar352 = fVar276 * (fStack_18c * fVar372 +
                        fVar362 * fStack_38c + fVar258 * fStack_3ec + fVar291 * fStack_46c);
    auVar24._20_4_ = fVar352;
    fVar354 = fVar261 * (fStack_188 * fVar377 +
                        fVar363 * fStack_388 + fVar277 * fStack_3e8 + fVar293 * fStack_468);
    auVar24._24_4_ = fVar354;
    auVar24._28_4_ = fVar356;
    fVar379 = fVar262 * ((float)local_1c0._0_4_ * fVar364 +
                        fVar136 * (float)local_420._0_4_ + fVar239 * (float)local_4a0._0_4_ +
                        fVar295 * (float)local_3c0._0_4_);
    fVar386 = fVar276 * ((float)local_1c0._4_4_ * fVar365 +
                        fVar172 * (float)local_420._4_4_ + fVar240 * (float)local_4a0._4_4_ +
                        fVar297 * (float)local_3c0._4_4_);
    auVar31._4_4_ = fVar386;
    auVar31._0_4_ = fVar379;
    fVar388 = fVar261 * (fStack_1b8 * fVar366 +
                        fVar174 * fStack_418 + fVar241 * fStack_498 + fVar299 * fStack_3b8);
    auVar31._8_4_ = fVar388;
    fVar390 = fVar259 * (fStack_1b4 * fVar367 +
                        fVar226 * fStack_414 + fVar278 * fStack_494 + fVar301 * fStack_3b4);
    auVar31._12_4_ = fVar390;
    fVar392 = fVar262 * (fStack_1b0 * fVar368 +
                        fVar242 * fStack_410 + fVar260 * fStack_490 + fVar357 * fStack_3b0);
    auVar31._16_4_ = fVar392;
    fVar394 = fVar276 * (fStack_1ac * fVar372 +
                        fVar258 * fStack_40c + fVar291 * fStack_48c + fVar362 * fStack_3ac);
    auVar31._20_4_ = fVar394;
    fVar396 = fVar261 * (fStack_1a8 * fVar377 +
                        fVar277 * fStack_408 + fVar293 * fStack_488 + fVar363 * fStack_3a8);
    auVar31._24_4_ = fVar396;
    auVar31._28_4_ = -auVar235._28_4_;
    fVar239 = fVar262 * ((float)local_1e0._0_4_ * fVar364 +
                        (float)local_200._0_4_ * fVar295 +
                        fVar136 * (float)local_440._0_4_ + (float)local_220._0_4_ * fVar239);
    fVar240 = fVar276 * ((float)local_1e0._4_4_ * fVar365 +
                        (float)local_200._4_4_ * fVar297 +
                        fVar172 * (float)local_440._4_4_ + (float)local_220._4_4_ * fVar240);
    auVar23._4_4_ = fVar240;
    auVar23._0_4_ = fVar239;
    fVar241 = fVar261 * (fStack_1d8 * fVar366 +
                        fStack_1f8 * fVar299 + fVar174 * fStack_438 + fStack_218 * fVar241);
    auVar23._8_4_ = fVar241;
    fVar259 = fVar259 * (fStack_1d4 * fVar367 +
                        fStack_1f4 * fVar301 + fVar226 * fStack_434 + fStack_214 * fVar278);
    auVar23._12_4_ = fVar259;
    fVar262 = fVar262 * (fStack_1d0 * fVar368 +
                        fStack_1f0 * fVar357 + fVar242 * fStack_430 + fStack_210 * fVar260);
    auVar23._16_4_ = fVar262;
    fVar276 = fVar276 * (fStack_1cc * fVar372 +
                        fStack_1ec * fVar362 + fVar258 * fStack_42c + fStack_20c * fVar291);
    auVar23._20_4_ = fVar276;
    fVar261 = fVar261 * (fStack_1c8 * fVar377 +
                        fStack_1e8 * fVar363 + fVar277 * fStack_428 + fStack_208 * fVar293);
    auVar23._24_4_ = fVar261;
    auVar23._28_4_ = fVar279;
    auVar27._4_4_ = fVar206;
    auVar27._0_4_ = fVar182;
    auVar27._8_4_ = fVar209;
    auVar27._12_4_ = fVar212;
    auVar27._16_4_ = fVar215;
    auVar27._20_4_ = fVar218;
    auVar27._24_4_ = fVar221;
    auVar27._28_4_ = fVar224;
    auVar120 = vperm2f128_avx(auVar27,auVar27,1);
    auVar120 = vshufps_avx(auVar120,auVar27,0x30);
    auVar21 = vshufps_avx(auVar27,auVar120,0x29);
    auVar84._4_4_ = fVar207;
    auVar84._0_4_ = fVar183;
    auVar84._8_4_ = fVar210;
    auVar84._12_4_ = fVar213;
    auVar84._16_4_ = fVar216;
    auVar84._20_4_ = fVar219;
    auVar84._24_4_ = fVar222;
    auVar84._28_4_ = fVar225;
    auVar120 = vperm2f128_avx(auVar84,auVar84,1);
    auVar120 = vshufps_avx(auVar120,auVar84,0x30);
    auVar22 = vshufps_avx(auVar84,auVar120,0x29);
    auVar121 = vsubps_avx(auVar286,auVar23);
    auVar120 = vperm2f128_avx(auVar121,auVar121,1);
    auVar120 = vshufps_avx(auVar120,auVar121,0x30);
    auVar23 = vshufps_avx(auVar121,auVar120,0x29);
    auVar26 = vsubps_avx(auVar21,auVar27);
    auVar27 = vsubps_avx(auVar22,auVar84);
    fVar172 = auVar26._0_4_;
    fVar242 = auVar26._4_4_;
    auVar360._4_4_ = fVar386 * fVar242;
    auVar360._0_4_ = fVar379 * fVar172;
    fVar277 = auVar26._8_4_;
    auVar360._8_4_ = fVar388 * fVar277;
    fVar293 = auVar26._12_4_;
    auVar360._12_4_ = fVar390 * fVar293;
    fVar362 = auVar26._16_4_;
    auVar360._16_4_ = fVar392 * fVar362;
    fVar368 = auVar26._20_4_;
    auVar360._20_4_ = fVar394 * fVar368;
    fVar389 = auVar26._24_4_;
    auVar360._24_4_ = fVar396 * fVar389;
    auVar360._28_4_ = auVar121._28_4_;
    fVar174 = auVar27._0_4_;
    fVar257 = auVar27._4_4_;
    auVar28._4_4_ = fVar344 * fVar257;
    auVar28._0_4_ = fVar333 * fVar174;
    fVar278 = auVar27._8_4_;
    auVar28._8_4_ = fVar346 * fVar278;
    fVar295 = auVar27._12_4_;
    auVar28._12_4_ = fVar348 * fVar295;
    fVar363 = auVar27._16_4_;
    auVar28._16_4_ = fVar350 * fVar363;
    fVar372 = auVar27._20_4_;
    auVar28._20_4_ = fVar352 * fVar372;
    fVar391 = auVar27._24_4_;
    auVar28._24_4_ = fVar354 * fVar391;
    auVar28._28_4_ = auVar120._28_4_;
    auVar360 = vsubps_avx(auVar28,auVar360);
    auVar86._4_4_ = fVar205;
    auVar86._0_4_ = fVar181;
    auVar86._8_4_ = fVar208;
    auVar86._12_4_ = fVar211;
    auVar86._16_4_ = fVar214;
    auVar86._20_4_ = fVar217;
    auVar86._24_4_ = fVar220;
    auVar86._28_4_ = fVar223;
    auVar120 = vperm2f128_avx(auVar86,auVar86,1);
    auVar120 = vshufps_avx(auVar120,auVar86,0x30);
    auVar27 = vshufps_avx(auVar86,auVar120,0x29);
    auVar28 = vsubps_avx(auVar27,auVar86);
    auVar29._4_4_ = fVar315 * fVar257;
    auVar29._0_4_ = fVar303 * fVar174;
    auVar29._8_4_ = fVar317 * fVar278;
    auVar29._12_4_ = fVar320 * fVar295;
    auVar29._16_4_ = fVar323 * fVar363;
    auVar29._20_4_ = fVar326 * fVar372;
    auVar29._24_4_ = fVar329 * fVar391;
    auVar29._28_4_ = auVar27._28_4_;
    fVar226 = auVar28._0_4_;
    fVar258 = auVar28._4_4_;
    auVar361._4_4_ = fVar386 * fVar258;
    auVar361._0_4_ = fVar379 * fVar226;
    fVar260 = auVar28._8_4_;
    auVar361._8_4_ = fVar388 * fVar260;
    fVar297 = auVar28._12_4_;
    auVar361._12_4_ = fVar390 * fVar297;
    fVar364 = auVar28._16_4_;
    auVar361._16_4_ = fVar392 * fVar364;
    fVar377 = auVar28._20_4_;
    auVar361._20_4_ = fVar394 * fVar377;
    fVar393 = auVar28._24_4_;
    auVar361._24_4_ = fVar396 * fVar393;
    auVar361._28_4_ = auVar22._28_4_;
    auVar29 = vsubps_avx(auVar361,auVar29);
    auVar30._4_4_ = fVar344 * fVar258;
    auVar30._0_4_ = fVar333 * fVar226;
    auVar30._8_4_ = fVar346 * fVar260;
    auVar30._12_4_ = fVar348 * fVar297;
    auVar30._16_4_ = fVar350 * fVar364;
    auVar30._20_4_ = fVar352 * fVar377;
    auVar30._24_4_ = fVar354 * fVar393;
    auVar30._28_4_ = auVar22._28_4_;
    auVar32._4_4_ = fVar242 * fVar315;
    auVar32._0_4_ = fVar172 * fVar303;
    auVar32._8_4_ = fVar277 * fVar317;
    auVar32._12_4_ = fVar293 * fVar320;
    auVar32._16_4_ = fVar362 * fVar323;
    auVar32._20_4_ = fVar368 * fVar326;
    auVar32._24_4_ = fVar389 * fVar329;
    auVar32._28_4_ = fVar225;
    auVar361 = vsubps_avx(auVar32,auVar30);
    fVar136 = auVar361._28_4_;
    fVar291 = auVar29._28_4_ + fVar136;
    auVar236._0_4_ = fVar226 * fVar226 + fVar172 * fVar172 + fVar174 * fVar174;
    auVar236._4_4_ = fVar258 * fVar258 + fVar242 * fVar242 + fVar257 * fVar257;
    auVar236._8_4_ = fVar260 * fVar260 + fVar277 * fVar277 + fVar278 * fVar278;
    auVar236._12_4_ = fVar297 * fVar297 + fVar293 * fVar293 + fVar295 * fVar295;
    auVar236._16_4_ = fVar364 * fVar364 + fVar362 * fVar362 + fVar363 * fVar363;
    auVar236._20_4_ = fVar377 * fVar377 + fVar368 * fVar368 + fVar372 * fVar372;
    auVar236._24_4_ = fVar393 * fVar393 + fVar389 * fVar389 + fVar391 * fVar391;
    auVar236._28_4_ = fVar136 + fVar136 + fVar291;
    auVar120 = vrcpps_avx(auVar236);
    fVar299 = auVar120._0_4_;
    fVar301 = auVar120._4_4_;
    auVar338._4_4_ = fVar301 * auVar236._4_4_;
    auVar338._0_4_ = fVar299 * auVar236._0_4_;
    fVar357 = auVar120._8_4_;
    auVar338._8_4_ = fVar357 * auVar236._8_4_;
    fVar365 = auVar120._12_4_;
    auVar338._12_4_ = fVar365 * auVar236._12_4_;
    fVar366 = auVar120._16_4_;
    auVar338._16_4_ = fVar366 * auVar236._16_4_;
    fVar367 = auVar120._20_4_;
    auVar338._20_4_ = fVar367 * auVar236._20_4_;
    fVar378 = auVar120._24_4_;
    auVar338._24_4_ = fVar378 * auVar236._24_4_;
    auVar338._28_4_ = fVar225;
    auVar404._8_4_ = 0x3f800000;
    auVar404._0_8_ = &DAT_3f8000003f800000;
    auVar404._12_4_ = 0x3f800000;
    auVar404._16_4_ = 0x3f800000;
    auVar404._20_4_ = 0x3f800000;
    auVar404._24_4_ = 0x3f800000;
    auVar404._28_4_ = 0x3f800000;
    auVar30 = vsubps_avx(auVar404,auVar338);
    fVar299 = auVar30._0_4_ * fVar299 + fVar299;
    fVar301 = auVar30._4_4_ * fVar301 + fVar301;
    fVar357 = auVar30._8_4_ * fVar357 + fVar357;
    fVar365 = auVar30._12_4_ * fVar365 + fVar365;
    fVar366 = auVar30._16_4_ * fVar366 + fVar366;
    fVar367 = auVar30._20_4_ * fVar367 + fVar367;
    fVar378 = auVar30._24_4_ * fVar378 + fVar378;
    auVar121 = vperm2f128_avx(auVar24,auVar24,1);
    auVar121 = vshufps_avx(auVar121,auVar24,0x30);
    local_800 = vshufps_avx(auVar24,auVar121,0x29);
    auVar121 = vperm2f128_avx(auVar31,auVar31,1);
    auVar121 = vshufps_avx(auVar121,auVar31,0x30);
    auVar26 = vshufps_avx(auVar31,auVar121,0x29);
    fVar398 = auVar26._0_4_;
    fVar410 = auVar26._4_4_;
    auVar25._4_4_ = fVar410 * fVar242;
    auVar25._0_4_ = fVar398 * fVar172;
    fVar414 = auVar26._8_4_;
    auVar25._8_4_ = fVar414 * fVar277;
    fVar417 = auVar26._12_4_;
    auVar25._12_4_ = fVar417 * fVar293;
    fVar420 = auVar26._16_4_;
    auVar25._16_4_ = fVar420 * fVar362;
    fVar423 = auVar26._20_4_;
    auVar25._20_4_ = fVar423 * fVar368;
    fVar425 = auVar26._24_4_;
    auVar25._24_4_ = fVar425 * fVar389;
    auVar25._28_4_ = auVar121._28_4_;
    fVar334 = local_800._0_4_;
    fVar345 = local_800._4_4_;
    auVar33._4_4_ = fVar345 * fVar257;
    auVar33._0_4_ = fVar334 * fVar174;
    fVar347 = local_800._8_4_;
    auVar33._8_4_ = fVar347 * fVar278;
    fVar349 = local_800._12_4_;
    auVar33._12_4_ = fVar349 * fVar295;
    fVar351 = local_800._16_4_;
    auVar33._16_4_ = fVar351 * fVar363;
    fVar353 = local_800._20_4_;
    auVar33._20_4_ = fVar353 * fVar372;
    fVar355 = local_800._24_4_;
    auVar33._24_4_ = fVar355 * fVar391;
    auVar33._28_4_ = -auVar235._28_4_;
    auVar31 = vsubps_avx(auVar33,auVar25);
    auVar121 = vperm2f128_avx(local_960,local_960,1);
    auVar121 = vshufps_avx(auVar121,local_960,0x30);
    auVar24 = vshufps_avx(local_960,auVar121,0x29);
    fVar304 = auVar24._0_4_;
    fVar316 = auVar24._4_4_;
    auVar34._4_4_ = fVar316 * fVar257;
    auVar34._0_4_ = fVar304 * fVar174;
    fVar318 = auVar24._8_4_;
    auVar34._8_4_ = fVar318 * fVar278;
    fVar321 = auVar24._12_4_;
    auVar34._12_4_ = fVar321 * fVar295;
    fVar324 = auVar24._16_4_;
    auVar34._16_4_ = fVar324 * fVar363;
    fVar327 = auVar24._20_4_;
    auVar34._20_4_ = fVar327 * fVar372;
    fVar330 = auVar24._24_4_;
    auVar34._24_4_ = fVar330 * fVar391;
    auVar34._28_4_ = auVar121._28_4_;
    auVar35._4_4_ = fVar410 * fVar258;
    auVar35._0_4_ = fVar398 * fVar226;
    auVar35._8_4_ = fVar414 * fVar260;
    auVar35._12_4_ = fVar417 * fVar297;
    auVar35._16_4_ = fVar420 * fVar364;
    auVar35._20_4_ = fVar423 * fVar377;
    uVar98 = auVar26._28_4_;
    auVar35._24_4_ = fVar425 * fVar393;
    auVar35._28_4_ = uVar98;
    auVar32 = vsubps_avx(auVar35,auVar34);
    auVar36._4_4_ = fVar345 * fVar258;
    auVar36._0_4_ = fVar334 * fVar226;
    auVar36._8_4_ = fVar347 * fVar260;
    auVar36._12_4_ = fVar349 * fVar297;
    auVar36._16_4_ = fVar351 * fVar364;
    auVar36._20_4_ = fVar353 * fVar377;
    auVar36._24_4_ = fVar355 * fVar393;
    auVar36._28_4_ = uVar98;
    auVar37._4_4_ = fVar242 * fVar316;
    auVar37._0_4_ = fVar172 * fVar304;
    auVar37._8_4_ = fVar277 * fVar318;
    auVar37._12_4_ = fVar293 * fVar321;
    auVar37._16_4_ = fVar362 * fVar324;
    auVar37._20_4_ = fVar368 * fVar327;
    auVar37._24_4_ = fVar389 * fVar330;
    auVar37._28_4_ = fStack_1a4;
    auVar121 = vsubps_avx(auVar37,auVar36);
    fVar136 = auVar121._28_4_;
    auVar38._4_4_ =
         (auVar360._4_4_ * auVar360._4_4_ +
         auVar29._4_4_ * auVar29._4_4_ + auVar361._4_4_ * auVar361._4_4_) * fVar301;
    auVar38._0_4_ =
         (auVar360._0_4_ * auVar360._0_4_ +
         auVar29._0_4_ * auVar29._0_4_ + auVar361._0_4_ * auVar361._0_4_) * fVar299;
    auVar38._8_4_ =
         (auVar360._8_4_ * auVar360._8_4_ +
         auVar29._8_4_ * auVar29._8_4_ + auVar361._8_4_ * auVar361._8_4_) * fVar357;
    auVar38._12_4_ =
         (auVar360._12_4_ * auVar360._12_4_ +
         auVar29._12_4_ * auVar29._12_4_ + auVar361._12_4_ * auVar361._12_4_) * fVar365;
    auVar38._16_4_ =
         (auVar360._16_4_ * auVar360._16_4_ +
         auVar29._16_4_ * auVar29._16_4_ + auVar361._16_4_ * auVar361._16_4_) * fVar366;
    auVar38._20_4_ =
         (auVar360._20_4_ * auVar360._20_4_ +
         auVar29._20_4_ * auVar29._20_4_ + auVar361._20_4_ * auVar361._20_4_) * fVar367;
    auVar38._24_4_ =
         (auVar360._24_4_ * auVar360._24_4_ +
         auVar29._24_4_ * auVar29._24_4_ + auVar361._24_4_ * auVar361._24_4_) * fVar378;
    auVar38._28_4_ = auVar360._28_4_ + fVar291;
    auVar39._4_4_ =
         (auVar31._4_4_ * auVar31._4_4_ +
         auVar32._4_4_ * auVar32._4_4_ + auVar121._4_4_ * auVar121._4_4_) * fVar301;
    auVar39._0_4_ =
         (auVar31._0_4_ * auVar31._0_4_ +
         auVar32._0_4_ * auVar32._0_4_ + auVar121._0_4_ * auVar121._0_4_) * fVar299;
    auVar39._8_4_ =
         (auVar31._8_4_ * auVar31._8_4_ +
         auVar32._8_4_ * auVar32._8_4_ + auVar121._8_4_ * auVar121._8_4_) * fVar357;
    auVar39._12_4_ =
         (auVar31._12_4_ * auVar31._12_4_ +
         auVar32._12_4_ * auVar32._12_4_ + auVar121._12_4_ * auVar121._12_4_) * fVar365;
    auVar39._16_4_ =
         (auVar31._16_4_ * auVar31._16_4_ +
         auVar32._16_4_ * auVar32._16_4_ + auVar121._16_4_ * auVar121._16_4_) * fVar366;
    auVar39._20_4_ =
         (auVar31._20_4_ * auVar31._20_4_ +
         auVar32._20_4_ * auVar32._20_4_ + auVar121._20_4_ * auVar121._20_4_) * fVar367;
    auVar39._24_4_ =
         (auVar31._24_4_ * auVar31._24_4_ +
         auVar32._24_4_ * auVar32._24_4_ + auVar121._24_4_ * auVar121._24_4_) * fVar378;
    auVar39._28_4_ = auVar30._28_4_ + auVar120._28_4_;
    auVar120 = vmaxps_avx(auVar38,auVar39);
    auVar121 = vperm2f128_avx(auVar286,auVar286,1);
    auVar121 = vshufps_avx(auVar121,auVar286,0x30);
    auVar24 = vshufps_avx(auVar286,auVar121,0x29);
    auVar156._0_4_ = auVar286._0_4_ + fVar239;
    auVar156._4_4_ = auVar286._4_4_ + fVar240;
    auVar156._8_4_ = auVar286._8_4_ + fVar241;
    auVar156._12_4_ = auVar286._12_4_ + fVar259;
    auVar156._16_4_ = auVar286._16_4_ + fVar262;
    auVar156._20_4_ = auVar286._20_4_ + fVar276;
    auVar156._24_4_ = auVar286._24_4_ + fVar261;
    auVar156._28_4_ = auVar286._28_4_ + fVar279;
    auVar121 = vmaxps_avx(auVar286,auVar156);
    auVar26 = vmaxps_avx(auVar23,auVar24);
    auVar121 = vmaxps_avx(auVar121,auVar26);
    auVar26 = vrsqrtps_avx(auVar236);
    fVar239 = auVar26._0_4_;
    fVar240 = auVar26._4_4_;
    fVar241 = auVar26._8_4_;
    fVar259 = auVar26._12_4_;
    fVar262 = auVar26._16_4_;
    fVar276 = auVar26._20_4_;
    fVar261 = auVar26._24_4_;
    auVar40._4_4_ = fVar240 * fVar240 * fVar240 * auVar236._4_4_ * 0.5;
    auVar40._0_4_ = fVar239 * fVar239 * fVar239 * auVar236._0_4_ * 0.5;
    auVar40._8_4_ = fVar241 * fVar241 * fVar241 * auVar236._8_4_ * 0.5;
    auVar40._12_4_ = fVar259 * fVar259 * fVar259 * auVar236._12_4_ * 0.5;
    auVar40._16_4_ = fVar262 * fVar262 * fVar262 * auVar236._16_4_ * 0.5;
    auVar40._20_4_ = fVar276 * fVar276 * fVar276 * auVar236._20_4_ * 0.5;
    auVar40._24_4_ = fVar261 * fVar261 * fVar261 * auVar236._24_4_ * 0.5;
    auVar40._28_4_ = auVar236._28_4_;
    auVar41._4_4_ = fVar240 * 1.5;
    auVar41._0_4_ = fVar239 * 1.5;
    auVar41._8_4_ = fVar241 * 1.5;
    auVar41._12_4_ = fVar259 * 1.5;
    auVar41._16_4_ = fVar262 * 1.5;
    auVar41._20_4_ = fVar276 * 1.5;
    auVar41._24_4_ = fVar261 * 1.5;
    auVar41._28_4_ = auVar26._28_4_;
    local_2a0 = vsubps_avx(auVar41,auVar40);
    auVar343 = ZEXT864(0) << 0x20;
    auVar83._4_4_ = fVar206;
    auVar83._0_4_ = fVar182;
    auVar83._8_4_ = fVar209;
    auVar83._12_4_ = fVar212;
    auVar83._16_4_ = fVar215;
    auVar83._20_4_ = fVar218;
    auVar83._24_4_ = fVar221;
    auVar83._28_4_ = fVar224;
    auVar360 = vsubps_avx(ZEXT832(0) << 0x20,auVar83);
    auVar85._4_4_ = fVar207;
    auVar85._0_4_ = fVar183;
    auVar85._8_4_ = fVar210;
    auVar85._12_4_ = fVar213;
    auVar85._16_4_ = fVar216;
    auVar85._20_4_ = fVar219;
    auVar85._24_4_ = fVar222;
    auVar85._28_4_ = fVar225;
    auVar29 = vsubps_avx(ZEXT832(0) << 0x20,auVar85);
    fVar239 = auVar29._0_4_;
    fVar259 = auVar29._4_4_;
    fVar261 = auVar29._8_4_;
    fVar299 = auVar29._12_4_;
    fVar365 = auVar29._16_4_;
    fVar378 = auVar29._20_4_;
    fVar395 = auVar29._24_4_;
    fVar240 = auVar360._0_4_;
    fVar262 = auVar360._4_4_;
    fVar279 = auVar360._8_4_;
    fVar301 = auVar360._12_4_;
    fVar366 = auVar360._16_4_;
    fVar385 = auVar360._20_4_;
    fVar397 = auVar360._24_4_;
    auVar338 = ZEXT832(0) << 0x20;
    auVar26 = vsubps_avx(auVar338,auVar86);
    fVar439 = auVar26._0_4_;
    fVar441 = auVar26._4_4_;
    fVar442 = auVar26._8_4_;
    fVar443 = auVar26._12_4_;
    fVar444 = auVar26._16_4_;
    fVar445 = auVar26._20_4_;
    fVar446 = auVar26._24_4_;
    auVar382._0_4_ =
         fVar439 * (float)local_840._0_4_ +
         (float)local_860._0_4_ * fVar240 + (float)local_880._0_4_ * fVar239;
    auVar382._4_4_ =
         fVar441 * (float)local_840._4_4_ +
         (float)local_860._4_4_ * fVar262 + (float)local_880._4_4_ * fVar259;
    auVar382._8_4_ = fVar442 * fStack_838 + fStack_858 * fVar279 + fStack_878 * fVar261;
    auVar382._12_4_ = fVar443 * fStack_834 + fStack_854 * fVar301 + fStack_874 * fVar299;
    auVar382._16_4_ = fVar444 * fStack_830 + fStack_850 * fVar366 + fStack_870 * fVar365;
    auVar382._20_4_ = fVar445 * fStack_82c + fStack_84c * fVar385 + fStack_86c * fVar378;
    auVar382._24_4_ = fVar446 * fStack_828 + fStack_848 * fVar397 + fStack_868 * fVar395;
    auVar382._28_4_ = fVar136 + fVar136 + auVar32._28_4_ + fVar136;
    auVar405._0_4_ = fVar439 * fVar439 + fVar240 * fVar240 + fVar239 * fVar239;
    auVar405._4_4_ = fVar441 * fVar441 + fVar262 * fVar262 + fVar259 * fVar259;
    auVar405._8_4_ = fVar442 * fVar442 + fVar279 * fVar279 + fVar261 * fVar261;
    auVar405._12_4_ = fVar443 * fVar443 + fVar301 * fVar301 + fVar299 * fVar299;
    auVar405._16_4_ = fVar444 * fVar444 + fVar366 * fVar366 + fVar365 * fVar365;
    auVar405._20_4_ = fVar445 * fVar445 + fVar385 * fVar385 + fVar378 * fVar378;
    auVar405._24_4_ = fVar446 * fVar446 + fVar397 * fVar397 + fVar395 * fVar395;
    auVar405._28_4_ = fStack_1a4 + fStack_1a4 + fVar136;
    fVar241 = local_2a0._0_4_;
    fVar276 = local_2a0._4_4_;
    fVar291 = local_2a0._8_4_;
    fVar357 = local_2a0._12_4_;
    fVar367 = local_2a0._16_4_;
    fVar387 = local_2a0._20_4_;
    fVar409 = local_2a0._24_4_;
    fVar413 = (float)local_840._0_4_ * fVar226 * fVar241 +
              fVar172 * fVar241 * (float)local_860._0_4_ +
              fVar241 * fVar174 * (float)local_880._0_4_;
    fVar416 = (float)local_840._4_4_ * fVar258 * fVar276 +
              fVar242 * fVar276 * (float)local_860._4_4_ +
              fVar276 * fVar257 * (float)local_880._4_4_;
    fVar419 = fStack_838 * fVar260 * fVar291 +
              fVar277 * fVar291 * fStack_858 + fVar291 * fVar278 * fStack_878;
    fVar422 = fStack_834 * fVar297 * fVar357 +
              fVar293 * fVar357 * fStack_854 + fVar357 * fVar295 * fStack_874;
    fVar424 = fStack_830 * fVar364 * fVar367 +
              fVar362 * fVar367 * fStack_850 + fVar367 * fVar363 * fStack_870;
    fVar133 = fStack_82c * fVar377 * fVar387 +
              fVar368 * fVar387 * fStack_84c + fVar387 * fVar372 * fStack_86c;
    fVar134 = fStack_828 * fVar393 * fVar409 +
              fVar389 * fVar409 * fStack_848 + fVar409 * fVar391 * fStack_868;
    fVar136 = fStack_824 + fStack_844 + fStack_864;
    fVar427 = fVar439 * fVar226 * fVar241 +
              fVar172 * fVar241 * fVar240 + fVar241 * fVar174 * fVar239;
    fVar432 = fVar441 * fVar258 * fVar276 +
              fVar242 * fVar276 * fVar262 + fVar276 * fVar257 * fVar259;
    fVar433 = fVar442 * fVar260 * fVar291 +
              fVar277 * fVar291 * fVar279 + fVar291 * fVar278 * fVar261;
    fVar434 = fVar443 * fVar297 * fVar357 +
              fVar293 * fVar357 * fVar301 + fVar357 * fVar295 * fVar299;
    fVar435 = fVar444 * fVar364 * fVar367 +
              fVar362 * fVar367 * fVar366 + fVar367 * fVar363 * fVar365;
    fVar436 = fVar445 * fVar377 * fVar387 +
              fVar368 * fVar387 * fVar385 + fVar387 * fVar372 * fVar378;
    fVar437 = fVar446 * fVar393 * fVar409 +
              fVar389 * fVar409 * fVar397 + fVar409 * fVar391 * fVar395;
    fVar438 = fStack_844 + fVar136;
    auVar42._4_4_ = fVar432 * fVar416;
    auVar42._0_4_ = fVar427 * fVar413;
    auVar42._8_4_ = fVar433 * fVar419;
    auVar42._12_4_ = fVar434 * fVar422;
    auVar42._16_4_ = fVar435 * fVar424;
    auVar42._20_4_ = fVar436 * fVar133;
    auVar42._24_4_ = fVar437 * fVar134;
    auVar42._28_4_ = fVar136;
    auVar361 = vsubps_avx(auVar382,auVar42);
    auVar43._4_4_ = fVar432 * fVar432;
    auVar43._0_4_ = fVar427 * fVar427;
    auVar43._8_4_ = fVar433 * fVar433;
    auVar43._12_4_ = fVar434 * fVar434;
    auVar43._16_4_ = fVar435 * fVar435;
    auVar43._20_4_ = fVar436 * fVar436;
    auVar43._24_4_ = fVar437 * fVar437;
    auVar43._28_4_ = fStack_844;
    auVar30 = vsubps_avx(auVar405,auVar43);
    auVar26 = vsqrtps_avx(auVar120);
    fVar136 = (auVar26._0_4_ + auVar121._0_4_) * 1.0000002;
    fVar173 = (auVar26._4_4_ + auVar121._4_4_) * 1.0000002;
    fVar175 = (auVar26._8_4_ + auVar121._8_4_) * 1.0000002;
    fVar177 = (auVar26._12_4_ + auVar121._12_4_) * 1.0000002;
    fVar178 = (auVar26._16_4_ + auVar121._16_4_) * 1.0000002;
    fVar179 = (auVar26._20_4_ + auVar121._20_4_) * 1.0000002;
    fVar180 = (auVar26._24_4_ + auVar121._24_4_) * 1.0000002;
    auVar44._4_4_ = fVar173 * fVar173;
    auVar44._0_4_ = fVar136 * fVar136;
    auVar44._8_4_ = fVar175 * fVar175;
    auVar44._12_4_ = fVar177 * fVar177;
    auVar44._16_4_ = fVar178 * fVar178;
    auVar44._20_4_ = fVar179 * fVar179;
    auVar44._24_4_ = fVar180 * fVar180;
    auVar44._28_4_ = auVar26._28_4_ + auVar121._28_4_;
    fVar399 = auVar361._0_4_ + auVar361._0_4_;
    fVar411 = auVar361._4_4_ + auVar361._4_4_;
    local_a20._0_8_ = CONCAT44(fVar411,fVar399);
    local_a20._8_4_ = auVar361._8_4_ + auVar361._8_4_;
    local_a20._12_4_ = auVar361._12_4_ + auVar361._12_4_;
    local_a20._16_4_ = auVar361._16_4_ + auVar361._16_4_;
    local_a20._20_4_ = auVar361._20_4_ + auVar361._20_4_;
    local_a20._24_4_ = auVar361._24_4_ + auVar361._24_4_;
    fVar136 = auVar361._28_4_;
    local_a20._28_4_ = fVar136 + fVar136;
    auVar361 = vsubps_avx(auVar30,auVar44);
    local_2c0._4_4_ = fVar416 * fVar416;
    local_2c0._0_4_ = fVar413 * fVar413;
    local_2c0._8_4_ = fVar419 * fVar419;
    local_2c0._12_4_ = fVar422 * fVar422;
    local_2c0._16_4_ = fVar424 * fVar424;
    local_2c0._20_4_ = fVar133 * fVar133;
    local_2c0._24_4_ = fVar134 * fVar134;
    local_2c0._28_4_ = local_2a0._28_4_;
    auVar31 = vsubps_avx(local_240,local_2c0);
    auVar375 = ZEXT3264(auVar31);
    auVar45._4_4_ = fVar411 * fVar411;
    auVar45._0_4_ = fVar399 * fVar399;
    auVar45._8_4_ = local_a20._8_4_ * local_a20._8_4_;
    auVar45._12_4_ = local_a20._12_4_ * local_a20._12_4_;
    auVar45._16_4_ = local_a20._16_4_ * local_a20._16_4_;
    auVar45._20_4_ = local_a20._20_4_ * local_a20._20_4_;
    auVar45._24_4_ = local_a20._24_4_ * local_a20._24_4_;
    auVar45._28_4_ = fVar136;
    fVar173 = auVar31._0_4_;
    fVar175 = auVar31._4_4_;
    fVar177 = auVar31._8_4_;
    fVar178 = auVar31._12_4_;
    fVar179 = auVar31._16_4_;
    fVar180 = auVar31._20_4_;
    fVar376 = auVar31._24_4_;
    auVar46._4_4_ = fVar175 * 4.0 * auVar361._4_4_;
    auVar46._0_4_ = fVar173 * 4.0 * auVar361._0_4_;
    auVar46._8_4_ = fVar177 * 4.0 * auVar361._8_4_;
    auVar46._12_4_ = fVar178 * 4.0 * auVar361._12_4_;
    auVar46._16_4_ = fVar179 * 4.0 * auVar361._16_4_;
    auVar46._20_4_ = fVar180 * 4.0 * auVar361._20_4_;
    auVar46._24_4_ = fVar376 * 4.0 * auVar361._24_4_;
    auVar46._28_4_ = 0x40800000;
    auVar121 = vsubps_avx(auVar45,auVar46);
    auVar120 = vcmpps_avx(auVar121,auVar338,5);
    fVar136 = auVar31._28_4_;
    if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar120 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar120 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar120 >> 0x7f,0) == '\0') &&
          (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar120 >> 0xbf,0) == '\0') &&
        (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar120[0x1f])
    {
      fStack_b98 = INFINITY;
      local_ba0 = (undefined1  [8])0x7f8000007f800000;
      fStack_b94 = INFINITY;
      fStack_b90 = INFINITY;
      fStack_b8c = INFINITY;
      fStack_b88 = INFINITY;
      fStack_b84 = INFINITY;
      auVar428._8_4_ = 0xff800000;
      auVar428._0_8_ = 0xff800000ff800000;
      auVar428._12_4_ = 0xff800000;
      auVar428._16_4_ = 0xff800000;
      auVar428._20_4_ = 0xff800000;
      auVar428._24_4_ = 0xff800000;
      auVar428._28_4_ = 0xff800000;
    }
    else {
      auVar25 = vsqrtps_avx(auVar121);
      auVar287._0_4_ = fVar173 + fVar173;
      auVar287._4_4_ = fVar175 + fVar175;
      auVar287._8_4_ = fVar177 + fVar177;
      auVar287._12_4_ = fVar178 + fVar178;
      auVar287._16_4_ = fVar179 + fVar179;
      auVar287._20_4_ = fVar180 + fVar180;
      auVar287._24_4_ = fVar376 + fVar376;
      auVar287._28_4_ = fVar136 + fVar136;
      auVar32 = vrcpps_avx(auVar287);
      auVar121 = vcmpps_avx(auVar121,auVar338,5);
      fVar280 = auVar32._0_4_;
      fVar292 = auVar32._4_4_;
      auVar47._4_4_ = auVar287._4_4_ * fVar292;
      auVar47._0_4_ = auVar287._0_4_ * fVar280;
      fVar294 = auVar32._8_4_;
      auVar47._8_4_ = auVar287._8_4_ * fVar294;
      fVar296 = auVar32._12_4_;
      auVar47._12_4_ = auVar287._12_4_ * fVar296;
      fVar298 = auVar32._16_4_;
      auVar47._16_4_ = auVar287._16_4_ * fVar298;
      fVar300 = auVar32._20_4_;
      auVar47._20_4_ = auVar287._20_4_ * fVar300;
      fVar302 = auVar32._24_4_;
      auVar47._24_4_ = auVar287._24_4_ * fVar302;
      auVar47._28_4_ = auVar287._28_4_;
      auVar122._8_4_ = 0x3f800000;
      auVar122._0_8_ = &DAT_3f8000003f800000;
      auVar122._12_4_ = 0x3f800000;
      auVar122._16_4_ = 0x3f800000;
      auVar122._20_4_ = 0x3f800000;
      auVar122._24_4_ = 0x3f800000;
      auVar122._28_4_ = 0x3f800000;
      auVar338 = vsubps_avx(auVar122,auVar47);
      fVar280 = fVar280 + fVar280 * auVar338._0_4_;
      fVar292 = fVar292 + fVar292 * auVar338._4_4_;
      fVar294 = fVar294 + fVar294 * auVar338._8_4_;
      fVar296 = fVar296 + fVar296 * auVar338._12_4_;
      fVar298 = fVar298 + fVar298 * auVar338._16_4_;
      fVar300 = fVar300 + fVar300 * auVar338._20_4_;
      fVar302 = fVar302 + fVar302 * auVar338._24_4_;
      auVar310._0_8_ = CONCAT44(fVar411,fVar399) ^ 0x8000000080000000;
      auVar310._8_4_ = -local_a20._8_4_;
      auVar310._12_4_ = -local_a20._12_4_;
      auVar310._16_4_ = -local_a20._16_4_;
      auVar310._20_4_ = -local_a20._20_4_;
      auVar310._24_4_ = -local_a20._24_4_;
      auVar310._28_4_ = -local_a20._28_4_;
      auVar33 = vsubps_avx(auVar310,auVar25);
      fVar399 = auVar33._0_4_ * fVar280;
      fVar411 = auVar33._4_4_ * fVar292;
      auVar48._4_4_ = fVar411;
      auVar48._0_4_ = fVar399;
      fVar319 = auVar33._8_4_ * fVar294;
      auVar48._8_4_ = fVar319;
      fVar322 = auVar33._12_4_ * fVar296;
      auVar48._12_4_ = fVar322;
      fVar325 = auVar33._16_4_ * fVar298;
      auVar48._16_4_ = fVar325;
      fVar328 = auVar33._20_4_ * fVar300;
      auVar48._20_4_ = fVar328;
      fVar331 = auVar33._24_4_ * fVar302;
      auVar48._24_4_ = fVar331;
      auVar48._28_4_ = auVar33._28_4_;
      auVar25 = vsubps_avx(auVar25,local_a20);
      fVar280 = auVar25._0_4_ * fVar280;
      fVar292 = auVar25._4_4_ * fVar292;
      auVar49._4_4_ = fVar292;
      auVar49._0_4_ = fVar280;
      fVar294 = auVar25._8_4_ * fVar294;
      auVar49._8_4_ = fVar294;
      fVar296 = auVar25._12_4_ * fVar296;
      auVar49._12_4_ = fVar296;
      fVar298 = auVar25._16_4_ * fVar298;
      auVar49._16_4_ = fVar298;
      fVar300 = auVar25._20_4_ * fVar300;
      auVar49._20_4_ = fVar300;
      fVar302 = auVar25._24_4_ * fVar302;
      auVar49._24_4_ = fVar302;
      auVar49._28_4_ = auVar25._28_4_;
      fStack_664 = fVar438 + auVar32._28_4_ + auVar338._28_4_;
      local_680[0] = fVar241 * (fVar427 + fVar413 * fVar399);
      local_680[1] = fVar276 * (fVar432 + fVar416 * fVar411);
      local_680[2] = fVar291 * (fVar433 + fVar419 * fVar319);
      local_680[3] = fVar357 * (fVar434 + fVar422 * fVar322);
      fStack_670 = fVar367 * (fVar435 + fVar424 * fVar325);
      fStack_66c = fVar387 * (fVar436 + fVar133 * fVar328);
      fStack_668 = fVar409 * (fVar437 + fVar134 * fVar331);
      local_6a0[0] = fVar241 * (fVar427 + fVar413 * fVar280);
      local_6a0[1] = fVar276 * (fVar432 + fVar416 * fVar292);
      local_6a0[2] = fVar291 * (fVar433 + fVar419 * fVar294);
      local_6a0[3] = fVar357 * (fVar434 + fVar422 * fVar296);
      fStack_690 = fVar367 * (fVar435 + fVar424 * fVar298);
      fStack_68c = fVar387 * (fVar436 + fVar133 * fVar300);
      fStack_688 = fVar409 * (fVar437 + fVar134 * fVar302);
      fStack_684 = fVar438 + fStack_664;
      auVar288._8_4_ = 0x7f800000;
      auVar288._0_8_ = 0x7f8000007f800000;
      auVar288._12_4_ = 0x7f800000;
      auVar288._16_4_ = 0x7f800000;
      auVar288._20_4_ = 0x7f800000;
      auVar288._24_4_ = 0x7f800000;
      auVar288._28_4_ = 0x7f800000;
      _local_ba0 = vblendvps_avx(auVar288,auVar48,auVar121);
      auVar311._8_4_ = 0x7fffffff;
      auVar311._0_8_ = 0x7fffffff7fffffff;
      auVar311._12_4_ = 0x7fffffff;
      auVar311._16_4_ = 0x7fffffff;
      auVar311._20_4_ = 0x7fffffff;
      auVar311._24_4_ = 0x7fffffff;
      auVar311._28_4_ = 0x7fffffff;
      auVar32 = vandps_avx(local_2c0,auVar311);
      auVar32 = vmaxps_avx(local_4c0,auVar32);
      auVar343 = ZEXT3264(CONCAT428(0x36000000,
                                    CONCAT424(0x36000000,
                                              CONCAT420(0x36000000,
                                                        CONCAT416(0x36000000,
                                                                  CONCAT412(0x36000000,
                                                                            CONCAT48(0x36000000,
                                                                                                                                                                          
                                                  0x3600000036000000)))))));
      auVar50._4_4_ = auVar32._4_4_ * 1.9073486e-06;
      auVar50._0_4_ = auVar32._0_4_ * 1.9073486e-06;
      auVar50._8_4_ = auVar32._8_4_ * 1.9073486e-06;
      auVar50._12_4_ = auVar32._12_4_ * 1.9073486e-06;
      auVar50._16_4_ = auVar32._16_4_ * 1.9073486e-06;
      auVar50._20_4_ = auVar32._20_4_ * 1.9073486e-06;
      auVar50._24_4_ = auVar32._24_4_ * 1.9073486e-06;
      auVar50._28_4_ = auVar32._28_4_;
      auVar32 = vandps_avx(auVar31,auVar311);
      auVar32 = vcmpps_avx(auVar32,auVar50,1);
      auVar289._8_4_ = 0xff800000;
      auVar289._0_8_ = 0xff800000ff800000;
      auVar289._12_4_ = 0xff800000;
      auVar289._16_4_ = 0xff800000;
      auVar289._20_4_ = 0xff800000;
      auVar289._24_4_ = 0xff800000;
      auVar289._28_4_ = 0xff800000;
      auVar428 = vblendvps_avx(auVar289,auVar49,auVar121);
      auVar338 = auVar121 & auVar32;
      if ((((((((auVar338 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar338 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar338 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar338 >> 0x7f,0) != '\0') ||
            (auVar338 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar338 >> 0xbf,0) != '\0') ||
          (auVar338 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar338[0x1f] < '\0') {
        auVar120 = vandps_avx(auVar32,auVar121);
        auVar147 = vpackssdw_avx(auVar120._0_16_,auVar120._16_16_);
        auVar76 = ZEXT812(0);
        auVar343 = ZEXT1264(auVar76) << 0x20;
        auVar32 = vcmpps_avx(auVar361,ZEXT1232(auVar76) << 0x20,2);
        auVar290._8_4_ = 0xff800000;
        auVar290._0_8_ = 0xff800000ff800000;
        auVar290._12_4_ = 0xff800000;
        auVar290._16_4_ = 0xff800000;
        auVar290._20_4_ = 0xff800000;
        auVar290._24_4_ = 0xff800000;
        auVar290._28_4_ = 0xff800000;
        auVar407._8_4_ = 0x7f800000;
        auVar407._0_8_ = 0x7f8000007f800000;
        auVar407._12_4_ = 0x7f800000;
        auVar407._16_4_ = 0x7f800000;
        auVar407._20_4_ = 0x7f800000;
        auVar407._24_4_ = 0x7f800000;
        auVar407._28_4_ = 0x7f800000;
        auVar361 = vblendvps_avx(auVar407,auVar290,auVar32);
        auVar230 = vpmovsxwd_avx(auVar147);
        auVar147 = vpunpckhwd_avx(auVar147,auVar147);
        auVar274._16_16_ = auVar147;
        auVar274._0_16_ = auVar230;
        _local_ba0 = vblendvps_avx(_local_ba0,auVar361,auVar274);
        auVar361 = vblendvps_avx(auVar290,auVar407,auVar32);
        auVar428 = vblendvps_avx(auVar428,auVar361,auVar274);
        auVar361 = vcmpps_avx(ZEXT1232(auVar76) << 0x20,ZEXT1232(auVar76) << 0x20,0xf);
        auVar170._0_4_ = auVar120._0_4_ ^ auVar361._0_4_;
        auVar170._4_4_ = auVar120._4_4_ ^ auVar361._4_4_;
        auVar170._8_4_ = auVar120._8_4_ ^ auVar361._8_4_;
        auVar170._12_4_ = auVar120._12_4_ ^ auVar361._12_4_;
        auVar170._16_4_ = auVar120._16_4_ ^ auVar361._16_4_;
        auVar170._20_4_ = auVar120._20_4_ ^ auVar361._20_4_;
        auVar170._24_4_ = auVar120._24_4_ ^ auVar361._24_4_;
        auVar170._28_4_ = auVar120._28_4_ ^ auVar361._28_4_;
        auVar120 = vorps_avx(auVar32,auVar170);
        auVar120 = vandps_avx(auVar121,auVar120);
      }
    }
    auVar371 = ZEXT3264(local_2c0);
    auVar408 = ZEXT3264(local_a20);
    auVar384 = ZEXT3264(auVar121);
    auVar121 = local_260 & auVar120;
    fVar399 = (float)local_8c0._0_4_;
    fVar411 = (float)local_8c0._4_4_;
    fVar280 = fStack_8b8;
    fVar292 = fStack_8b4;
    fVar294 = fStack_8b0;
    fVar296 = fStack_8ac;
    fVar298 = fStack_8a8;
    fVar300 = fStack_8a4;
    if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar121 >> 0x7f,0) == '\0') &&
          (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar121 >> 0xbf,0) == '\0') &&
        (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar121[0x1f])
    {
      auVar314 = ZEXT864(0) << 0x20;
    }
    else {
      auVar147 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_940._0_4_
                                           )),
                             ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_940._0_4_
                                           )),0);
      auVar197._16_16_ = auVar147;
      auVar197._0_16_ = auVar147;
      auVar361 = vminps_avx(auVar197,auVar428);
      fVar51 = auVar29._28_4_;
      auVar123._0_4_ =
           (float)local_840._0_4_ * fVar303 +
           (float)local_860._0_4_ * fVar333 + (float)local_880._0_4_ * fVar379;
      auVar123._4_4_ =
           (float)local_840._4_4_ * fVar315 +
           (float)local_860._4_4_ * fVar344 + (float)local_880._4_4_ * fVar386;
      auVar123._8_4_ = fStack_838 * fVar317 + fStack_858 * fVar346 + fStack_878 * fVar388;
      auVar123._12_4_ = fStack_834 * fVar320 + fStack_854 * fVar348 + fStack_874 * fVar390;
      auVar123._16_4_ = fStack_830 * fVar323 + fStack_850 * fVar350 + fStack_870 * fVar392;
      auVar123._20_4_ = fStack_82c * fVar326 + fStack_84c * fVar352 + fStack_86c * fVar394;
      auVar123._24_4_ = fStack_828 * fVar329 + fStack_848 * fVar354 + fStack_868 * fVar396;
      auVar123._28_4_ = fVar332 + fVar356 + fVar51;
      auVar121 = vrcpps_avx(auVar123);
      fVar332 = auVar121._0_4_;
      fVar302 = auVar121._4_4_;
      auVar52._4_4_ = auVar123._4_4_ * fVar302;
      auVar52._0_4_ = auVar123._0_4_ * fVar332;
      fVar319 = auVar121._8_4_;
      auVar52._8_4_ = auVar123._8_4_ * fVar319;
      fVar322 = auVar121._12_4_;
      auVar52._12_4_ = auVar123._12_4_ * fVar322;
      fVar325 = auVar121._16_4_;
      auVar52._16_4_ = auVar123._16_4_ * fVar325;
      fVar328 = auVar121._20_4_;
      auVar52._20_4_ = auVar123._20_4_ * fVar328;
      fVar331 = auVar121._24_4_;
      auVar52._24_4_ = auVar123._24_4_ * fVar331;
      auVar52._28_4_ = fVar356;
      auVar359._8_4_ = 0x3f800000;
      auVar359._0_8_ = &DAT_3f8000003f800000;
      auVar359._12_4_ = 0x3f800000;
      auVar359._16_4_ = 0x3f800000;
      auVar359._20_4_ = 0x3f800000;
      auVar359._24_4_ = 0x3f800000;
      auVar359._28_4_ = 0x3f800000;
      auVar32 = vsubps_avx(auVar359,auVar52);
      auVar339._8_4_ = 0x7fffffff;
      auVar339._0_8_ = 0x7fffffff7fffffff;
      auVar339._12_4_ = 0x7fffffff;
      auVar339._16_4_ = 0x7fffffff;
      auVar339._20_4_ = 0x7fffffff;
      auVar339._24_4_ = 0x7fffffff;
      auVar339._28_4_ = 0x7fffffff;
      auVar121 = vandps_avx(auVar339,auVar123);
      auVar429._8_4_ = 0x219392ef;
      auVar429._0_8_ = 0x219392ef219392ef;
      auVar429._12_4_ = 0x219392ef;
      auVar429._16_4_ = 0x219392ef;
      auVar429._20_4_ = 0x219392ef;
      auVar429._24_4_ = 0x219392ef;
      auVar429._28_4_ = 0x219392ef;
      auVar29 = vcmpps_avx(auVar121,auVar429,1);
      auVar375 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar53._4_4_ =
           (fVar302 + fVar302 * auVar32._4_4_) *
           -(fVar441 * fVar315 + fVar344 * fVar262 + fVar386 * fVar259);
      auVar53._0_4_ =
           (fVar332 + fVar332 * auVar32._0_4_) *
           -(fVar439 * fVar303 + fVar333 * fVar240 + fVar379 * fVar239);
      auVar53._8_4_ =
           (fVar319 + fVar319 * auVar32._8_4_) *
           -(fVar442 * fVar317 + fVar346 * fVar279 + fVar388 * fVar261);
      auVar53._12_4_ =
           (fVar322 + fVar322 * auVar32._12_4_) *
           -(fVar443 * fVar320 + fVar348 * fVar301 + fVar390 * fVar299);
      auVar53._16_4_ =
           (fVar325 + fVar325 * auVar32._16_4_) *
           -(fVar444 * fVar323 + fVar350 * fVar366 + fVar392 * fVar365);
      auVar53._20_4_ =
           (fVar328 + fVar328 * auVar32._20_4_) *
           -(fVar445 * fVar326 + fVar352 * fVar385 + fVar394 * fVar378);
      auVar53._24_4_ =
           (fVar331 + fVar331 * auVar32._24_4_) *
           -(fVar446 * fVar329 + fVar354 * fVar397 + fVar396 * fVar395);
      auVar53._28_4_ = -(fVar51 + auVar360._28_4_ + fVar51);
      auVar360 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar121 = vcmpps_avx(auVar123,auVar360,1);
      auVar121 = vorps_avx(auVar29,auVar121);
      auVar383._8_4_ = 0xff800000;
      auVar383._0_8_ = 0xff800000ff800000;
      auVar383._12_4_ = 0xff800000;
      auVar383._16_4_ = 0xff800000;
      auVar383._20_4_ = 0xff800000;
      auVar383._24_4_ = 0xff800000;
      auVar383._28_4_ = 0xff800000;
      auVar384 = ZEXT3264(auVar383);
      auVar121 = vblendvps_avx(auVar53,auVar383,auVar121);
      auVar360 = vcmpps_avx(auVar123,auVar360,6);
      auVar360 = vorps_avx(auVar29,auVar360);
      auVar406._8_4_ = 0x7f800000;
      auVar406._0_8_ = 0x7f8000007f800000;
      auVar406._12_4_ = 0x7f800000;
      auVar406._16_4_ = 0x7f800000;
      auVar406._20_4_ = 0x7f800000;
      auVar406._24_4_ = 0x7f800000;
      auVar406._28_4_ = 0x7f800000;
      auVar408 = ZEXT3264(auVar406);
      auVar360 = vblendvps_avx(auVar53,auVar406,auVar360);
      auVar29 = vmaxps_avx(local_280,_local_ba0);
      auVar29 = vmaxps_avx(auVar29,auVar121);
      auVar360 = vminps_avx(auVar361,auVar360);
      auVar361 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar121 = vsubps_avx(auVar361,auVar21);
      auVar21 = vsubps_avx(auVar361,auVar22);
      auVar54._4_4_ = auVar21._4_4_ * -fVar410;
      auVar54._0_4_ = auVar21._0_4_ * -fVar398;
      auVar54._8_4_ = auVar21._8_4_ * -fVar414;
      auVar54._12_4_ = auVar21._12_4_ * -fVar417;
      auVar54._16_4_ = auVar21._16_4_ * -fVar420;
      auVar54._20_4_ = auVar21._20_4_ * -fVar423;
      auVar54._24_4_ = auVar21._24_4_ * -fVar425;
      auVar54._28_4_ = auVar21._28_4_;
      auVar55._4_4_ = fVar345 * auVar121._4_4_;
      auVar55._0_4_ = fVar334 * auVar121._0_4_;
      auVar55._8_4_ = fVar347 * auVar121._8_4_;
      auVar55._12_4_ = fVar349 * auVar121._12_4_;
      auVar55._16_4_ = fVar351 * auVar121._16_4_;
      auVar55._20_4_ = fVar353 * auVar121._20_4_;
      auVar55._24_4_ = fVar355 * auVar121._24_4_;
      auVar55._28_4_ = auVar121._28_4_;
      auVar121 = vsubps_avx(auVar54,auVar55);
      auVar21 = vsubps_avx(auVar361,auVar27);
      auVar56._4_4_ = fVar316 * auVar21._4_4_;
      auVar56._0_4_ = fVar304 * auVar21._0_4_;
      auVar56._8_4_ = fVar318 * auVar21._8_4_;
      auVar56._12_4_ = fVar321 * auVar21._12_4_;
      auVar56._16_4_ = fVar324 * auVar21._16_4_;
      auVar56._20_4_ = fVar327 * auVar21._20_4_;
      uVar8 = auVar21._28_4_;
      auVar56._24_4_ = fVar330 * auVar21._24_4_;
      auVar56._28_4_ = uVar8;
      auVar22 = vsubps_avx(auVar121,auVar56);
      auVar57._4_4_ = (float)local_880._4_4_ * -fVar410;
      auVar57._0_4_ = (float)local_880._0_4_ * -fVar398;
      auVar57._8_4_ = fStack_878 * -fVar414;
      auVar57._12_4_ = fStack_874 * -fVar417;
      auVar57._16_4_ = fStack_870 * -fVar420;
      auVar57._20_4_ = fStack_86c * -fVar423;
      auVar57._24_4_ = fStack_868 * -fVar425;
      auVar57._28_4_ = uVar98 ^ 0x80000000;
      auVar371 = ZEXT864(0) << 0x20;
      auVar58._4_4_ = (float)local_860._4_4_ * fVar345;
      auVar58._0_4_ = (float)local_860._0_4_ * fVar334;
      auVar58._8_4_ = fStack_858 * fVar347;
      auVar58._12_4_ = fStack_854 * fVar349;
      auVar58._16_4_ = fStack_850 * fVar351;
      auVar58._20_4_ = fStack_84c * fVar353;
      auVar58._24_4_ = fStack_848 * fVar355;
      auVar58._28_4_ = uVar8;
      auVar430._8_4_ = 0x3f800000;
      auVar430._0_8_ = &DAT_3f8000003f800000;
      auVar430._12_4_ = 0x3f800000;
      auVar430._16_4_ = 0x3f800000;
      auVar430._20_4_ = 0x3f800000;
      auVar430._24_4_ = 0x3f800000;
      auVar430._28_4_ = 0x3f800000;
      auVar121 = vsubps_avx(auVar57,auVar58);
      auVar59._4_4_ = fVar316 * (float)local_840._4_4_;
      auVar59._0_4_ = fVar304 * (float)local_840._0_4_;
      auVar59._8_4_ = fVar318 * fStack_838;
      auVar59._12_4_ = fVar321 * fStack_834;
      auVar59._16_4_ = fVar324 * fStack_830;
      auVar59._20_4_ = fVar327 * fStack_82c;
      auVar59._24_4_ = fVar330 * fStack_828;
      auVar59._28_4_ = uVar8;
      auVar27 = vsubps_avx(auVar121,auVar59);
      auVar121 = vrcpps_avx(auVar27);
      fVar239 = auVar121._0_4_;
      fVar240 = auVar121._4_4_;
      auVar60._4_4_ = auVar27._4_4_ * fVar240;
      auVar60._0_4_ = auVar27._0_4_ * fVar239;
      fVar259 = auVar121._8_4_;
      auVar60._8_4_ = auVar27._8_4_ * fVar259;
      fVar262 = auVar121._12_4_;
      auVar60._12_4_ = auVar27._12_4_ * fVar262;
      fVar261 = auVar121._16_4_;
      auVar60._16_4_ = auVar27._16_4_ * fVar261;
      fVar279 = auVar121._20_4_;
      auVar60._20_4_ = auVar27._20_4_ * fVar279;
      fVar299 = auVar121._24_4_;
      auVar60._24_4_ = auVar27._24_4_ * fVar299;
      auVar60._28_4_ = fStack_824;
      auVar361 = vsubps_avx(auVar430,auVar60);
      auVar121 = vandps_avx(auVar339,auVar27);
      auVar340._8_4_ = 0x219392ef;
      auVar340._0_8_ = 0x219392ef219392ef;
      auVar340._12_4_ = 0x219392ef;
      auVar340._16_4_ = 0x219392ef;
      auVar340._20_4_ = 0x219392ef;
      auVar340._24_4_ = 0x219392ef;
      auVar340._28_4_ = 0x219392ef;
      auVar343 = ZEXT3264(auVar340);
      auVar21 = vcmpps_avx(auVar121,auVar340,1);
      auVar61._4_4_ = (fVar240 + fVar240 * auVar361._4_4_) * -auVar22._4_4_;
      auVar61._0_4_ = (fVar239 + fVar239 * auVar361._0_4_) * -auVar22._0_4_;
      auVar61._8_4_ = (fVar259 + fVar259 * auVar361._8_4_) * -auVar22._8_4_;
      auVar61._12_4_ = (fVar262 + fVar262 * auVar361._12_4_) * -auVar22._12_4_;
      auVar61._16_4_ = (fVar261 + fVar261 * auVar361._16_4_) * -auVar22._16_4_;
      auVar61._20_4_ = (fVar279 + fVar279 * auVar361._20_4_) * -auVar22._20_4_;
      auVar61._24_4_ = (fVar299 + fVar299 * auVar361._24_4_) * -auVar22._24_4_;
      auVar61._28_4_ = auVar22._28_4_ ^ 0x80000000;
      auVar121 = vcmpps_avx(auVar27,ZEXT832(0) << 0x20,1);
      auVar121 = vorps_avx(auVar21,auVar121);
      auVar121 = vblendvps_avx(auVar61,auVar383,auVar121);
      local_4e0 = vmaxps_avx(auVar29,auVar121);
      auVar121 = vcmpps_avx(auVar27,ZEXT832(0) << 0x20,6);
      auVar121 = vorps_avx(auVar21,auVar121);
      auVar121 = vblendvps_avx(auVar61,auVar406,auVar121);
      auVar120 = vandps_avx(auVar120,local_260);
      local_2e0 = vminps_avx(auVar360,auVar121);
      auVar121 = vcmpps_avx(local_4e0,local_2e0,2);
      auVar21 = auVar120 & auVar121;
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar21 >> 0x7f,0) != '\0') ||
            (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0xbf,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar21[0x1f] < '\0') {
        auVar21 = vminps_avx(auVar286,auVar156);
        auVar22 = vminps_avx(auVar23,auVar24);
        auVar21 = vminps_avx(auVar21,auVar22);
        auVar26 = vsubps_avx(auVar21,auVar26);
        auVar120 = vandps_avx(auVar121,auVar120);
        auVar96._4_4_ = local_680[1];
        auVar96._0_4_ = local_680[0];
        auVar96._8_4_ = local_680[2];
        auVar96._12_4_ = local_680[3];
        auVar96._16_4_ = fStack_670;
        auVar96._20_4_ = fStack_66c;
        auVar96._24_4_ = fStack_668;
        auVar96._28_4_ = fStack_664;
        auVar121 = vminps_avx(auVar96,auVar430);
        auVar121 = vmaxps_avx(auVar121,ZEXT832(0) << 0x20);
        local_680[0] = fVar400 + fVar418 * (auVar121._0_4_ + 0.0) * 0.125;
        local_680[1] = fVar412 + fVar421 * (auVar121._4_4_ + 1.0) * 0.125;
        local_680[2] = fVar415 + fVar426 * (auVar121._8_4_ + 2.0) * 0.125;
        local_680[3] = fStack_be4 + fVar176 * (auVar121._12_4_ + 3.0) * 0.125;
        fStack_670 = fVar400 + fVar418 * (auVar121._16_4_ + 4.0) * 0.125;
        fStack_66c = fVar412 + fVar421 * (auVar121._20_4_ + 5.0) * 0.125;
        fStack_668 = fVar415 + fVar426 * (auVar121._24_4_ + 6.0) * 0.125;
        fStack_664 = fStack_be4 + auVar121._28_4_ + 7.0;
        auVar95._4_4_ = local_6a0[1];
        auVar95._0_4_ = local_6a0[0];
        auVar95._8_4_ = local_6a0[2];
        auVar95._12_4_ = local_6a0[3];
        auVar95._16_4_ = fStack_690;
        auVar95._20_4_ = fStack_68c;
        auVar95._24_4_ = fStack_688;
        auVar95._28_4_ = fStack_684;
        auVar121 = vminps_avx(auVar95,auVar430);
        auVar121 = vmaxps_avx(auVar121,ZEXT832(0) << 0x20);
        local_6a0[0] = fVar400 + fVar418 * (auVar121._0_4_ + 0.0) * 0.125;
        local_6a0[1] = fVar412 + fVar421 * (auVar121._4_4_ + 1.0) * 0.125;
        local_6a0[2] = fVar415 + fVar426 * (auVar121._8_4_ + 2.0) * 0.125;
        local_6a0[3] = fStack_be4 + fVar176 * (auVar121._12_4_ + 3.0) * 0.125;
        fStack_690 = fVar400 + fVar418 * (auVar121._16_4_ + 4.0) * 0.125;
        fStack_68c = fVar412 + fVar421 * (auVar121._20_4_ + 5.0) * 0.125;
        fStack_688 = fVar415 + fVar426 * (auVar121._24_4_ + 6.0) * 0.125;
        fStack_684 = fStack_be4 + auVar121._28_4_ + 7.0;
        auVar62._4_4_ = auVar26._4_4_ * 0.99999976;
        auVar62._0_4_ = auVar26._0_4_ * 0.99999976;
        auVar62._8_4_ = auVar26._8_4_ * 0.99999976;
        auVar62._12_4_ = auVar26._12_4_ * 0.99999976;
        auVar62._16_4_ = auVar26._16_4_ * 0.99999976;
        auVar62._20_4_ = auVar26._20_4_ * 0.99999976;
        auVar62._24_4_ = auVar26._24_4_ * 0.99999976;
        auVar62._28_4_ = 0x3f7ffffc;
        auVar121 = vmaxps_avx(ZEXT832(0) << 0x20,auVar62);
        auVar63._4_4_ = auVar121._4_4_ * auVar121._4_4_;
        auVar63._0_4_ = auVar121._0_4_ * auVar121._0_4_;
        auVar63._8_4_ = auVar121._8_4_ * auVar121._8_4_;
        auVar63._12_4_ = auVar121._12_4_ * auVar121._12_4_;
        auVar63._16_4_ = auVar121._16_4_ * auVar121._16_4_;
        auVar63._20_4_ = auVar121._20_4_ * auVar121._20_4_;
        auVar63._24_4_ = auVar121._24_4_ * auVar121._24_4_;
        auVar63._28_4_ = auVar121._28_4_;
        auVar26 = vsubps_avx(auVar30,auVar63);
        auVar64._4_4_ = auVar26._4_4_ * fVar175 * 4.0;
        auVar64._0_4_ = auVar26._0_4_ * fVar173 * 4.0;
        auVar64._8_4_ = auVar26._8_4_ * fVar177 * 4.0;
        auVar64._12_4_ = auVar26._12_4_ * fVar178 * 4.0;
        auVar64._16_4_ = auVar26._16_4_ * fVar179 * 4.0;
        auVar64._20_4_ = auVar26._20_4_ * fVar180 * 4.0;
        auVar64._24_4_ = auVar26._24_4_ * fVar376 * 4.0;
        auVar64._28_4_ = auVar121._28_4_;
        auVar21 = vsubps_avx(auVar45,auVar64);
        auVar121 = vcmpps_avx(auVar21,ZEXT832(0) << 0x20,5);
        if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar121 >> 0x7f,0) == '\0') &&
              (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar121 >> 0xbf,0) == '\0') &&
            (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar121[0x1f]) {
          _local_900 = ZEXT832(0) << 0x20;
          _local_920 = ZEXT832(0) << 0x20;
          local_ba0._0_4_ = 0.0;
          local_ba0._4_4_ = 0.0;
          fStack_b98 = 0.0;
          fStack_b94 = 0.0;
          fStack_b90 = 0.0;
          fStack_b8c = 0.0;
          fStack_b88 = 0.0;
          fStack_b84 = 0.0;
          auVar253 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar198._8_4_ = 0x7f800000;
          auVar198._0_8_ = 0x7f8000007f800000;
          auVar198._12_4_ = 0x7f800000;
          auVar198._16_4_ = 0x7f800000;
          auVar198._20_4_ = 0x7f800000;
          auVar198._24_4_ = 0x7f800000;
          auVar198._28_4_ = 0x7f800000;
          auVar268._8_4_ = 0xff800000;
          auVar268._0_8_ = 0xff800000ff800000;
          auVar268._12_4_ = 0xff800000;
          auVar268._16_4_ = 0xff800000;
          auVar268._20_4_ = 0xff800000;
          auVar268._24_4_ = 0xff800000;
          auVar268._28_4_ = 0xff800000;
          _local_8e0 = _local_900;
        }
        else {
          auVar23 = vsqrtps_avx(auVar21);
          auVar254._0_4_ = fVar173 + fVar173;
          auVar254._4_4_ = fVar175 + fVar175;
          auVar254._8_4_ = fVar177 + fVar177;
          auVar254._12_4_ = fVar178 + fVar178;
          auVar254._16_4_ = fVar179 + fVar179;
          auVar254._20_4_ = fVar180 + fVar180;
          auVar254._24_4_ = fVar376 + fVar376;
          auVar254._28_4_ = fVar136 + fVar136;
          auVar22 = vrcpps_avx(auVar254);
          fVar136 = auVar22._0_4_;
          fVar239 = auVar22._4_4_;
          auVar65._4_4_ = auVar254._4_4_ * fVar239;
          auVar65._0_4_ = auVar254._0_4_ * fVar136;
          fVar240 = auVar22._8_4_;
          auVar65._8_4_ = auVar254._8_4_ * fVar240;
          fVar259 = auVar22._12_4_;
          auVar65._12_4_ = auVar254._12_4_ * fVar259;
          fVar262 = auVar22._16_4_;
          auVar65._16_4_ = auVar254._16_4_ * fVar262;
          fVar261 = auVar22._20_4_;
          auVar65._20_4_ = auVar254._20_4_ * fVar261;
          fVar279 = auVar22._24_4_;
          auVar65._24_4_ = auVar254._24_4_ * fVar279;
          auVar65._28_4_ = auVar254._28_4_;
          auVar27 = vsubps_avx(auVar430,auVar65);
          fVar136 = fVar136 + fVar136 * auVar27._0_4_;
          fVar239 = fVar239 + fVar239 * auVar27._4_4_;
          fVar240 = fVar240 + fVar240 * auVar27._8_4_;
          fVar259 = fVar259 + fVar259 * auVar27._12_4_;
          fVar262 = fVar262 + fVar262 * auVar27._16_4_;
          fVar261 = fVar261 + fVar261 * auVar27._20_4_;
          fVar279 = fVar279 + fVar279 * auVar27._24_4_;
          fVar299 = auVar22._28_4_ + auVar27._28_4_;
          auVar269._0_8_ = local_a20._0_8_ ^ 0x8000000080000000;
          auVar269._8_4_ = -local_a20._8_4_;
          auVar269._12_4_ = -local_a20._12_4_;
          auVar269._16_4_ = -local_a20._16_4_;
          auVar269._20_4_ = -local_a20._20_4_;
          auVar269._24_4_ = -local_a20._24_4_;
          auVar269._28_4_ = -local_a20._28_4_;
          auVar22 = vsubps_avx(auVar269,auVar23);
          fVar400 = auVar22._0_4_ * fVar136;
          fVar412 = auVar22._4_4_ * fVar239;
          auVar66._4_4_ = fVar412;
          auVar66._0_4_ = fVar400;
          fVar415 = auVar22._8_4_ * fVar240;
          auVar66._8_4_ = fVar415;
          fVar418 = auVar22._12_4_ * fVar259;
          auVar66._12_4_ = fVar418;
          fVar421 = auVar22._16_4_ * fVar262;
          auVar66._16_4_ = fVar421;
          fVar173 = auVar22._20_4_ * fVar261;
          auVar66._20_4_ = fVar173;
          fVar426 = auVar22._24_4_ * fVar279;
          auVar66._24_4_ = fVar426;
          auVar66._28_4_ = 0x7f800000;
          auVar408 = ZEXT3264(auVar66);
          auVar23 = vsubps_avx(auVar23,local_a20);
          fVar136 = auVar23._0_4_ * fVar136;
          fVar239 = auVar23._4_4_ * fVar239;
          auVar67._4_4_ = fVar239;
          auVar67._0_4_ = fVar136;
          fVar240 = auVar23._8_4_ * fVar240;
          auVar67._8_4_ = fVar240;
          fVar259 = auVar23._12_4_ * fVar259;
          auVar67._12_4_ = fVar259;
          fVar262 = auVar23._16_4_ * fVar262;
          auVar67._16_4_ = fVar262;
          fVar261 = auVar23._20_4_ * fVar261;
          auVar67._20_4_ = fVar261;
          fVar279 = auVar23._24_4_ * fVar279;
          auVar67._24_4_ = fVar279;
          auVar67._28_4_ = 0xff800000;
          auVar384 = ZEXT3264(auVar67);
          fVar301 = fVar241 * (fVar400 * fVar413 + fVar427);
          fVar365 = fVar276 * (fVar412 * fVar416 + fVar432);
          fVar366 = fVar291 * (fVar415 * fVar419 + fVar433);
          fVar378 = fVar357 * (fVar418 * fVar422 + fVar434);
          fVar385 = fVar367 * (fVar421 * fVar424 + fVar435);
          fVar395 = fVar387 * (fVar173 * fVar133 + fVar436);
          fVar397 = fVar409 * (fVar426 * fVar134 + fVar437);
          auVar237._0_4_ = fVar181 + fVar226 * fVar301;
          auVar237._4_4_ = fVar205 + fVar258 * fVar365;
          auVar237._8_4_ = fVar208 + fVar260 * fVar366;
          auVar237._12_4_ = fVar211 + fVar297 * fVar378;
          auVar237._16_4_ = fVar214 + fVar364 * fVar385;
          auVar237._20_4_ = fVar217 + fVar377 * fVar395;
          auVar237._24_4_ = fVar220 + fVar393 * fVar397;
          auVar237._28_4_ = fVar223 + auVar23._28_4_ + fVar438;
          auVar68._4_4_ = (float)local_840._4_4_ * fVar412;
          auVar68._0_4_ = (float)local_840._0_4_ * fVar400;
          auVar68._8_4_ = fStack_838 * fVar415;
          auVar68._12_4_ = fStack_834 * fVar418;
          auVar68._16_4_ = fStack_830 * fVar421;
          auVar68._20_4_ = fStack_82c * fVar173;
          auVar68._24_4_ = fStack_828 * fVar426;
          auVar68._28_4_ = fVar299;
          auVar27 = vsubps_avx(auVar68,auVar237);
          auVar255._0_4_ = fVar182 + fVar172 * fVar301;
          auVar255._4_4_ = fVar206 + fVar242 * fVar365;
          auVar255._8_4_ = fVar209 + fVar277 * fVar366;
          auVar255._12_4_ = fVar212 + fVar293 * fVar378;
          auVar255._16_4_ = fVar215 + fVar362 * fVar385;
          auVar255._20_4_ = fVar218 + fVar368 * fVar395;
          auVar255._24_4_ = fVar221 + fVar389 * fVar397;
          auVar255._28_4_ = fVar224 + fVar299;
          auVar69._4_4_ = (float)local_860._4_4_ * fVar412;
          auVar69._0_4_ = (float)local_860._0_4_ * fVar400;
          auVar69._8_4_ = fStack_858 * fVar415;
          auVar69._12_4_ = fStack_854 * fVar418;
          auVar69._16_4_ = fStack_850 * fVar421;
          auVar69._20_4_ = fStack_84c * fVar173;
          auVar69._24_4_ = fStack_848 * fVar426;
          auVar69._28_4_ = fStack_be4;
          auVar24 = vsubps_avx(auVar69,auVar255);
          auVar270._0_4_ = fVar183 + fVar174 * fVar301;
          auVar270._4_4_ = fVar207 + fVar257 * fVar365;
          auVar270._8_4_ = fVar210 + fVar278 * fVar366;
          auVar270._12_4_ = fVar213 + fVar295 * fVar378;
          auVar270._16_4_ = fVar216 + fVar363 * fVar385;
          auVar270._20_4_ = fVar219 + fVar372 * fVar395;
          auVar270._24_4_ = fVar222 + fVar391 * fVar397;
          auVar270._28_4_ = fVar225 + auVar22._28_4_;
          auVar70._4_4_ = (float)local_880._4_4_ * fVar412;
          auVar70._0_4_ = (float)local_880._0_4_ * fVar400;
          auVar70._8_4_ = fStack_878 * fVar415;
          auVar70._12_4_ = fStack_874 * fVar418;
          auVar70._16_4_ = fStack_870 * fVar421;
          auVar70._20_4_ = fStack_86c * fVar173;
          auVar70._24_4_ = fStack_868 * fVar426;
          auVar70._28_4_ = fStack_be4;
          auVar360 = vsubps_avx(auVar70,auVar270);
          fVar241 = fVar241 * (fVar136 * fVar413 + fVar427);
          fVar276 = fVar276 * (fVar239 * fVar416 + fVar432);
          fVar291 = fVar291 * (fVar240 * fVar419 + fVar433);
          fVar357 = fVar357 * (fVar259 * fVar422 + fVar434);
          fVar367 = fVar367 * (fVar262 * fVar424 + fVar435);
          fVar387 = fVar387 * (fVar261 * fVar133 + fVar436);
          fVar409 = fVar409 * (fVar279 * fVar134 + fVar437);
          auVar312._0_4_ = fVar181 + fVar226 * fVar241;
          auVar312._4_4_ = fVar205 + fVar258 * fVar276;
          auVar312._8_4_ = fVar208 + fVar260 * fVar291;
          auVar312._12_4_ = fVar211 + fVar297 * fVar357;
          auVar312._16_4_ = fVar214 + fVar364 * fVar367;
          auVar312._20_4_ = fVar217 + fVar377 * fVar387;
          auVar312._24_4_ = fVar220 + fVar393 * fVar409;
          auVar312._28_4_ = fVar223 + fStack_be4;
          auVar71._4_4_ = (float)local_840._4_4_ * fVar239;
          auVar71._0_4_ = (float)local_840._0_4_ * fVar136;
          auVar71._8_4_ = fStack_838 * fVar240;
          auVar71._12_4_ = fStack_834 * fVar259;
          auVar71._16_4_ = fStack_830 * fVar262;
          auVar71._20_4_ = fStack_82c * fVar261;
          auVar71._24_4_ = fStack_828 * fVar279;
          auVar71._28_4_ = fStack_824;
          _local_8e0 = vsubps_avx(auVar71,auVar312);
          auVar313._0_4_ = fVar182 + fVar172 * fVar241;
          auVar313._4_4_ = fVar206 + fVar242 * fVar276;
          auVar313._8_4_ = fVar209 + fVar277 * fVar291;
          auVar313._12_4_ = fVar212 + fVar293 * fVar357;
          auVar313._16_4_ = fVar215 + fVar362 * fVar367;
          auVar313._20_4_ = fVar218 + fVar368 * fVar387;
          auVar313._24_4_ = fVar221 + fVar389 * fVar409;
          auVar313._28_4_ = fVar224 + local_8e0._28_4_;
          auVar72._4_4_ = (float)local_860._4_4_ * fVar239;
          auVar72._0_4_ = (float)local_860._0_4_ * fVar136;
          auVar72._8_4_ = fStack_858 * fVar240;
          auVar72._12_4_ = fStack_854 * fVar259;
          auVar72._16_4_ = fStack_850 * fVar262;
          auVar72._20_4_ = fStack_84c * fVar261;
          auVar72._24_4_ = fStack_848 * fVar279;
          auVar72._28_4_ = fStack_824;
          _local_900 = vsubps_avx(auVar72,auVar313);
          auVar271._0_4_ = fVar183 + fVar174 * fVar241;
          auVar271._4_4_ = fVar207 + fVar257 * fVar276;
          auVar271._8_4_ = fVar210 + fVar278 * fVar291;
          auVar271._12_4_ = fVar213 + fVar295 * fVar357;
          auVar271._16_4_ = fVar216 + fVar363 * fVar367;
          auVar271._20_4_ = fVar219 + fVar372 * fVar387;
          auVar271._24_4_ = fVar222 + fVar391 * fVar409;
          auVar271._28_4_ = fVar225 + auVar360._28_4_ + fVar438;
          auVar73._4_4_ = (float)local_880._4_4_ * fVar239;
          auVar73._0_4_ = (float)local_880._0_4_ * fVar136;
          auVar73._8_4_ = fStack_878 * fVar240;
          auVar73._12_4_ = fStack_874 * fVar259;
          auVar73._16_4_ = fStack_870 * fVar262;
          auVar73._20_4_ = fStack_86c * fVar261;
          auVar73._24_4_ = fStack_868 * fVar279;
          auVar73._28_4_ = local_900._28_4_;
          _local_920 = vsubps_avx(auVar73,auVar271);
          auVar22 = vcmpps_avx(auVar21,_DAT_02020f00,5);
          auVar199._8_4_ = 0x7f800000;
          auVar199._0_8_ = 0x7f8000007f800000;
          auVar199._12_4_ = 0x7f800000;
          auVar199._16_4_ = 0x7f800000;
          auVar199._20_4_ = 0x7f800000;
          auVar199._24_4_ = 0x7f800000;
          auVar199._28_4_ = 0x7f800000;
          auVar198 = vblendvps_avx(auVar199,auVar66,auVar22);
          auVar341._8_4_ = 0x7fffffff;
          auVar341._0_8_ = 0x7fffffff7fffffff;
          auVar341._12_4_ = 0x7fffffff;
          auVar341._16_4_ = 0x7fffffff;
          auVar341._20_4_ = 0x7fffffff;
          auVar341._24_4_ = 0x7fffffff;
          auVar341._28_4_ = 0x7fffffff;
          auVar21 = vandps_avx(auVar341,local_2c0);
          auVar21 = vmaxps_avx(local_4c0,auVar21);
          auVar74._4_4_ = auVar21._4_4_ * 1.9073486e-06;
          auVar74._0_4_ = auVar21._0_4_ * 1.9073486e-06;
          auVar74._8_4_ = auVar21._8_4_ * 1.9073486e-06;
          auVar74._12_4_ = auVar21._12_4_ * 1.9073486e-06;
          auVar74._16_4_ = auVar21._16_4_ * 1.9073486e-06;
          auVar74._20_4_ = auVar21._20_4_ * 1.9073486e-06;
          auVar74._24_4_ = auVar21._24_4_ * 1.9073486e-06;
          auVar74._28_4_ = auVar21._28_4_;
          auVar21 = vandps_avx(auVar341,auVar31);
          auVar23 = vcmpps_avx(auVar21,auVar74,1);
          auVar272._8_4_ = 0xff800000;
          auVar272._0_8_ = 0xff800000ff800000;
          auVar272._12_4_ = 0xff800000;
          auVar272._16_4_ = 0xff800000;
          auVar272._20_4_ = 0xff800000;
          auVar272._24_4_ = 0xff800000;
          auVar272._28_4_ = 0xff800000;
          auVar268 = vblendvps_avx(auVar272,auVar67,auVar22);
          auVar29 = auVar22 & auVar23;
          auVar21 = auVar28;
          if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar29 >> 0x7f,0) != '\0') ||
                (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar29 >> 0xbf,0) != '\0') ||
              (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar29[0x1f] < '\0') {
            auVar121 = vandps_avx(auVar23,auVar22);
            auVar147 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
            auVar76 = ZEXT412(0);
            auVar408 = ZEXT1264(auVar76) << 0x20;
            auVar23 = vcmpps_avx(auVar26,ZEXT1232(auVar76) << 0x20,2);
            auVar431._8_4_ = 0xff800000;
            auVar431._0_8_ = 0xff800000ff800000;
            auVar431._12_4_ = 0xff800000;
            auVar431._16_4_ = 0xff800000;
            auVar431._20_4_ = 0xff800000;
            auVar431._24_4_ = 0xff800000;
            auVar431._28_4_ = 0xff800000;
            auVar440._8_4_ = 0x7f800000;
            auVar440._0_8_ = 0x7f8000007f800000;
            auVar440._12_4_ = 0x7f800000;
            auVar440._16_4_ = 0x7f800000;
            auVar440._20_4_ = 0x7f800000;
            auVar440._24_4_ = 0x7f800000;
            auVar440._28_4_ = 0x7f800000;
            auVar26 = vblendvps_avx(auVar440,auVar431,auVar23);
            auVar230 = vpmovsxwd_avx(auVar147);
            auVar384 = ZEXT1664(auVar230);
            auVar147 = vpunpckhwd_avx(auVar147,auVar147);
            auVar342._16_16_ = auVar147;
            auVar342._0_16_ = auVar230;
            auVar198 = vblendvps_avx(auVar198,auVar26,auVar342);
            auVar21 = vblendvps_avx(auVar431,auVar440,auVar23);
            auVar268 = vblendvps_avx(auVar268,auVar21,auVar342);
            auVar26 = vcmpps_avx(ZEXT1232(auVar76) << 0x20,ZEXT1232(auVar76) << 0x20,0xf);
            auVar171._0_4_ = auVar26._0_4_ ^ auVar121._0_4_;
            auVar171._4_4_ = auVar26._4_4_ ^ auVar121._4_4_;
            auVar171._8_4_ = auVar26._8_4_ ^ auVar121._8_4_;
            auVar171._12_4_ = auVar26._12_4_ ^ auVar121._12_4_;
            auVar171._16_4_ = auVar26._16_4_ ^ auVar121._16_4_;
            auVar171._20_4_ = auVar26._20_4_ ^ auVar121._20_4_;
            auVar171._24_4_ = auVar26._24_4_ ^ auVar121._24_4_;
            auVar171._28_4_ = auVar26._28_4_ ^ auVar121._28_4_;
            auVar121 = vorps_avx(auVar23,auVar171);
            auVar121 = vandps_avx(auVar22,auVar121);
          }
          auVar375 = ZEXT3264(auVar21);
          local_ba0._0_4_ = auVar27._0_4_;
          local_ba0._4_4_ = auVar27._4_4_;
          fStack_b98 = auVar27._8_4_;
          fStack_b94 = auVar27._12_4_;
          fStack_b90 = auVar27._16_4_;
          fStack_b8c = auVar27._20_4_;
          fStack_b88 = auVar27._24_4_;
          fStack_b84 = auVar27._28_4_;
          auVar253 = auVar24._0_28_;
          auVar371 = ZEXT3264(auVar360);
          local_960 = auVar120;
        }
        auVar343 = ZEXT3264(local_4e0);
        _local_340 = local_4e0;
        local_320 = vminps_avx(local_2e0,auVar198);
        _local_700 = vmaxps_avx(local_4e0,auVar268);
        _local_300 = _local_700;
        auVar26 = vcmpps_avx(local_4e0,local_320,2);
        local_6c0 = vandps_avx(auVar26,auVar120);
        auVar26 = vcmpps_avx(_local_700,local_2e0,2);
        local_7e0 = vandps_avx(auVar26,auVar120);
        auVar120 = vorps_avx(local_7e0,local_6c0);
        if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar120 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar120 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar120 >> 0x7f,0) != '\0') ||
              (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar120 >> 0xbf,0) != '\0') ||
            (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar120[0x1f] < '\0') {
          local_9c0 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_740._0_4_ = auVar121._0_4_ ^ local_9c0._0_4_;
          local_740._4_4_ = auVar121._4_4_ ^ local_9c0._4_4_;
          local_740._8_4_ = auVar121._8_4_ ^ local_9c0._8_4_;
          local_740._12_4_ = auVar121._12_4_ ^ local_9c0._12_4_;
          local_740._16_4_ = auVar121._16_4_ ^ local_9c0._16_4_;
          local_740._20_4_ = auVar121._20_4_ ^ local_9c0._20_4_;
          local_740._24_4_ = auVar121._24_4_ ^ local_9c0._24_4_;
          local_740._28_4_ = auVar121._28_4_ ^ (uint)local_9c0._28_4_;
          auVar125._0_4_ =
               (float)local_ba0._0_4_ * (float)local_840._0_4_ +
               auVar253._0_4_ * (float)local_860._0_4_ + auVar371._0_4_ * (float)local_880._0_4_;
          auVar125._4_4_ =
               (float)local_ba0._4_4_ * (float)local_840._4_4_ +
               auVar253._4_4_ * (float)local_860._4_4_ + auVar371._4_4_ * (float)local_880._4_4_;
          auVar125._8_4_ =
               fStack_b98 * fStack_838 + auVar253._8_4_ * fStack_858 + auVar371._8_4_ * fStack_878;
          auVar125._12_4_ =
               fStack_b94 * fStack_834 + auVar253._12_4_ * fStack_854 + auVar371._12_4_ * fStack_874
          ;
          auVar125._16_4_ =
               fStack_b90 * fStack_830 + auVar253._16_4_ * fStack_850 + auVar371._16_4_ * fStack_870
          ;
          auVar125._20_4_ =
               fStack_b8c * fStack_82c + auVar253._20_4_ * fStack_84c + auVar371._20_4_ * fStack_86c
          ;
          auVar125._24_4_ =
               fStack_b88 * fStack_828 + auVar253._24_4_ * fStack_848 + auVar371._24_4_ * fStack_868
          ;
          auVar125._28_4_ = local_9c0._28_4_ + fStack_b84 + local_7e0._28_4_;
          auVar157._8_4_ = 0x7fffffff;
          auVar157._0_8_ = 0x7fffffff7fffffff;
          auVar157._12_4_ = 0x7fffffff;
          auVar157._16_4_ = 0x7fffffff;
          auVar157._20_4_ = 0x7fffffff;
          auVar157._24_4_ = 0x7fffffff;
          auVar157._28_4_ = 0x7fffffff;
          auVar120 = vandps_avx(auVar125,auVar157);
          auVar158._8_4_ = 0x3e99999a;
          auVar158._0_8_ = 0x3e99999a3e99999a;
          auVar158._12_4_ = 0x3e99999a;
          auVar158._16_4_ = 0x3e99999a;
          auVar158._20_4_ = 0x3e99999a;
          auVar158._24_4_ = 0x3e99999a;
          auVar158._28_4_ = 0x3e99999a;
          auVar120 = vcmpps_avx(auVar120,auVar158,1);
          auVar120 = vorps_avx(auVar120,local_740);
          auVar159._8_4_ = 3;
          auVar159._0_8_ = 0x300000003;
          auVar159._12_4_ = 3;
          auVar159._16_4_ = 3;
          auVar159._20_4_ = 3;
          auVar159._24_4_ = 3;
          auVar159._28_4_ = 3;
          auVar201._8_4_ = 2;
          auVar201._0_8_ = 0x200000002;
          auVar201._12_4_ = 2;
          auVar201._16_4_ = 2;
          auVar201._20_4_ = 2;
          auVar201._24_4_ = 2;
          auVar201._28_4_ = 2;
          auVar120 = vblendvps_avx(auVar201,auVar159,auVar120);
          local_720 = ZEXT432((uint)uVar103);
          local_760 = vpshufd_avx(ZEXT416((uint)uVar103),0);
          auVar147 = vpcmpgtd_avx(auVar120._16_16_,local_760);
          auStack_750 = auVar28._16_16_;
          auVar230 = vpcmpgtd_avx(auVar120._0_16_,local_760);
          auVar160._16_16_ = auVar147;
          auVar160._0_16_ = auVar230;
          local_6e0 = vblendps_avx(ZEXT1632(auVar230),auVar160,0xf0);
          auVar120 = vandnps_avx(local_6e0,local_6c0);
          auVar121 = local_6c0 & ~local_6e0;
          auVar275 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          auVar314 = ZEXT864(0) << 0x20;
          auStack_7b8 = auVar286._8_24_;
          local_7c0 = uVar103;
          local_780 = auVar120;
          if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar121 >> 0x7f,0) != '\0') ||
                (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0xbf,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar121[0x1f] < '\0') {
            local_8a0._4_4_ = local_4e0._4_4_ + (float)local_8c0._4_4_;
            local_8a0._0_4_ = local_4e0._0_4_ + (float)local_8c0._0_4_;
            fStack_898 = local_4e0._8_4_ + fStack_8b8;
            fStack_894 = local_4e0._12_4_ + fStack_8b4;
            fStack_890 = local_4e0._16_4_ + fStack_8b0;
            fStack_88c = local_4e0._20_4_ + fStack_8ac;
            fStack_888 = local_4e0._24_4_ + fStack_8a8;
            fStack_884 = local_4e0._28_4_ + fStack_8a4;
            local_7a0 = local_7e0;
            do {
              auVar245 = auVar275._0_16_;
              auVar161._8_4_ = 0x7f800000;
              auVar161._0_8_ = 0x7f8000007f800000;
              auVar161._12_4_ = 0x7f800000;
              auVar161._16_4_ = 0x7f800000;
              auVar161._20_4_ = 0x7f800000;
              auVar161._24_4_ = 0x7f800000;
              auVar161._28_4_ = 0x7f800000;
              auVar121 = vblendvps_avx(auVar161,auVar343._0_32_,auVar120);
              auVar26 = vshufps_avx(auVar121,auVar121,0xb1);
              auVar26 = vminps_avx(auVar121,auVar26);
              auVar21 = vshufpd_avx(auVar26,auVar26,5);
              auVar26 = vminps_avx(auVar26,auVar21);
              auVar21 = vperm2f128_avx(auVar26,auVar26,1);
              auVar26 = vminps_avx(auVar26,auVar21);
              auVar26 = vcmpps_avx(auVar121,auVar26,0);
              auVar21 = auVar120 & auVar26;
              auVar121 = auVar120;
              if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar21 >> 0x7f,0) != '\0') ||
                    (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar21 >> 0xbf,0) != '\0') ||
                  (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar21[0x1f] < '\0') {
                auVar121 = vandps_avx(auVar26,auVar120);
              }
              uVar102 = vmovmskps_avx(auVar121);
              uVar98 = 0;
              if (uVar102 != 0) {
                for (; (uVar102 >> uVar98 & 1) == 0; uVar98 = uVar98 + 1) {
                }
              }
              uVar103 = (ulong)uVar98;
              local_780 = auVar120;
              *(undefined4 *)(local_780 + uVar103 * 4) = 0;
              fVar136 = local_680[uVar103];
              uVar98 = *(uint *)(local_340 + uVar103 * 4);
              fVar172 = auVar142._0_4_;
              if ((float)local_980._0_4_ < 0.0) {
                fVar172 = sqrtf((float)local_980._0_4_);
                auVar314 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar245._8_4_ = 0x7fffffff;
                auVar245._0_8_ = 0x7fffffff7fffffff;
                auVar245._12_4_ = 0x7fffffff;
              }
              auVar384 = ZEXT464(uVar98);
              auVar375 = ZEXT464((uint)fVar136);
              auVar230 = vminps_avx(_local_a60,_local_a80);
              auVar147 = vmaxps_avx(_local_a60,_local_a80);
              auVar152 = vminps_avx(_local_a70,_local_a90);
              auVar111 = vminps_avx(auVar230,auVar152);
              auVar230 = vmaxps_avx(_local_a70,_local_a90);
              auVar152 = vmaxps_avx(auVar147,auVar230);
              auVar147 = vandps_avx(auVar111,auVar245);
              auVar230 = vandps_avx(auVar152,auVar245);
              auVar147 = vmaxps_avx(auVar147,auVar230);
              auVar230 = vmovshdup_avx(auVar147);
              auVar230 = vmaxss_avx(auVar230,auVar147);
              auVar147 = vshufpd_avx(auVar147,auVar147,1);
              auVar147 = vmaxss_avx(auVar147,auVar230);
              fVar136 = auVar147._0_4_ * 1.9073486e-06;
              local_800._0_4_ = fVar172 * 1.9073486e-06;
              local_820._0_16_ = vshufps_avx(auVar152,auVar152,0xff);
              lVar101 = 4;
              do {
                auVar147 = vshufps_avx(auVar384._0_16_,auVar384._0_16_,0);
                auVar110._0_4_ = auVar147._0_4_ * (float)local_970._0_4_ + 0.0;
                auVar110._4_4_ = auVar147._4_4_ * (float)local_970._4_4_ + 0.0;
                auVar110._8_4_ = auVar147._8_4_ * fStack_968 + 0.0;
                auVar110._12_4_ = auVar147._12_4_ * fStack_964 + 0.0;
                fVar226 = auVar375._0_4_;
                fVar174 = 1.0 - fVar226;
                fVar172 = fVar226 * 3.0;
                auVar147 = ZEXT416((uint)(fVar226 * fVar226 * -fVar174 * 0.5));
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar230 = ZEXT416((uint)((fVar174 * fVar174 * (fVar174 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar230 = vshufps_avx(auVar230,auVar230,0);
                auVar152 = ZEXT416((uint)((fVar226 * fVar226 * (fVar172 + -5.0) + 2.0) * 0.5));
                auVar152 = vshufps_avx(auVar152,auVar152,0);
                auVar111 = ZEXT416((uint)(fVar174 * fVar174 * -fVar226 * 0.5));
                auVar111 = vshufps_avx(auVar111,auVar111,0);
                auVar188._0_4_ =
                     auVar111._0_4_ * (float)local_a60._0_4_ +
                     auVar152._0_4_ * (float)local_a80._0_4_ +
                     auVar230._0_4_ * (float)local_a70._0_4_ +
                     auVar147._0_4_ * (float)local_a90._0_4_;
                auVar188._4_4_ =
                     auVar111._4_4_ * (float)local_a60._4_4_ +
                     auVar152._4_4_ * (float)local_a80._4_4_ +
                     auVar230._4_4_ * (float)local_a70._4_4_ +
                     auVar147._4_4_ * (float)local_a90._4_4_;
                auVar188._8_4_ =
                     auVar111._8_4_ * fStack_a58 +
                     auVar152._8_4_ * fStack_a78 +
                     auVar230._8_4_ * fStack_a68 + auVar147._8_4_ * fStack_a88;
                auVar188._12_4_ =
                     auVar111._12_4_ * fStack_a54 +
                     auVar152._12_4_ * fStack_a74 +
                     auVar230._12_4_ * fStack_a64 + auVar147._12_4_ * fStack_a84;
                local_960._0_16_ = auVar188;
                auVar230 = vsubps_avx(auVar110,auVar188);
                auVar147 = vdpps_avx(auVar230,auVar230,0x7f);
                fVar239 = auVar147._0_4_;
                local_c80 = auVar384._0_4_;
                if (fVar239 < 0.0) {
                  local_a20._0_4_ = fVar226 * 9.0;
                  local_9a0._0_4_ = fVar174 * -2.0;
                  fVar240 = sqrtf(fVar239);
                  auVar314 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar242 = (float)local_a20._0_4_;
                  fVar241 = (float)local_9a0._0_4_;
                }
                else {
                  auVar152 = vsqrtss_avx(auVar147,auVar147);
                  fVar240 = auVar152._0_4_;
                  fVar242 = fVar226 * 9.0;
                  fVar241 = fVar174 * -2.0;
                }
                auVar152 = ZEXT416((uint)((fVar226 * fVar226 + fVar241 * fVar226) * 0.5));
                auVar152 = vshufps_avx(auVar152,auVar152,0);
                auVar111 = ZEXT416((uint)(((fVar174 + fVar174) * (fVar172 + 2.0) +
                                          fVar174 * fVar174 * -3.0) * 0.5));
                auVar111 = vshufps_avx(auVar111,auVar111,0);
                auVar189 = ZEXT416((uint)(((fVar226 + fVar226) * (fVar172 + -5.0) +
                                          fVar226 * fVar172) * 0.5));
                auVar189 = vshufps_avx(auVar189,auVar189,0);
                auVar143 = ZEXT416((uint)((fVar226 * (fVar174 + fVar174) - fVar174 * fVar174) * 0.5)
                                  );
                auVar143 = vshufps_avx(auVar143,auVar143,0);
                auVar402._0_4_ =
                     (float)local_a60._0_4_ * auVar143._0_4_ +
                     (float)local_a80._0_4_ * auVar189._0_4_ +
                     (float)local_a90._0_4_ * auVar152._0_4_ +
                     (float)local_a70._0_4_ * auVar111._0_4_;
                auVar402._4_4_ =
                     (float)local_a60._4_4_ * auVar143._4_4_ +
                     (float)local_a80._4_4_ * auVar189._4_4_ +
                     (float)local_a90._4_4_ * auVar152._4_4_ +
                     (float)local_a70._4_4_ * auVar111._4_4_;
                auVar402._8_4_ =
                     fStack_a58 * auVar143._8_4_ +
                     fStack_a78 * auVar189._8_4_ +
                     fStack_a88 * auVar152._8_4_ + fStack_a68 * auVar111._8_4_;
                auVar402._12_4_ =
                     fStack_a54 * auVar143._12_4_ +
                     fStack_a74 * auVar189._12_4_ +
                     fStack_a84 * auVar152._12_4_ + fStack_a64 * auVar111._12_4_;
                auVar143 = vpermilps_avx(ZEXT416((uint)(fVar172 + -1.0)),0);
                auVar146 = vpermilps_avx(ZEXT416((uint)(fVar226 * -9.0 + 4.0)),0);
                auVar152 = vshufps_avx(ZEXT416((uint)(fVar242 + -5.0)),
                                       ZEXT416((uint)(fVar242 + -5.0)),0);
                auVar111 = ZEXT416((uint)(fVar226 * -3.0 + 2.0));
                auVar189 = vshufps_avx(auVar111,auVar111,0);
                auVar111 = vdpps_avx(auVar402,auVar402,0x7f);
                auVar144._0_4_ =
                     (float)local_a60._0_4_ * auVar189._0_4_ +
                     (float)local_a80._0_4_ * auVar152._0_4_ +
                     (float)local_a70._0_4_ * auVar146._0_4_ +
                     (float)local_a90._0_4_ * auVar143._0_4_;
                auVar144._4_4_ =
                     (float)local_a60._4_4_ * auVar189._4_4_ +
                     (float)local_a80._4_4_ * auVar152._4_4_ +
                     (float)local_a70._4_4_ * auVar146._4_4_ +
                     (float)local_a90._4_4_ * auVar143._4_4_;
                auVar144._8_4_ =
                     fStack_a58 * auVar189._8_4_ +
                     fStack_a78 * auVar152._8_4_ +
                     fStack_a68 * auVar146._8_4_ + fStack_a88 * auVar143._8_4_;
                auVar144._12_4_ =
                     fStack_a54 * auVar189._12_4_ +
                     fStack_a74 * auVar152._12_4_ +
                     fStack_a64 * auVar146._12_4_ + fStack_a84 * auVar143._12_4_;
                auVar152 = vblendps_avx(auVar111,_DAT_01feba10,0xe);
                auVar189 = vrsqrtss_avx(auVar152,auVar152);
                fVar174 = auVar189._0_4_;
                fVar172 = auVar111._0_4_;
                auVar189 = vdpps_avx(auVar402,auVar144,0x7f);
                auVar143 = vshufps_avx(auVar111,auVar111,0);
                auVar145._0_4_ = auVar144._0_4_ * auVar143._0_4_;
                auVar145._4_4_ = auVar144._4_4_ * auVar143._4_4_;
                auVar145._8_4_ = auVar144._8_4_ * auVar143._8_4_;
                auVar145._12_4_ = auVar144._12_4_ * auVar143._12_4_;
                auVar189 = vshufps_avx(auVar189,auVar189,0);
                auVar246._0_4_ = auVar402._0_4_ * auVar189._0_4_;
                auVar246._4_4_ = auVar402._4_4_ * auVar189._4_4_;
                auVar246._8_4_ = auVar402._8_4_ * auVar189._8_4_;
                auVar246._12_4_ = auVar402._12_4_ * auVar189._12_4_;
                auVar146 = vsubps_avx(auVar145,auVar246);
                auVar189 = vrcpss_avx(auVar152,auVar152);
                auVar152 = vmaxss_avx(ZEXT416((uint)fVar136),
                                      ZEXT416((uint)(local_c80 * (float)local_800._0_4_)));
                auVar371 = ZEXT1664(auVar152);
                auVar189 = ZEXT416((uint)(auVar189._0_4_ * (2.0 - fVar172 * auVar189._0_4_)));
                auVar189 = vshufps_avx(auVar189,auVar189,0);
                uVar103 = CONCAT44(auVar402._4_4_,auVar402._0_4_);
                auVar264._0_8_ = uVar103 ^ 0x8000000080000000;
                auVar264._8_4_ = -auVar402._8_4_;
                auVar264._12_4_ = -auVar402._12_4_;
                auVar143 = ZEXT416((uint)(fVar174 * 1.5 +
                                         fVar172 * -0.5 * fVar174 * fVar174 * fVar174));
                auVar143 = vshufps_avx(auVar143,auVar143,0);
                auVar231._0_4_ = auVar143._0_4_ * auVar146._0_4_ * auVar189._0_4_;
                auVar231._4_4_ = auVar143._4_4_ * auVar146._4_4_ * auVar189._4_4_;
                auVar231._8_4_ = auVar143._8_4_ * auVar146._8_4_ * auVar189._8_4_;
                auVar231._12_4_ = auVar143._12_4_ * auVar146._12_4_ * auVar189._12_4_;
                auVar284._0_4_ = auVar402._0_4_ * auVar143._0_4_;
                auVar284._4_4_ = auVar402._4_4_ * auVar143._4_4_;
                auVar284._8_4_ = auVar402._8_4_ * auVar143._8_4_;
                auVar284._12_4_ = auVar402._12_4_ * auVar143._12_4_;
                if (fVar172 < 0.0) {
                  fVar172 = sqrtf(fVar172);
                  auVar371 = ZEXT464(auVar152._0_4_);
                  auVar314 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar111 = vsqrtss_avx(auVar111,auVar111);
                  fVar172 = auVar111._0_4_;
                }
                auVar111 = vdpps_avx(auVar230,auVar284,0x7f);
                fVar172 = (fVar136 / fVar172) * (fVar240 + 1.0) + auVar371._0_4_ + fVar240 * fVar136
                ;
                auVar189 = vdpps_avx(auVar264,auVar284,0x7f);
                auVar143 = vdpps_avx(auVar230,auVar231,0x7f);
                auVar146 = vdpps_avx(_local_970,auVar284,0x7f);
                auVar18 = vdpps_avx(auVar230,auVar264,0x7f);
                fVar174 = auVar189._0_4_ + auVar143._0_4_;
                fVar241 = auVar111._0_4_;
                auVar112._0_4_ = fVar241 * fVar241;
                auVar112._4_4_ = auVar111._4_4_ * auVar111._4_4_;
                auVar112._8_4_ = auVar111._8_4_ * auVar111._8_4_;
                auVar112._12_4_ = auVar111._12_4_ * auVar111._12_4_;
                auVar143 = vsubps_avx(auVar147,auVar112);
                auVar189 = vdpps_avx(auVar230,_local_970,0x7f);
                fVar242 = auVar189._0_4_ - fVar241 * auVar146._0_4_;
                auVar189 = vrsqrtss_avx(auVar143,auVar143);
                fVar257 = auVar143._0_4_;
                fVar240 = auVar189._0_4_;
                fVar240 = fVar240 * 1.5 + fVar257 * -0.5 * fVar240 * fVar240 * fVar240;
                if (fVar257 < 0.0) {
                  local_a20._0_4_ = fVar242;
                  local_9a0._0_4_ = fVar240;
                  fVar257 = sqrtf(fVar257);
                  auVar371 = ZEXT464(auVar152._0_4_);
                  auVar314 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar240 = (float)local_9a0._0_4_;
                  fVar242 = (float)local_a20._0_4_;
                }
                else {
                  auVar152 = vsqrtss_avx(auVar143,auVar143);
                  fVar257 = auVar152._0_4_;
                }
                auVar408 = ZEXT1664(auVar111);
                auVar189 = vpermilps_avx(local_960._0_16_,0xff);
                auVar19 = vshufps_avx(auVar402,auVar402,0xff);
                fVar241 = (auVar18._0_4_ - fVar241 * fVar174) * fVar240 - auVar19._0_4_;
                auVar247._0_8_ = auVar146._0_8_ ^ 0x8000000080000000;
                auVar247._8_4_ = auVar146._8_4_ ^ 0x80000000;
                auVar247._12_4_ = auVar146._12_4_ ^ 0x80000000;
                auVar265._0_4_ = -fVar241;
                auVar265._4_4_ = 0x80000000;
                auVar265._8_4_ = 0x80000000;
                auVar265._12_4_ = 0x80000000;
                auVar152 = vinsertps_avx(ZEXT416((uint)(fVar242 * fVar240)),auVar247,0x10);
                auVar143 = vmovsldup_avx(ZEXT416((uint)(fVar174 * fVar242 * fVar240 -
                                                       auVar146._0_4_ * fVar241)));
                auVar152 = vdivps_avx(auVar152,auVar143);
                auVar146 = ZEXT416((uint)(fVar257 - auVar189._0_4_));
                auVar189 = vinsertps_avx(auVar111,auVar146,0x10);
                auVar232._0_4_ = auVar189._0_4_ * auVar152._0_4_;
                auVar232._4_4_ = auVar189._4_4_ * auVar152._4_4_;
                auVar232._8_4_ = auVar189._8_4_ * auVar152._8_4_;
                auVar232._12_4_ = auVar189._12_4_ * auVar152._12_4_;
                auVar152 = vinsertps_avx(auVar265,ZEXT416((uint)fVar174),0x1c);
                auVar152 = vdivps_avx(auVar152,auVar143);
                auVar190._0_4_ = auVar189._0_4_ * auVar152._0_4_;
                auVar190._4_4_ = auVar189._4_4_ * auVar152._4_4_;
                auVar190._8_4_ = auVar189._8_4_ * auVar152._8_4_;
                auVar190._12_4_ = auVar189._12_4_ * auVar152._12_4_;
                auVar152 = vhaddps_avx(auVar232,auVar232);
                auVar189 = vhaddps_avx(auVar190,auVar190);
                fVar226 = fVar226 - auVar152._0_4_;
                local_c80 = local_c80 - auVar189._0_4_;
                auVar384 = ZEXT464((uint)local_c80);
                auVar248._8_4_ = 0x7fffffff;
                auVar248._0_8_ = 0x7fffffff7fffffff;
                auVar248._12_4_ = 0x7fffffff;
                auVar275 = ZEXT1664(auVar248);
                auVar152 = vandps_avx(auVar111,auVar248);
                if (fVar172 <= auVar152._0_4_) {
LAB_010751b8:
                  bVar75 = false;
                }
                else {
                  auVar152 = vandps_avx(auVar146,auVar248);
                  if ((float)local_820._0_4_ * 1.9073486e-06 + auVar371._0_4_ + fVar172 <=
                      auVar152._0_4_) goto LAB_010751b8;
                  local_c80 = local_c80 + (float)local_940._0_4_;
                  auVar384 = ZEXT464((uint)local_c80);
                  bVar75 = true;
                  if ((((fVar135 <= local_c80) &&
                       (fVar172 = *(float *)(ray + k * 4 + 0x100), local_c80 <= fVar172)) &&
                      (0.0 <= fVar226)) && (fVar226 <= 1.0)) {
                    auVar147 = vrsqrtss_avx(auVar147,auVar147);
                    fVar174 = auVar147._0_4_;
                    pGVar11 = (context->scene->geometries).items[uVar97].ptr;
                    if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      auVar147 = ZEXT416((uint)(fVar174 * 1.5 +
                                               fVar239 * -0.5 * fVar174 * fVar174 * fVar174));
                      auVar147 = vshufps_avx(auVar147,auVar147,0);
                      local_be0 = auVar230._0_4_;
                      fStack_bdc = auVar230._4_4_;
                      fStack_bd8 = auVar230._8_4_;
                      fStack_bd4 = auVar230._12_4_;
                      auVar148._0_4_ = auVar147._0_4_ * local_be0;
                      auVar148._4_4_ = auVar147._4_4_ * fStack_bdc;
                      auVar148._8_4_ = auVar147._8_4_ * fStack_bd8;
                      auVar148._12_4_ = auVar147._12_4_ * fStack_bd4;
                      auVar113._0_4_ = auVar402._0_4_ + auVar19._0_4_ * auVar148._0_4_;
                      auVar113._4_4_ = auVar402._4_4_ + auVar19._4_4_ * auVar148._4_4_;
                      auVar113._8_4_ = auVar402._8_4_ + auVar19._8_4_ * auVar148._8_4_;
                      auVar113._12_4_ = auVar402._12_4_ + auVar19._12_4_ * auVar148._12_4_;
                      auVar147 = vshufps_avx(auVar148,auVar148,0xc9);
                      auVar230 = vshufps_avx(auVar402,auVar402,0xc9);
                      auVar149._0_4_ = auVar230._0_4_ * auVar148._0_4_;
                      auVar149._4_4_ = auVar230._4_4_ * auVar148._4_4_;
                      auVar149._8_4_ = auVar230._8_4_ * auVar148._8_4_;
                      auVar149._12_4_ = auVar230._12_4_ * auVar148._12_4_;
                      auVar191._0_4_ = auVar402._0_4_ * auVar147._0_4_;
                      auVar191._4_4_ = auVar402._4_4_ * auVar147._4_4_;
                      auVar191._8_4_ = auVar402._8_4_ * auVar147._8_4_;
                      auVar191._12_4_ = auVar402._12_4_ * auVar147._12_4_;
                      auVar152 = vsubps_avx(auVar191,auVar149);
                      auVar147 = vshufps_avx(auVar152,auVar152,0xc9);
                      auVar230 = vshufps_avx(auVar113,auVar113,0xc9);
                      auVar192._0_4_ = auVar230._0_4_ * auVar147._0_4_;
                      auVar192._4_4_ = auVar230._4_4_ * auVar147._4_4_;
                      auVar192._8_4_ = auVar230._8_4_ * auVar147._8_4_;
                      auVar192._12_4_ = auVar230._12_4_ * auVar147._12_4_;
                      auVar147 = vshufps_avx(auVar152,auVar152,0xd2);
                      auVar114._0_4_ = auVar113._0_4_ * auVar147._0_4_;
                      auVar114._4_4_ = auVar113._4_4_ * auVar147._4_4_;
                      auVar114._8_4_ = auVar113._8_4_ * auVar147._8_4_;
                      auVar114._12_4_ = auVar113._12_4_ * auVar147._12_4_;
                      auVar147 = vsubps_avx(auVar192,auVar114);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = local_c80;
                        uVar8 = vextractps_avx(auVar147,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar8;
                        uVar8 = vextractps_avx(auVar147,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                        *(int *)(ray + k * 4 + 0x1c0) = auVar147._0_4_;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar226;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(int *)(ray + k * 4 + 0x220) = (int)local_9c8;
                        *(uint *)(ray + k * 4 + 0x240) = uVar97;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar15 = context->user;
                        auStack_5d0 = vshufps_avx(ZEXT416((uint)fVar226),ZEXT416((uint)fVar226),0);
                        auStack_630 = vshufps_avx(auVar147,auVar147,0x55);
                        auStack_610 = vshufps_avx(auVar147,auVar147,0xaa);
                        auStack_5f0 = vshufps_avx(auVar147,auVar147,0);
                        local_640 = (RTCHitN  [16])auStack_630;
                        local_620 = auStack_610;
                        local_600 = auStack_5f0;
                        local_5e0 = auStack_5d0;
                        local_5c0 = ZEXT832(0) << 0x20;
                        local_5a0 = local_520._0_8_;
                        uStack_598 = local_520._8_8_;
                        uStack_590 = local_520._16_8_;
                        uStack_588 = local_520._24_8_;
                        local_580 = local_500._0_8_;
                        uStack_578 = local_500._8_8_;
                        uStack_570 = local_500._16_8_;
                        uStack_568 = local_500._24_8_;
                        local_9d0[1] = local_9c0;
                        *local_9d0 = local_9c0;
                        local_560 = pRVar15->instID[0];
                        uStack_55c = local_560;
                        uStack_558 = local_560;
                        uStack_554 = local_560;
                        uStack_550 = local_560;
                        uStack_54c = local_560;
                        uStack_548 = local_560;
                        uStack_544 = local_560;
                        local_540 = pRVar15->instPrimID[0];
                        uStack_53c = local_540;
                        uStack_538 = local_540;
                        uStack_534 = local_540;
                        uStack_530 = local_540;
                        uStack_52c = local_540;
                        uStack_528 = local_540;
                        uStack_524 = local_540;
                        *(float *)(ray + k * 4 + 0x100) = local_c80;
                        local_ac0 = *local_9d8;
                        uStack_ab8 = local_9d8[1];
                        local_ab0 = *local_9e0;
                        uStack_aa8 = local_9e0[1];
                        local_a50.valid = (int *)&local_ac0;
                        local_a50.geometryUserPtr = pGVar11->userPtr;
                        local_a50.context = context->user;
                        local_a50.hit = local_640;
                        local_a50.N = 8;
                        local_a50.ray = (RTCRayN *)ray;
                        if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar371 = ZEXT1664(auVar371._0_16_);
                          auVar408 = ZEXT1664(auVar111);
                          (*pGVar11->intersectionFilterN)(&local_a50);
                        }
                        auVar87._8_8_ = uStack_ab8;
                        auVar87._0_8_ = local_ac0;
                        auVar147 = vpcmpeqd_avx((undefined1  [16])0x0,auVar87);
                        auVar91._8_8_ = uStack_aa8;
                        auVar91._0_8_ = local_ab0;
                        auVar230 = vpcmpeqd_avx((undefined1  [16])0x0,auVar91);
                        auVar126._16_16_ = auVar230;
                        auVar126._0_16_ = auVar147;
                        auVar120 = local_9c0 & ~auVar126;
                        if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar120 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar120 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar120 >> 0x7f,0) == '\0')
                              && (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar120 >> 0xbf,0) == '\0') &&
                            (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar120[0x1f]) {
                          auVar127._0_4_ = auVar147._0_4_ ^ local_9c0._0_4_;
                          auVar127._4_4_ = auVar147._4_4_ ^ local_9c0._4_4_;
                          auVar127._8_4_ = auVar147._8_4_ ^ local_9c0._8_4_;
                          auVar127._12_4_ = auVar147._12_4_ ^ local_9c0._12_4_;
                          auVar127._16_4_ = auVar230._0_4_ ^ local_9c0._16_4_;
                          auVar127._20_4_ = auVar230._4_4_ ^ local_9c0._20_4_;
                          auVar127._24_4_ = auVar230._8_4_ ^ local_9c0._24_4_;
                          auVar127._28_4_ = auVar230._12_4_ ^ local_9c0._28_4_;
                          auVar275 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar314 = ZEXT864(0);
                        }
                        else {
                          p_Var16 = context->args->filter;
                          auVar275 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar314 = ZEXT1664(ZEXT816(0));
                          if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar371 = ZEXT1664(auVar371._0_16_);
                            auVar408 = ZEXT1664(auVar408._0_16_);
                            (*p_Var16)(&local_a50);
                            auVar314 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar275 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar88._8_8_ = uStack_ab8;
                          auVar88._0_8_ = local_ac0;
                          auVar147 = vpcmpeqd_avx((undefined1  [16])0x0,auVar88);
                          auVar92._8_8_ = uStack_aa8;
                          auVar92._0_8_ = local_ab0;
                          auVar230 = vpcmpeqd_avx((undefined1  [16])0x0,auVar92);
                          auVar162._16_16_ = auVar230;
                          auVar162._0_16_ = auVar147;
                          auVar127._0_4_ = auVar147._0_4_ ^ local_9c0._0_4_;
                          auVar127._4_4_ = auVar147._4_4_ ^ local_9c0._4_4_;
                          auVar127._8_4_ = auVar147._8_4_ ^ local_9c0._8_4_;
                          auVar127._12_4_ = auVar147._12_4_ ^ local_9c0._12_4_;
                          auVar127._16_4_ = auVar230._0_4_ ^ local_9c0._16_4_;
                          auVar127._20_4_ = auVar230._4_4_ ^ local_9c0._20_4_;
                          auVar127._24_4_ = auVar230._8_4_ ^ local_9c0._24_4_;
                          auVar127._28_4_ = auVar230._12_4_ ^ local_9c0._28_4_;
                          auVar120 = local_9c0 & ~auVar162;
                          if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar120 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar120 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar120 >> 0x7f,0) != '\0') ||
                                (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar120 >> 0xbf,0) != '\0') ||
                              (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar120[0x1f] < '\0') {
                            auVar120 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])local_a50.hit);
                            *(undefined1 (*) [32])(local_a50.ray + 0x180) = auVar120;
                            auVar120 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                                (local_a50.hit + 0x20));
                            *(undefined1 (*) [32])(local_a50.ray + 0x1a0) = auVar120;
                            auVar120 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                                (local_a50.hit + 0x40));
                            *(undefined1 (*) [32])(local_a50.ray + 0x1c0) = auVar120;
                            auVar120 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                                (local_a50.hit + 0x60));
                            *(undefined1 (*) [32])(local_a50.ray + 0x1e0) = auVar120;
                            auVar120 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                                (local_a50.hit + 0x80));
                            *(undefined1 (*) [32])(local_a50.ray + 0x200) = auVar120;
                            auVar120 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                                (local_a50.hit + 0xa0));
                            *(undefined1 (*) [32])(local_a50.ray + 0x220) = auVar120;
                            auVar120 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                                (local_a50.hit + 0xc0));
                            *(undefined1 (*) [32])(local_a50.ray + 0x240) = auVar120;
                            auVar120 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                                (local_a50.hit + 0xe0));
                            *(undefined1 (*) [32])(local_a50.ray + 0x260) = auVar120;
                            auVar120 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                                (local_a50.hit + 0x100));
                            *(undefined1 (*) [32])(local_a50.ray + 0x280) = auVar120;
                          }
                        }
                        auVar384 = ZEXT464((uint)local_c80);
                        if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar127 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar127 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar127 >> 0x7f,0) == '\0')
                              && (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar127 >> 0xbf,0) == '\0') &&
                            (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar127[0x1f]) {
                          *(float *)(ray + k * 4 + 0x100) = fVar172;
                        }
                      }
                    }
                  }
                }
                auVar375 = ZEXT464((uint)fVar226);
                bVar105 = lVar101 != 0;
                lVar101 = lVar101 + -1;
              } while ((!bVar75) && (bVar105));
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar128._4_4_ = uVar8;
              auVar128._0_4_ = uVar8;
              auVar128._8_4_ = uVar8;
              auVar128._12_4_ = uVar8;
              auVar128._16_4_ = uVar8;
              auVar128._20_4_ = uVar8;
              auVar128._24_4_ = uVar8;
              auVar128._28_4_ = uVar8;
              auVar121 = vcmpps_avx(_local_8a0,auVar128,2);
              auVar120 = vandps_avx(auVar121,local_780);
              auVar121 = local_780 & auVar121;
              auVar343 = ZEXT3264(local_4e0);
              uVar103 = local_7c0;
              local_780 = auVar120;
            } while ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar121 >> 0x7f,0) != '\0') ||
                       (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar121 >> 0xbf,0) != '\0') ||
                     (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar121[0x1f] < '\0');
          }
          auVar129._0_4_ =
               (float)local_8e0._0_4_ * (float)local_840._0_4_ +
               (float)local_900._0_4_ * (float)local_860._0_4_ +
               (float)local_920._0_4_ * (float)local_880._0_4_;
          auVar129._4_4_ =
               (float)local_8e0._4_4_ * (float)local_840._4_4_ +
               (float)local_900._4_4_ * (float)local_860._4_4_ +
               (float)local_920._4_4_ * (float)local_880._4_4_;
          auVar129._8_4_ =
               fStack_8d8 * fStack_838 + fStack_8f8 * fStack_858 + fStack_918 * fStack_878;
          auVar129._12_4_ =
               fStack_8d4 * fStack_834 + fStack_8f4 * fStack_854 + fStack_914 * fStack_874;
          auVar129._16_4_ =
               fStack_8d0 * fStack_830 + fStack_8f0 * fStack_850 + fStack_910 * fStack_870;
          auVar129._20_4_ =
               fStack_8cc * fStack_82c + fStack_8ec * fStack_84c + fStack_90c * fStack_86c;
          auVar129._24_4_ =
               fStack_8c8 * fStack_828 + fStack_8e8 * fStack_848 + fStack_908 * fStack_868;
          auVar129._28_4_ = fStack_8c4 + fStack_8e4 + fStack_904;
          auVar163._8_4_ = 0x7fffffff;
          auVar163._0_8_ = 0x7fffffff7fffffff;
          auVar163._12_4_ = 0x7fffffff;
          auVar163._16_4_ = 0x7fffffff;
          auVar163._20_4_ = 0x7fffffff;
          auVar163._24_4_ = 0x7fffffff;
          auVar163._28_4_ = 0x7fffffff;
          auVar120 = vandps_avx(auVar129,auVar163);
          auVar164._8_4_ = 0x3e99999a;
          auVar164._0_8_ = 0x3e99999a3e99999a;
          auVar164._12_4_ = 0x3e99999a;
          auVar164._16_4_ = 0x3e99999a;
          auVar164._20_4_ = 0x3e99999a;
          auVar164._24_4_ = 0x3e99999a;
          auVar164._28_4_ = 0x3e99999a;
          auVar120 = vcmpps_avx(auVar120,auVar164,1);
          auVar121 = vorps_avx(auVar120,local_740);
          auVar165._0_4_ = (float)local_8c0._0_4_ + (float)local_700._0_4_;
          auVar165._4_4_ = (float)local_8c0._4_4_ + (float)local_700._4_4_;
          auVar165._8_4_ = fStack_8b8 + fStack_6f8;
          auVar165._12_4_ = fStack_8b4 + fStack_6f4;
          auVar165._16_4_ = fStack_8b0 + fStack_6f0;
          auVar165._20_4_ = fStack_8ac + fStack_6ec;
          auVar165._24_4_ = fStack_8a8 + fStack_6e8;
          auVar165._28_4_ = fStack_8a4 + fStack_6e4;
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar202._4_4_ = uVar8;
          auVar202._0_4_ = uVar8;
          auVar202._8_4_ = uVar8;
          auVar202._12_4_ = uVar8;
          auVar202._16_4_ = uVar8;
          auVar202._20_4_ = uVar8;
          auVar202._24_4_ = uVar8;
          auVar202._28_4_ = uVar8;
          auVar120 = vcmpps_avx(auVar165,auVar202,2);
          _local_900 = vandps_avx(auVar120,local_7e0);
          auVar166._8_4_ = 3;
          auVar166._0_8_ = 0x300000003;
          auVar166._12_4_ = 3;
          auVar166._16_4_ = 3;
          auVar166._20_4_ = 3;
          auVar166._24_4_ = 3;
          auVar166._28_4_ = 3;
          auVar203._8_4_ = 2;
          auVar203._0_8_ = 0x200000002;
          auVar203._12_4_ = 2;
          auVar203._16_4_ = 2;
          auVar203._20_4_ = 2;
          auVar203._24_4_ = 2;
          auVar203._28_4_ = 2;
          auVar120 = vblendvps_avx(auVar203,auVar166,auVar121);
          auVar147 = vpcmpgtd_avx(auVar120._16_16_,local_760);
          auVar230 = vpshufd_avx(local_720._0_16_,0);
          auVar230 = vpcmpgtd_avx(auVar120._0_16_,auVar230);
          auVar167._16_16_ = auVar147;
          auVar167._0_16_ = auVar230;
          _local_920 = vblendps_avx(ZEXT1632(auVar230),auVar167,0xf0);
          auVar120 = vandnps_avx(_local_920,_local_900);
          auVar121 = _local_900 & ~_local_920;
          fVar399 = (float)local_8c0._0_4_;
          fVar411 = (float)local_8c0._4_4_;
          fVar280 = fStack_8b8;
          fVar292 = fStack_8b4;
          fVar294 = fStack_8b0;
          fVar296 = fStack_8ac;
          fVar298 = fStack_8a8;
          fVar300 = fStack_8a4;
          if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar121 >> 0x7f,0) != '\0') ||
                (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0xbf,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar121[0x1f] < '\0') {
            _local_8a0 = _local_300;
            local_8e0._4_4_ = (float)local_8c0._4_4_ + (float)local_300._4_4_;
            local_8e0._0_4_ = (float)local_8c0._0_4_ + (float)local_300._0_4_;
            fStack_8d8 = fStack_8b8 + fStack_2f8;
            fStack_8d4 = fStack_8b4 + fStack_2f4;
            fStack_8d0 = fStack_8b0 + fStack_2f0;
            fStack_8cc = fStack_8ac + fStack_2ec;
            fStack_8c8 = fStack_8a8 + fStack_2e8;
            fStack_8c4 = fStack_8a4 + fStack_2e4;
            do {
              auVar249 = auVar275._0_16_;
              auVar168._8_4_ = 0x7f800000;
              auVar168._0_8_ = 0x7f8000007f800000;
              auVar168._12_4_ = 0x7f800000;
              auVar168._16_4_ = 0x7f800000;
              auVar168._20_4_ = 0x7f800000;
              auVar168._24_4_ = 0x7f800000;
              auVar168._28_4_ = 0x7f800000;
              auVar121 = vblendvps_avx(auVar168,_local_8a0,auVar120);
              auVar26 = vshufps_avx(auVar121,auVar121,0xb1);
              auVar26 = vminps_avx(auVar121,auVar26);
              auVar21 = vshufpd_avx(auVar26,auVar26,5);
              auVar26 = vminps_avx(auVar26,auVar21);
              auVar21 = vperm2f128_avx(auVar26,auVar26,1);
              auVar26 = vminps_avx(auVar26,auVar21);
              auVar26 = vcmpps_avx(auVar121,auVar26,0);
              auVar21 = auVar120 & auVar26;
              auVar121 = auVar120;
              if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar21 >> 0x7f,0) != '\0') ||
                    (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar21 >> 0xbf,0) != '\0') ||
                  (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar21[0x1f] < '\0') {
                auVar121 = vandps_avx(auVar26,auVar120);
              }
              uVar102 = vmovmskps_avx(auVar121);
              uVar98 = 0;
              if (uVar102 != 0) {
                for (; (uVar102 >> uVar98 & 1) == 0; uVar98 = uVar98 + 1) {
                }
              }
              uVar103 = (ulong)uVar98;
              local_7a0 = auVar120;
              *(undefined4 *)(local_7a0 + uVar103 * 4) = 0;
              fVar136 = local_6a0[uVar103];
              uVar98 = *(uint *)(local_2e0 + uVar103 * 4);
              fVar172 = auVar17._0_4_;
              if ((float)local_980._0_4_ < 0.0) {
                fVar172 = sqrtf((float)local_980._0_4_);
                auVar314 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar249._8_4_ = 0x7fffffff;
                auVar249._0_8_ = 0x7fffffff7fffffff;
                auVar249._12_4_ = 0x7fffffff;
              }
              auVar384 = ZEXT464(uVar98);
              auVar375 = ZEXT464((uint)fVar136);
              auVar230 = vminps_avx(_local_a60,_local_a80);
              auVar147 = vmaxps_avx(_local_a60,_local_a80);
              auVar152 = vminps_avx(_local_a70,_local_a90);
              auVar111 = vminps_avx(auVar230,auVar152);
              auVar230 = vmaxps_avx(_local_a70,_local_a90);
              auVar152 = vmaxps_avx(auVar147,auVar230);
              auVar147 = vandps_avx(auVar111,auVar249);
              auVar230 = vandps_avx(auVar152,auVar249);
              auVar147 = vmaxps_avx(auVar147,auVar230);
              auVar230 = vmovshdup_avx(auVar147);
              auVar230 = vmaxss_avx(auVar230,auVar147);
              auVar147 = vshufpd_avx(auVar147,auVar147,1);
              auVar147 = vmaxss_avx(auVar147,auVar230);
              fVar136 = auVar147._0_4_ * 1.9073486e-06;
              local_800._0_4_ = fVar172 * 1.9073486e-06;
              local_820._0_16_ = vshufps_avx(auVar152,auVar152,0xff);
              lVar101 = 4;
              do {
                auVar147 = vshufps_avx(auVar384._0_16_,auVar384._0_16_,0);
                auVar115._0_4_ = auVar147._0_4_ * (float)local_970._0_4_ + 0.0;
                auVar115._4_4_ = auVar147._4_4_ * (float)local_970._4_4_ + 0.0;
                auVar115._8_4_ = auVar147._8_4_ * fStack_968 + 0.0;
                auVar115._12_4_ = auVar147._12_4_ * fStack_964 + 0.0;
                fVar226 = auVar375._0_4_;
                fVar174 = 1.0 - fVar226;
                fVar172 = fVar226 * 3.0;
                auVar147 = ZEXT416((uint)(fVar226 * fVar226 * -fVar174 * 0.5));
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar230 = ZEXT416((uint)((fVar174 * fVar174 * (fVar174 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar230 = vshufps_avx(auVar230,auVar230,0);
                auVar152 = ZEXT416((uint)((fVar226 * fVar226 * (fVar172 + -5.0) + 2.0) * 0.5));
                auVar152 = vshufps_avx(auVar152,auVar152,0);
                auVar111 = ZEXT416((uint)(fVar174 * fVar174 * -fVar226 * 0.5));
                auVar111 = vshufps_avx(auVar111,auVar111,0);
                auVar193._0_4_ =
                     auVar111._0_4_ * (float)local_a60._0_4_ +
                     auVar152._0_4_ * (float)local_a80._0_4_ +
                     auVar230._0_4_ * (float)local_a70._0_4_ +
                     auVar147._0_4_ * (float)local_a90._0_4_;
                auVar193._4_4_ =
                     auVar111._4_4_ * (float)local_a60._4_4_ +
                     auVar152._4_4_ * (float)local_a80._4_4_ +
                     auVar230._4_4_ * (float)local_a70._4_4_ +
                     auVar147._4_4_ * (float)local_a90._4_4_;
                auVar193._8_4_ =
                     auVar111._8_4_ * fStack_a58 +
                     auVar152._8_4_ * fStack_a78 +
                     auVar230._8_4_ * fStack_a68 + auVar147._8_4_ * fStack_a88;
                auVar193._12_4_ =
                     auVar111._12_4_ * fStack_a54 +
                     auVar152._12_4_ * fStack_a74 +
                     auVar230._12_4_ * fStack_a64 + auVar147._12_4_ * fStack_a84;
                local_960._0_16_ = auVar193;
                auVar230 = vsubps_avx(auVar115,auVar193);
                auVar147 = vdpps_avx(auVar230,auVar230,0x7f);
                fVar239 = auVar147._0_4_;
                local_c80 = auVar384._0_4_;
                if (fVar239 < 0.0) {
                  local_a20._0_4_ = fVar226 * 9.0;
                  local_9a0._0_4_ = fVar174 * -2.0;
                  fVar240 = sqrtf(fVar239);
                  auVar314 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar242 = (float)local_a20._0_4_;
                  fVar241 = (float)local_9a0._0_4_;
                }
                else {
                  auVar152 = vsqrtss_avx(auVar147,auVar147);
                  fVar240 = auVar152._0_4_;
                  fVar242 = fVar226 * 9.0;
                  fVar241 = fVar174 * -2.0;
                }
                auVar152 = ZEXT416((uint)((fVar226 * fVar226 + fVar241 * fVar226) * 0.5));
                auVar152 = vshufps_avx(auVar152,auVar152,0);
                auVar111 = ZEXT416((uint)(((fVar174 + fVar174) * (fVar172 + 2.0) +
                                          fVar174 * fVar174 * -3.0) * 0.5));
                auVar111 = vshufps_avx(auVar111,auVar111,0);
                auVar189 = ZEXT416((uint)(((fVar226 + fVar226) * (fVar172 + -5.0) +
                                          fVar226 * fVar172) * 0.5));
                auVar189 = vshufps_avx(auVar189,auVar189,0);
                auVar143 = ZEXT416((uint)((fVar226 * (fVar174 + fVar174) - fVar174 * fVar174) * 0.5)
                                  );
                auVar143 = vshufps_avx(auVar143,auVar143,0);
                auVar403._0_4_ =
                     (float)local_a60._0_4_ * auVar143._0_4_ +
                     (float)local_a80._0_4_ * auVar189._0_4_ +
                     (float)local_a90._0_4_ * auVar152._0_4_ +
                     (float)local_a70._0_4_ * auVar111._0_4_;
                auVar403._4_4_ =
                     (float)local_a60._4_4_ * auVar143._4_4_ +
                     (float)local_a80._4_4_ * auVar189._4_4_ +
                     (float)local_a90._4_4_ * auVar152._4_4_ +
                     (float)local_a70._4_4_ * auVar111._4_4_;
                auVar403._8_4_ =
                     fStack_a58 * auVar143._8_4_ +
                     fStack_a78 * auVar189._8_4_ +
                     fStack_a88 * auVar152._8_4_ + fStack_a68 * auVar111._8_4_;
                auVar403._12_4_ =
                     fStack_a54 * auVar143._12_4_ +
                     fStack_a74 * auVar189._12_4_ +
                     fStack_a84 * auVar152._12_4_ + fStack_a64 * auVar111._12_4_;
                auVar143 = vpermilps_avx(ZEXT416((uint)(fVar172 + -1.0)),0);
                auVar146 = vpermilps_avx(ZEXT416((uint)(fVar226 * -9.0 + 4.0)),0);
                auVar152 = vshufps_avx(ZEXT416((uint)(fVar242 + -5.0)),
                                       ZEXT416((uint)(fVar242 + -5.0)),0);
                auVar111 = ZEXT416((uint)(fVar226 * -3.0 + 2.0));
                auVar189 = vshufps_avx(auVar111,auVar111,0);
                auVar111 = vdpps_avx(auVar403,auVar403,0x7f);
                auVar150._0_4_ =
                     (float)local_a60._0_4_ * auVar189._0_4_ +
                     (float)local_a80._0_4_ * auVar152._0_4_ +
                     (float)local_a70._0_4_ * auVar146._0_4_ +
                     (float)local_a90._0_4_ * auVar143._0_4_;
                auVar150._4_4_ =
                     (float)local_a60._4_4_ * auVar189._4_4_ +
                     (float)local_a80._4_4_ * auVar152._4_4_ +
                     (float)local_a70._4_4_ * auVar146._4_4_ +
                     (float)local_a90._4_4_ * auVar143._4_4_;
                auVar150._8_4_ =
                     fStack_a58 * auVar189._8_4_ +
                     fStack_a78 * auVar152._8_4_ +
                     fStack_a68 * auVar146._8_4_ + fStack_a88 * auVar143._8_4_;
                auVar150._12_4_ =
                     fStack_a54 * auVar189._12_4_ +
                     fStack_a74 * auVar152._12_4_ +
                     fStack_a64 * auVar146._12_4_ + fStack_a84 * auVar143._12_4_;
                auVar152 = vblendps_avx(auVar111,_DAT_01feba10,0xe);
                auVar189 = vrsqrtss_avx(auVar152,auVar152);
                fVar174 = auVar189._0_4_;
                fVar172 = auVar111._0_4_;
                auVar189 = vdpps_avx(auVar403,auVar150,0x7f);
                auVar143 = vshufps_avx(auVar111,auVar111,0);
                auVar151._0_4_ = auVar150._0_4_ * auVar143._0_4_;
                auVar151._4_4_ = auVar150._4_4_ * auVar143._4_4_;
                auVar151._8_4_ = auVar150._8_4_ * auVar143._8_4_;
                auVar151._12_4_ = auVar150._12_4_ * auVar143._12_4_;
                auVar189 = vshufps_avx(auVar189,auVar189,0);
                auVar250._0_4_ = auVar403._0_4_ * auVar189._0_4_;
                auVar250._4_4_ = auVar403._4_4_ * auVar189._4_4_;
                auVar250._8_4_ = auVar403._8_4_ * auVar189._8_4_;
                auVar250._12_4_ = auVar403._12_4_ * auVar189._12_4_;
                auVar146 = vsubps_avx(auVar151,auVar250);
                auVar189 = vrcpss_avx(auVar152,auVar152);
                auVar152 = vmaxss_avx(ZEXT416((uint)fVar136),
                                      ZEXT416((uint)(local_c80 * (float)local_800._0_4_)));
                auVar371 = ZEXT1664(auVar152);
                auVar189 = ZEXT416((uint)(auVar189._0_4_ * (2.0 - fVar172 * auVar189._0_4_)));
                auVar189 = vshufps_avx(auVar189,auVar189,0);
                uVar103 = CONCAT44(auVar403._4_4_,auVar403._0_4_);
                auVar266._0_8_ = uVar103 ^ 0x8000000080000000;
                auVar266._8_4_ = -auVar403._8_4_;
                auVar266._12_4_ = -auVar403._12_4_;
                auVar143 = ZEXT416((uint)(fVar174 * 1.5 +
                                         fVar172 * -0.5 * fVar174 * fVar174 * fVar174));
                auVar143 = vshufps_avx(auVar143,auVar143,0);
                auVar233._0_4_ = auVar143._0_4_ * auVar146._0_4_ * auVar189._0_4_;
                auVar233._4_4_ = auVar143._4_4_ * auVar146._4_4_ * auVar189._4_4_;
                auVar233._8_4_ = auVar143._8_4_ * auVar146._8_4_ * auVar189._8_4_;
                auVar233._12_4_ = auVar143._12_4_ * auVar146._12_4_ * auVar189._12_4_;
                auVar285._0_4_ = auVar403._0_4_ * auVar143._0_4_;
                auVar285._4_4_ = auVar403._4_4_ * auVar143._4_4_;
                auVar285._8_4_ = auVar403._8_4_ * auVar143._8_4_;
                auVar285._12_4_ = auVar403._12_4_ * auVar143._12_4_;
                if (fVar172 < 0.0) {
                  fVar172 = sqrtf(fVar172);
                  auVar371 = ZEXT464(auVar152._0_4_);
                  auVar314 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar111 = vsqrtss_avx(auVar111,auVar111);
                  fVar172 = auVar111._0_4_;
                }
                auVar111 = vdpps_avx(auVar230,auVar285,0x7f);
                fVar172 = (fVar136 / fVar172) * (fVar240 + 1.0) + auVar371._0_4_ + fVar240 * fVar136
                ;
                auVar189 = vdpps_avx(auVar266,auVar285,0x7f);
                auVar143 = vdpps_avx(auVar230,auVar233,0x7f);
                auVar146 = vdpps_avx(_local_970,auVar285,0x7f);
                auVar18 = vdpps_avx(auVar230,auVar266,0x7f);
                fVar174 = auVar189._0_4_ + auVar143._0_4_;
                fVar241 = auVar111._0_4_;
                auVar116._0_4_ = fVar241 * fVar241;
                auVar116._4_4_ = auVar111._4_4_ * auVar111._4_4_;
                auVar116._8_4_ = auVar111._8_4_ * auVar111._8_4_;
                auVar116._12_4_ = auVar111._12_4_ * auVar111._12_4_;
                auVar143 = vsubps_avx(auVar147,auVar116);
                auVar189 = vdpps_avx(auVar230,_local_970,0x7f);
                fVar242 = auVar189._0_4_ - fVar241 * auVar146._0_4_;
                auVar189 = vrsqrtss_avx(auVar143,auVar143);
                fVar257 = auVar143._0_4_;
                fVar240 = auVar189._0_4_;
                fVar240 = fVar240 * 1.5 + fVar257 * -0.5 * fVar240 * fVar240 * fVar240;
                if (fVar257 < 0.0) {
                  local_a20._0_4_ = fVar242;
                  local_9a0._0_4_ = fVar240;
                  fVar257 = sqrtf(fVar257);
                  auVar371 = ZEXT464(auVar152._0_4_);
                  auVar314 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar240 = (float)local_9a0._0_4_;
                  fVar242 = (float)local_a20._0_4_;
                }
                else {
                  auVar152 = vsqrtss_avx(auVar143,auVar143);
                  fVar257 = auVar152._0_4_;
                }
                auVar408 = ZEXT1664(auVar111);
                auVar343 = ZEXT1664(auVar147);
                auVar189 = vpermilps_avx(local_960._0_16_,0xff);
                auVar19 = vshufps_avx(auVar403,auVar403,0xff);
                fVar241 = (auVar18._0_4_ - fVar241 * fVar174) * fVar240 - auVar19._0_4_;
                auVar251._0_8_ = auVar146._0_8_ ^ 0x8000000080000000;
                auVar251._8_4_ = auVar146._8_4_ ^ 0x80000000;
                auVar251._12_4_ = auVar146._12_4_ ^ 0x80000000;
                auVar267._0_4_ = -fVar241;
                auVar267._4_4_ = 0x80000000;
                auVar267._8_4_ = 0x80000000;
                auVar267._12_4_ = 0x80000000;
                auVar152 = vinsertps_avx(ZEXT416((uint)(fVar242 * fVar240)),auVar251,0x10);
                auVar143 = vmovsldup_avx(ZEXT416((uint)(fVar174 * fVar242 * fVar240 -
                                                       auVar146._0_4_ * fVar241)));
                auVar152 = vdivps_avx(auVar152,auVar143);
                auVar146 = ZEXT416((uint)(fVar257 - auVar189._0_4_));
                auVar189 = vinsertps_avx(auVar111,auVar146,0x10);
                auVar234._0_4_ = auVar189._0_4_ * auVar152._0_4_;
                auVar234._4_4_ = auVar189._4_4_ * auVar152._4_4_;
                auVar234._8_4_ = auVar189._8_4_ * auVar152._8_4_;
                auVar234._12_4_ = auVar189._12_4_ * auVar152._12_4_;
                auVar152 = vinsertps_avx(auVar267,ZEXT416((uint)fVar174),0x1c);
                auVar152 = vdivps_avx(auVar152,auVar143);
                auVar194._0_4_ = auVar189._0_4_ * auVar152._0_4_;
                auVar194._4_4_ = auVar189._4_4_ * auVar152._4_4_;
                auVar194._8_4_ = auVar189._8_4_ * auVar152._8_4_;
                auVar194._12_4_ = auVar189._12_4_ * auVar152._12_4_;
                auVar152 = vhaddps_avx(auVar234,auVar234);
                auVar189 = vhaddps_avx(auVar194,auVar194);
                fVar226 = fVar226 - auVar152._0_4_;
                local_c80 = local_c80 - auVar189._0_4_;
                auVar384 = ZEXT464((uint)local_c80);
                auVar252._8_4_ = 0x7fffffff;
                auVar252._0_8_ = 0x7fffffff7fffffff;
                auVar252._12_4_ = 0x7fffffff;
                auVar275 = ZEXT1664(auVar252);
                auVar152 = vandps_avx(auVar111,auVar252);
                if (fVar172 <= auVar152._0_4_) {
LAB_01075f48:
                  bVar75 = false;
                }
                else {
                  auVar152 = vandps_avx(auVar146,auVar252);
                  if ((float)local_820._0_4_ * 1.9073486e-06 + auVar371._0_4_ + fVar172 <=
                      auVar152._0_4_) goto LAB_01075f48;
                  local_c80 = local_c80 + (float)local_940._0_4_;
                  auVar384 = ZEXT464((uint)local_c80);
                  bVar75 = true;
                  if ((((fVar135 <= local_c80) &&
                       (fVar172 = *(float *)(ray + k * 4 + 0x100), local_c80 <= fVar172)) &&
                      (0.0 <= fVar226)) && (fVar226 <= 1.0)) {
                    auVar152 = vrsqrtss_avx(auVar147,auVar147);
                    fVar174 = auVar152._0_4_;
                    pGVar11 = (context->scene->geometries).items[uVar97].ptr;
                    if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      auVar152 = ZEXT416((uint)(fVar174 * 1.5 +
                                               fVar239 * -0.5 * fVar174 * fVar174 * fVar174));
                      auVar152 = vshufps_avx(auVar152,auVar152,0);
                      local_be0 = auVar230._0_4_;
                      fStack_bdc = auVar230._4_4_;
                      fStack_bd8 = auVar230._8_4_;
                      fStack_bd4 = auVar230._12_4_;
                      auVar153._0_4_ = auVar152._0_4_ * local_be0;
                      auVar153._4_4_ = auVar152._4_4_ * fStack_bdc;
                      auVar153._8_4_ = auVar152._8_4_ * fStack_bd8;
                      auVar153._12_4_ = auVar152._12_4_ * fStack_bd4;
                      auVar117._0_4_ = auVar403._0_4_ + auVar19._0_4_ * auVar153._0_4_;
                      auVar117._4_4_ = auVar403._4_4_ + auVar19._4_4_ * auVar153._4_4_;
                      auVar117._8_4_ = auVar403._8_4_ + auVar19._8_4_ * auVar153._8_4_;
                      auVar117._12_4_ = auVar403._12_4_ + auVar19._12_4_ * auVar153._12_4_;
                      auVar230 = vshufps_avx(auVar153,auVar153,0xc9);
                      auVar152 = vshufps_avx(auVar403,auVar403,0xc9);
                      auVar154._0_4_ = auVar152._0_4_ * auVar153._0_4_;
                      auVar154._4_4_ = auVar152._4_4_ * auVar153._4_4_;
                      auVar154._8_4_ = auVar152._8_4_ * auVar153._8_4_;
                      auVar154._12_4_ = auVar152._12_4_ * auVar153._12_4_;
                      auVar195._0_4_ = auVar403._0_4_ * auVar230._0_4_;
                      auVar195._4_4_ = auVar403._4_4_ * auVar230._4_4_;
                      auVar195._8_4_ = auVar403._8_4_ * auVar230._8_4_;
                      auVar195._12_4_ = auVar403._12_4_ * auVar230._12_4_;
                      auVar189 = vsubps_avx(auVar195,auVar154);
                      auVar230 = vshufps_avx(auVar189,auVar189,0xc9);
                      auVar152 = vshufps_avx(auVar117,auVar117,0xc9);
                      auVar196._0_4_ = auVar152._0_4_ * auVar230._0_4_;
                      auVar196._4_4_ = auVar152._4_4_ * auVar230._4_4_;
                      auVar196._8_4_ = auVar152._8_4_ * auVar230._8_4_;
                      auVar196._12_4_ = auVar152._12_4_ * auVar230._12_4_;
                      auVar230 = vshufps_avx(auVar189,auVar189,0xd2);
                      auVar118._0_4_ = auVar117._0_4_ * auVar230._0_4_;
                      auVar118._4_4_ = auVar117._4_4_ * auVar230._4_4_;
                      auVar118._8_4_ = auVar117._8_4_ * auVar230._8_4_;
                      auVar118._12_4_ = auVar117._12_4_ * auVar230._12_4_;
                      auVar230 = vsubps_avx(auVar196,auVar118);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = local_c80;
                        uVar8 = vextractps_avx(auVar230,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar8;
                        uVar8 = vextractps_avx(auVar230,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                        *(int *)(ray + k * 4 + 0x1c0) = auVar230._0_4_;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar226;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(int *)(ray + k * 4 + 0x220) = (int)local_9c8;
                        *(uint *)(ray + k * 4 + 0x240) = uVar97;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar15 = context->user;
                        auStack_5d0 = vshufps_avx(ZEXT416((uint)fVar226),ZEXT416((uint)fVar226),0);
                        auStack_630 = vshufps_avx(auVar230,auVar230,0x55);
                        auStack_610 = vshufps_avx(auVar230,auVar230,0xaa);
                        auStack_5f0 = vshufps_avx(auVar230,auVar230,0);
                        local_640 = (RTCHitN  [16])auStack_630;
                        local_620 = auStack_610;
                        local_600 = auStack_5f0;
                        local_5e0 = auStack_5d0;
                        local_5c0 = ZEXT832(0) << 0x20;
                        local_5a0 = local_520._0_8_;
                        uStack_598 = local_520._8_8_;
                        uStack_590 = local_520._16_8_;
                        uStack_588 = local_520._24_8_;
                        local_580 = local_500._0_8_;
                        uStack_578 = local_500._8_8_;
                        uStack_570 = local_500._16_8_;
                        uStack_568 = local_500._24_8_;
                        local_9d0[1] = local_9c0;
                        *local_9d0 = local_9c0;
                        local_560 = pRVar15->instID[0];
                        uStack_55c = local_560;
                        uStack_558 = local_560;
                        uStack_554 = local_560;
                        uStack_550 = local_560;
                        uStack_54c = local_560;
                        uStack_548 = local_560;
                        uStack_544 = local_560;
                        local_540 = pRVar15->instPrimID[0];
                        uStack_53c = local_540;
                        uStack_538 = local_540;
                        uStack_534 = local_540;
                        uStack_530 = local_540;
                        uStack_52c = local_540;
                        uStack_528 = local_540;
                        uStack_524 = local_540;
                        *(float *)(ray + k * 4 + 0x100) = local_c80;
                        local_ac0 = *local_9d8;
                        uStack_ab8 = local_9d8[1];
                        local_ab0 = *local_9e0;
                        uStack_aa8 = local_9e0[1];
                        local_a50.valid = (int *)&local_ac0;
                        local_a50.geometryUserPtr = pGVar11->userPtr;
                        local_a50.context = context->user;
                        local_a50.hit = local_640;
                        local_a50.N = 8;
                        local_a50.ray = (RTCRayN *)ray;
                        if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar343 = ZEXT1664(auVar147);
                          auVar371 = ZEXT1664(auVar371._0_16_);
                          auVar408 = ZEXT1664(auVar111);
                          (*pGVar11->intersectionFilterN)(&local_a50);
                        }
                        auVar89._8_8_ = uStack_ab8;
                        auVar89._0_8_ = local_ac0;
                        auVar147 = vpcmpeqd_avx((undefined1  [16])0x0,auVar89);
                        auVar93._8_8_ = uStack_aa8;
                        auVar93._0_8_ = local_ab0;
                        auVar230 = vpcmpeqd_avx((undefined1  [16])0x0,auVar93);
                        auVar130._16_16_ = auVar230;
                        auVar130._0_16_ = auVar147;
                        auVar120 = local_9c0 & ~auVar130;
                        if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar120 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar120 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar120 >> 0x7f,0) == '\0')
                              && (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar120 >> 0xbf,0) == '\0') &&
                            (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar120[0x1f]) {
                          auVar131._0_4_ = auVar147._0_4_ ^ local_9c0._0_4_;
                          auVar131._4_4_ = auVar147._4_4_ ^ local_9c0._4_4_;
                          auVar131._8_4_ = auVar147._8_4_ ^ local_9c0._8_4_;
                          auVar131._12_4_ = auVar147._12_4_ ^ local_9c0._12_4_;
                          auVar131._16_4_ = auVar230._0_4_ ^ local_9c0._16_4_;
                          auVar131._20_4_ = auVar230._4_4_ ^ local_9c0._20_4_;
                          auVar131._24_4_ = auVar230._8_4_ ^ local_9c0._24_4_;
                          auVar131._28_4_ = auVar230._12_4_ ^ local_9c0._28_4_;
                          auVar275 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar314 = ZEXT864(0);
                        }
                        else {
                          p_Var16 = context->args->filter;
                          auVar275 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar314 = ZEXT1664(ZEXT816(0));
                          if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar343 = ZEXT1664(auVar343._0_16_);
                            auVar371 = ZEXT1664(auVar371._0_16_);
                            auVar408 = ZEXT1664(auVar408._0_16_);
                            (*p_Var16)(&local_a50);
                            auVar314 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar275 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar90._8_8_ = uStack_ab8;
                          auVar90._0_8_ = local_ac0;
                          auVar147 = vpcmpeqd_avx((undefined1  [16])0x0,auVar90);
                          auVar94._8_8_ = uStack_aa8;
                          auVar94._0_8_ = local_ab0;
                          auVar230 = vpcmpeqd_avx((undefined1  [16])0x0,auVar94);
                          auVar169._16_16_ = auVar230;
                          auVar169._0_16_ = auVar147;
                          auVar131._0_4_ = auVar147._0_4_ ^ local_9c0._0_4_;
                          auVar131._4_4_ = auVar147._4_4_ ^ local_9c0._4_4_;
                          auVar131._8_4_ = auVar147._8_4_ ^ local_9c0._8_4_;
                          auVar131._12_4_ = auVar147._12_4_ ^ local_9c0._12_4_;
                          auVar131._16_4_ = auVar230._0_4_ ^ local_9c0._16_4_;
                          auVar131._20_4_ = auVar230._4_4_ ^ local_9c0._20_4_;
                          auVar131._24_4_ = auVar230._8_4_ ^ local_9c0._24_4_;
                          auVar131._28_4_ = auVar230._12_4_ ^ local_9c0._28_4_;
                          auVar120 = local_9c0 & ~auVar169;
                          if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar120 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar120 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar120 >> 0x7f,0) != '\0') ||
                                (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar120 >> 0xbf,0) != '\0') ||
                              (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar120[0x1f] < '\0') {
                            auVar120 = vmaskmovps_avx(auVar131,*(undefined1 (*) [32])local_a50.hit);
                            *(undefined1 (*) [32])(local_a50.ray + 0x180) = auVar120;
                            auVar120 = vmaskmovps_avx(auVar131,*(undefined1 (*) [32])
                                                                (local_a50.hit + 0x20));
                            *(undefined1 (*) [32])(local_a50.ray + 0x1a0) = auVar120;
                            auVar120 = vmaskmovps_avx(auVar131,*(undefined1 (*) [32])
                                                                (local_a50.hit + 0x40));
                            *(undefined1 (*) [32])(local_a50.ray + 0x1c0) = auVar120;
                            auVar120 = vmaskmovps_avx(auVar131,*(undefined1 (*) [32])
                                                                (local_a50.hit + 0x60));
                            *(undefined1 (*) [32])(local_a50.ray + 0x1e0) = auVar120;
                            auVar120 = vmaskmovps_avx(auVar131,*(undefined1 (*) [32])
                                                                (local_a50.hit + 0x80));
                            *(undefined1 (*) [32])(local_a50.ray + 0x200) = auVar120;
                            auVar120 = vmaskmovps_avx(auVar131,*(undefined1 (*) [32])
                                                                (local_a50.hit + 0xa0));
                            *(undefined1 (*) [32])(local_a50.ray + 0x220) = auVar120;
                            auVar120 = vmaskmovps_avx(auVar131,*(undefined1 (*) [32])
                                                                (local_a50.hit + 0xc0));
                            *(undefined1 (*) [32])(local_a50.ray + 0x240) = auVar120;
                            auVar120 = vmaskmovps_avx(auVar131,*(undefined1 (*) [32])
                                                                (local_a50.hit + 0xe0));
                            *(undefined1 (*) [32])(local_a50.ray + 0x260) = auVar120;
                            auVar120 = vmaskmovps_avx(auVar131,*(undefined1 (*) [32])
                                                                (local_a50.hit + 0x100));
                            *(undefined1 (*) [32])(local_a50.ray + 0x280) = auVar120;
                          }
                        }
                        auVar384 = ZEXT464((uint)local_c80);
                        if ((((((((auVar131 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar131 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar131 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar131 >> 0x7f,0) == '\0')
                              && (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar131 >> 0xbf,0) == '\0') &&
                            (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar131[0x1f]) {
                          *(float *)(ray + k * 4 + 0x100) = fVar172;
                        }
                      }
                    }
                  }
                }
                auVar375 = ZEXT464((uint)fVar226);
                bVar105 = lVar101 != 0;
                lVar101 = lVar101 + -1;
              } while ((!bVar75) && (bVar105));
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar132._4_4_ = uVar8;
              auVar132._0_4_ = uVar8;
              auVar132._8_4_ = uVar8;
              auVar132._12_4_ = uVar8;
              auVar132._16_4_ = uVar8;
              auVar132._20_4_ = uVar8;
              auVar132._24_4_ = uVar8;
              auVar132._28_4_ = uVar8;
              auVar121 = vcmpps_avx(_local_8e0,auVar132,2);
              auVar120 = vandps_avx(auVar121,local_7a0);
              local_7a0 = local_7a0 & auVar121;
              uVar103 = local_7c0;
              fVar399 = (float)local_8c0._0_4_;
              fVar411 = (float)local_8c0._4_4_;
              fVar280 = fStack_8b8;
              fVar292 = fStack_8b4;
              fVar294 = fStack_8b0;
              fVar296 = fStack_8ac;
              fVar298 = fStack_8a8;
              fVar300 = fStack_8a4;
            } while ((((((((local_7a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_7a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_7a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_7a0 >> 0x7f,0) != '\0') ||
                       (local_7a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_7a0 >> 0xbf,0) != '\0') ||
                     (local_7a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_7a0[0x1f] < '\0');
          }
          auVar120 = vandps_avx(local_6e0,local_6c0);
          auVar121 = vandps_avx(_local_920,_local_900);
          auVar204._0_4_ = fVar399 + local_340._0_4_;
          auVar204._4_4_ = fVar411 + local_340._4_4_;
          auVar204._8_4_ = fVar280 + local_340._8_4_;
          auVar204._12_4_ = fVar292 + local_340._12_4_;
          auVar204._16_4_ = fVar294 + local_340._16_4_;
          auVar204._20_4_ = fVar296 + local_340._20_4_;
          auVar204._24_4_ = fVar298 + local_340._24_4_;
          auVar204._28_4_ = fVar300 + local_340._28_4_;
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar256._4_4_ = uVar8;
          auVar256._0_4_ = uVar8;
          auVar256._8_4_ = uVar8;
          auVar256._12_4_ = uVar8;
          auVar256._16_4_ = uVar8;
          auVar256._20_4_ = uVar8;
          auVar256._24_4_ = uVar8;
          auVar256._28_4_ = uVar8;
          auVar26 = vcmpps_avx(auVar204,auVar256,2);
          auVar120 = vandps_avx(auVar26,auVar120);
          auVar273._0_4_ = fVar399 + local_300._0_4_;
          auVar273._4_4_ = fVar411 + local_300._4_4_;
          auVar273._8_4_ = fVar280 + local_300._8_4_;
          auVar273._12_4_ = fVar292 + local_300._12_4_;
          auVar273._16_4_ = fVar294 + local_300._16_4_;
          auVar273._20_4_ = fVar296 + local_300._20_4_;
          auVar273._24_4_ = fVar298 + local_300._24_4_;
          auVar273._28_4_ = fVar300 + local_300._28_4_;
          auVar26 = vcmpps_avx(auVar273,auVar256,2);
          auVar121 = vandps_avx(auVar26,auVar121);
          auVar121 = vorps_avx(auVar120,auVar121);
          if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar121 >> 0x7f,0) != '\0') ||
                (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0xbf,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar121[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar99 * 0x60) = auVar121;
            auVar120 = vblendvps_avx(_local_300,_local_340,auVar120);
            *(undefined1 (*) [32])(auStack_160 + uVar99 * 0x60) = auVar120;
            uVar9 = vmovlps_avx(local_9f0);
            *(undefined8 *)(afStack_140 + uVar99 * 0x18) = uVar9;
            auStack_138[uVar99 * 0x18] = (int)uVar103 + 1;
            uVar99 = (ulong)((int)uVar99 + 1);
          }
          goto LAB_0107469a;
        }
      }
      auVar314 = ZEXT1664(ZEXT816(0) << 0x40);
    }
LAB_0107469a:
    auVar275 = ZEXT1664(local_9f0);
    do {
      if ((int)uVar99 == 0) {
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar119._4_4_ = uVar8;
        auVar119._0_4_ = uVar8;
        auVar119._8_4_ = uVar8;
        auVar119._12_4_ = uVar8;
        auVar142 = vcmpps_avx(local_650,auVar119,2);
        uVar97 = vmovmskps_avx(auVar142);
        uVar97 = (uint)local_928 - 1 & (uint)local_928 & uVar97;
        if (uVar97 == 0) {
          return;
        }
        goto LAB_0107346f;
      }
      uVar104 = (ulong)((int)uVar99 - 1);
      lVar101 = uVar104 * 0x60;
      auVar120 = *(undefined1 (*) [32])(auStack_160 + lVar101);
      auVar124._0_4_ = fVar399 + auVar120._0_4_;
      auVar124._4_4_ = fVar411 + auVar120._4_4_;
      auVar124._8_4_ = fVar280 + auVar120._8_4_;
      auVar124._12_4_ = fVar292 + auVar120._12_4_;
      auVar124._16_4_ = fVar294 + auVar120._16_4_;
      auVar124._20_4_ = fVar296 + auVar120._20_4_;
      auVar124._24_4_ = fVar298 + auVar120._24_4_;
      auVar124._28_4_ = fVar300 + auVar120._28_4_;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar238._4_4_ = uVar8;
      auVar238._0_4_ = uVar8;
      auVar238._8_4_ = uVar8;
      auVar238._12_4_ = uVar8;
      auVar238._16_4_ = uVar8;
      auVar238._20_4_ = uVar8;
      auVar238._24_4_ = uVar8;
      auVar238._28_4_ = uVar8;
      auVar26 = vcmpps_avx(auVar124,auVar238,2);
      auVar121 = vandps_avx(auVar26,*(undefined1 (*) [32])(auStack_180 + lVar101));
      _local_640 = auVar121;
      auVar26 = *(undefined1 (*) [32])(auStack_180 + lVar101) & auVar26;
      bVar81 = (auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar82 = (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar80 = (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar79 = SUB321(auVar26 >> 0x7f,0) == '\0';
      bVar78 = (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar77 = SUB321(auVar26 >> 0xbf,0) == '\0';
      bVar105 = (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar75 = -1 < auVar26[0x1f];
      if (((((((!bVar81 || !bVar82) || !bVar80) || !bVar79) || !bVar78) || !bVar77) || !bVar105) ||
          !bVar75) {
        auVar200._8_4_ = 0x7f800000;
        auVar200._0_8_ = 0x7f8000007f800000;
        auVar200._12_4_ = 0x7f800000;
        auVar200._16_4_ = 0x7f800000;
        auVar200._20_4_ = 0x7f800000;
        auVar200._24_4_ = 0x7f800000;
        auVar200._28_4_ = 0x7f800000;
        auVar120 = vblendvps_avx(auVar200,auVar120,auVar121);
        auVar26 = vshufps_avx(auVar120,auVar120,0xb1);
        auVar26 = vminps_avx(auVar120,auVar26);
        auVar21 = vshufpd_avx(auVar26,auVar26,5);
        auVar26 = vminps_avx(auVar26,auVar21);
        auVar21 = vperm2f128_avx(auVar26,auVar26,1);
        auVar26 = vminps_avx(auVar26,auVar21);
        auVar120 = vcmpps_avx(auVar120,auVar26,0);
        auVar26 = auVar121 & auVar120;
        if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar26 >> 0x7f,0) != '\0') ||
              (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar26 >> 0xbf,0) != '\0') ||
            (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar26[0x1f] < '\0') {
          auVar121 = vandps_avx(auVar120,auVar121);
        }
        fVar136 = afStack_140[uVar104 * 0x18 + 1];
        uVar103 = (ulong)auStack_138[uVar104 * 0x18];
        uVar102 = vmovmskps_avx(auVar121);
        uVar98 = 0;
        if (uVar102 != 0) {
          for (; (uVar102 >> uVar98 & 1) == 0; uVar98 = uVar98 + 1) {
          }
        }
        fVar172 = afStack_140[uVar104 * 0x18];
        *(undefined4 *)(local_640 + (ulong)uVar98 * 4) = 0;
        if ((((((((_local_640 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_640 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_640 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_640 >> 0x7f,0) != '\0') ||
              (_local_640 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_640 >> 0xbf,0) != '\0') ||
            (_local_640 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_640[0x1f] < '\0') {
          uVar104 = uVar99;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar101) = _local_640;
        auVar147 = vshufps_avx(ZEXT416((uint)(fVar136 - fVar172)),ZEXT416((uint)(fVar136 - fVar172))
                               ,0);
        local_340._4_4_ = fVar172 + auVar147._4_4_ * 0.14285715;
        local_340._0_4_ = fVar172 + auVar147._0_4_ * 0.0;
        fStack_338 = fVar172 + auVar147._8_4_ * 0.2857143;
        fStack_334 = fVar172 + auVar147._12_4_ * 0.42857146;
        fStack_330 = fVar172 + auVar147._0_4_ * 0.5714286;
        fStack_32c = fVar172 + auVar147._4_4_ * 0.71428573;
        fStack_328 = fVar172 + auVar147._8_4_ * 0.8571429;
        fStack_324 = fVar172 + auVar147._12_4_;
        auVar275 = ZEXT864(*(ulong *)(local_340 + (ulong)uVar98 * 4));
      }
      uVar99 = uVar104;
    } while (((((((bVar81 && bVar82) && bVar80) && bVar79) && bVar78) && bVar77) && bVar105) &&
             bVar75);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }